

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O1

void sequence_iterator_duplicate_test(void)

{
  fdb_encryption_key *pfVar1;
  undefined1 auVar2 [16];
  bool *pbVar3;
  fdb_status fVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 *paVar9;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aVar10;
  btree *pbVar11;
  fdb_kvs_handle *pfVar12;
  fdb_iterator **ppfVar13;
  fdb_file_handle **ppfVar14;
  fdb_kvs_handle *pfVar15;
  ulong uVar16;
  fdb_kvs_handle **ppfVar17;
  __atomic_base<unsigned_long> ptr_handle;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aVar18;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 doc;
  fdb_doc *pfVar19;
  fdb_doc *pfVar20;
  fdb_kvs_handle *pfVar21;
  fdb_kvs_handle **ptr_iterator;
  fdb_config **ptr_iterator_00;
  fdb_config *pfVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 unaff_RBP;
  fdb_kvs_handle *pfVar26;
  fdb_doc **doc_00;
  char *pcVar27;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 unaff_R12;
  long lVar28;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 unaff_R13;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aVar29;
  fdb_doc *doc_01;
  fdb_kvs_handle *pfVar30;
  fdb_config *pfVar31;
  char *doc_02;
  fdb_file_handle **ppfVar32;
  bool bVar33;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_iterator *iterator;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  fdb_iterator *pfStack_6198;
  fdb_kvs_handle *pfStack_6190;
  fdb_file_handle *pfStack_6188;
  fdb_doc *pfStack_6180;
  fdb_kvs_config fStack_6178;
  timeval tStack_6160;
  fdb_config fStack_6150;
  fdb_config *pfStack_6058;
  fdb_iterator *pfStack_6040;
  fdb_kvs_handle *pfStack_6038;
  fdb_doc *pfStack_6030;
  fdb_file_handle *pfStack_6028;
  fdb_kvs_config fStack_6020;
  timeval tStack_6008;
  fdb_config fStack_5ff8;
  fdb_config *pfStack_5f00;
  fdb_iterator *pfStack_5ee8;
  fdb_kvs_handle *pfStack_5ee0;
  fdb_file_handle *pfStack_5ed8;
  fdb_doc *pfStack_5ed0;
  uint64_t uStack_5ec8;
  undefined1 uStack_5ec0;
  undefined7 uStack_5eb8;
  undefined4 uStack_5eb1;
  undefined8 uStack_5ea8;
  undefined7 uStack_5ea0;
  undefined4 uStack_5e99;
  fdb_kvs_config fStack_5e90;
  timeval tStack_5e78;
  undefined4 uStack_5e68;
  undefined1 uStack_5e64;
  fdb_config fStack_5d60;
  char acStack_5c68 [256];
  fdb_config *pfStack_5b68;
  char *pcStack_5b60;
  code *pcStack_5b58;
  fdb_doc *pfStack_5b40;
  fdb_iterator *pfStack_5b38;
  fdb_kvs_handle *pfStack_5b30;
  fdb_file_handle *pfStack_5b28;
  fdb_kvs_config fStack_5b20;
  timeval tStack_5b08;
  fdb_config fStack_5af8;
  fdb_iterator **ppfStack_5a00;
  fdb_iterator *pfStack_59e8;
  fdb_doc *pfStack_59e0;
  fdb_kvs_handle *pfStack_59d8;
  fdb_file_handle *pfStack_59d0;
  timeval tStack_59c8;
  fdb_iterator *apfStack_59b8 [33];
  fdb_kvs_config fStack_58b0;
  char acStack_5898 [264];
  fdb_config fStack_5790;
  char acStack_5698 [256];
  fdb_kvs_handle *pfStack_5598;
  fdb_kvs_handle *pfStack_5590;
  fdb_doc **ppfStack_5588;
  fdb_doc **ppfStack_5580;
  fdb_doc **ppfStack_5578;
  fdb_kvs_handle *pfStack_5560;
  fdb_file_handle *pfStack_5558;
  fdb_iterator *pfStack_5550;
  fdb_doc *pfStack_5548;
  fdb_kvs_handle *pfStack_5540;
  fdb_kvs_config fStack_5538;
  timeval tStack_5520;
  fdb_doc *apfStack_5510 [32];
  undefined1 auStack_5410 [272];
  uint8_t auStack_5300 [20];
  undefined4 uStack_52ec;
  undefined4 uStack_52e4;
  undefined1 uStack_52da;
  fdb_doc *apfStack_5210 [500];
  fdb_kvs_handle afStack_4270 [7];
  fdb_kvs_handle **ppfStack_32c8;
  fdb_kvs_handle *pfStack_32c0;
  fdb_doc **ppfStack_32b0;
  fdb_doc **ppfStack_32a8;
  fdb_doc **ppfStack_32a0;
  fdb_kvs_handle *pfStack_3290;
  fdb_iterator *pfStack_3288;
  fdb_iterator *pfStack_3280;
  fdb_kvs_handle *pfStack_3278;
  fdb_file_handle *pfStack_3270;
  fdb_doc *pfStack_3268;
  fdb_file_handle *pfStack_3260;
  undefined1 auStack_3258 [56];
  fdb_config fStack_3220;
  fdb_doc *apfStack_3128 [65];
  fdb_config **ppfStack_2f20;
  btree *pbStack_2f18;
  fdb_kvs_handle **ppfStack_2f10;
  fdb_config *pfStack_2f08;
  fdb_file_handle **ppfStack_2f00;
  fdb_kvs_handle *pfStack_2ef8;
  fdb_config *pfStack_2ee8;
  fdb_config *pfStack_2ee0;
  fdb_kvs_handle *pfStack_2ed8;
  fdb_file_handle *pfStack_2ed0;
  fdb_kvs_config fStack_2ec8;
  fdb_doc *apfStack_2eb0 [5];
  fdb_kvs_handle *apfStack_2e88 [5];
  timeval tStack_2e60;
  fdb_kvs_handle fStack_2e50;
  fdb_config fStack_2b50;
  fdb_kvs_handle **ppfStack_2a58;
  btree *pbStack_2a50;
  fdb_kvs_handle **ppfStack_2a48;
  undefined8 *puStack_2a40;
  undefined7 *puStack_2a38;
  fdb_kvs_handle *pfStack_2a30;
  fdb_kvs_handle *pfStack_2a20;
  fdb_kvs_handle *pfStack_2a18;
  fdb_kvs_handle *pfStack_2a10;
  undefined7 uStack_2a08;
  undefined4 uStack_2a01;
  fdb_kvs_handle *pfStack_29f8;
  fdb_file_handle *pfStack_29f0;
  undefined1 auStack_29e8 [16];
  undefined7 uStack_29d8;
  undefined1 uStack_29d1;
  undefined7 uStack_29d0;
  undefined8 uStack_29c8;
  void *pvStack_29c0;
  undefined1 uStack_29b8;
  timeval tStack_29b0;
  undefined1 auStack_29a0 [40];
  fdb_file_handle *pfStack_2978;
  undefined4 uStack_2964;
  fdb_iterator **ppfStack_2890;
  char *pcStack_2888;
  fdb_kvs_handle *pfStack_2880;
  char *pcStack_2878;
  char *pcStack_2870;
  code *pcStack_2868;
  fdb_iterator *pfStack_2858;
  fdb_iterator *pfStack_2850;
  fdb_kvs_handle *pfStack_2848;
  fdb_kvs_handle *pfStack_2840;
  fdb_file_handle *pfStack_2838;
  timeval tStack_2830;
  fdb_kvs_config fStack_2820;
  fdb_config fStack_2808;
  char acStack_2710 [256];
  char acStack_2610 [264];
  fdb_kvs_handle *pfStack_2508;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_2500;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_24f8;
  fdb_kvs_handle *pfStack_24f0;
  fdb_kvs_handle *pfStack_24e8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_24e0;
  undefined1 auStack_24d0 [16];
  fdb_kvs_handle *pfStack_24c0;
  fdb_file_handle *pfStack_24b8;
  fdb_kvs_handle *pfStack_24b0;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_24a8 [11];
  undefined1 auStack_2450 [40];
  fdb_kvs_handle fStack_2428;
  fdb_config fStack_2128;
  fdb_config *pfStack_2030;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_2028;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_2020;
  fdb_doc *pfStack_2018;
  btree *pbStack_2010;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_2008;
  undefined1 auStack_1ff0 [24];
  fdb_file_handle *pfStack_1fd8;
  undefined1 auStack_1fd0 [48];
  timeval tStack_1fa0;
  fdb_doc *apfStack_1f90 [24];
  long lStack_1ed0;
  long lStack_1ea0;
  fdb_config fStack_1c70;
  fdb_doc *pfStack_1b78;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1b70;
  fdb_doc *pfStack_1b68;
  btree *pbStack_1b60;
  undefined1 auStack_1b48 [24];
  fdb_file_handle *pfStack_1b30;
  fdb_doc *pfStack_1b28;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_1b20 [6];
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1af0;
  timeval tStack_1ad0;
  fdb_doc afStack_1ac0 [3];
  char acStack_19a8 [256];
  char acStack_18a8 [256];
  fdb_config fStack_17a8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 *paStack_16b0;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_16a8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_16a0;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1698;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1690;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1688;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1670;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1668;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1660;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1658;
  fdb_file_handle *pfStack_1650;
  fdb_kvs_handle *pfStack_1648;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_1640 [11];
  fdb_kvs_config fStack_15e8;
  fdb_kvs_config afStack_15d0 [3];
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1578;
  undefined1 auStack_1570 [256];
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_1470 [32];
  char acStack_1370 [256];
  fdb_config fStack_1270;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1178;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1170;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1168;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1160;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1158;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1150;
  fdb_iterator *pfStack_1138;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1130;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1128;
  fdb_file_handle *pfStack_1120;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_1118 [11];
  timeval tStack_10c0;
  undefined1 auStack_10b0 [24];
  char acStack_1098 [256];
  char acStack_f98 [256];
  char acStack_e98 [256];
  fdb_config fStack_d98;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 *paStack_ca0;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_c98;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_c90;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 *paStack_c88;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_c80;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_c78;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_c60;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_c58;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_c50;
  fdb_file_handle *pfStack_c48;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_c40 [5];
  fdb_seqnum_t afStack_c18 [6];
  timeval tStack_be8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_bd8 [3];
  char acStack_bc0 [256];
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_ac0 [32];
  char acStack_9c0 [256];
  fdb_config fStack_8c0;
  fdb_kvs_handle **ppfStack_7c8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_7c0;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_7b8;
  fdb_doc *pfStack_7b0;
  fdb_file_handle **ppfStack_7a8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_7a0;
  fdb_doc *local_790;
  fdb_kvs_handle *local_788;
  fdb_file_handle *local_780;
  fdb_iterator *local_778;
  timeval local_770;
  undefined1 local_760 [280];
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_648 [100];
  anon_union_8_2_c155ca52_for__fdb_iterator_13 local_328 [32];
  char local_228 [256];
  fdb_config local_128;
  
  aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11711a;
  gettimeofday(&local_770,(__timezone_ptr_t)0x0);
  aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11711f;
  memleak_start();
  local_790 = (fdb_doc *)0x0;
  aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117130;
  system("rm -rf  iterator_test* > errorlog.txt");
  aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117140;
  fdb_get_default_config();
  pfVar20 = (fdb_doc *)local_760;
  aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11714d;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.seqtree_opt = '\x01';
  local_128.wal_threshold = 0x400;
  local_128.compaction_threshold = '\0';
  local_128.purging_interval = 1;
  ppfVar14 = &local_780;
  aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11717f;
  fdb_open(ppfVar14,"./iterator_test1",&local_128);
  ppfVar17 = &local_788;
  aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117192;
  fdb_kvs_open_default(local_780,ppfVar17,(fdb_kvs_config *)pfVar20);
  aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1171a8;
  fVar4 = fdb_set_log_callback(local_788,logCallbackFunc,"sequence_iterator_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    lVar28 = 0;
    uVar16 = 0;
    do {
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1171d0;
      sprintf(local_228,"key%d",uVar16 & 0xffffffff);
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1171e8;
      sprintf((char *)&local_328[0].end_seqnum,"meta%d",uVar16 & 0xffffffff);
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1171fd;
      sprintf(local_760 + 0x18,"body%d(first)",uVar16 & 0xffffffff);
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117210;
      sVar6 = strlen(local_228);
      unaff_RBP.end_seqnum = (fdb_seqnum_t)local_328;
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117223;
      sVar7 = strlen((char *)unaff_RBP);
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117230;
      sVar8 = strlen(local_760 + 0x18);
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117252;
      fdb_doc_create((fdb_doc **)((long)aaStack_648 + lVar28),local_228,sVar6,(void *)unaff_RBP,
                     sVar7,local_760 + 0x18,sVar8);
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117264;
      fdb_set(local_788,(fdb_doc *)aaStack_648[uVar16]);
      uVar16 = uVar16 + 1;
      lVar28 = lVar28 + 8;
    } while (uVar16 != 100);
    aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117284;
    fdb_commit(local_780,'\x01');
    pcVar27 = local_760 + 0x18;
    lVar28 = 0;
    uVar16 = 0;
    do {
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1172a6;
      sprintf(pcVar27,"body%d(second)",uVar16 & 0xffffffff);
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1172b9;
      sVar6 = strlen(pcVar27);
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1172cb;
      fdb_doc_update((fdb_doc **)((long)aaStack_648 + lVar28),(void *)0x0,0,pcVar27,sVar6);
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1172dd;
      fdb_set(local_788,(fdb_doc *)aaStack_648[uVar16]);
      uVar16 = uVar16 + 1;
      lVar28 = lVar28 + 8;
    } while (uVar16 != 100);
    aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1172f9;
    fdb_commit(local_780,'\x01');
    pfVar20 = (fdb_doc *)(local_760 + 0x18);
    lVar28 = 0;
    ppfVar32 = (fdb_file_handle **)0x0;
    do {
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11731b;
      sprintf((char *)pfVar20,"body%d(third)",(ulong)ppfVar32 & 0xffffffff);
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11732e;
      sVar6 = strlen((char *)pfVar20);
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117340;
      fdb_doc_update((fdb_doc **)((long)aaStack_648 + lVar28),(void *)0x0,0,pfVar20,sVar6);
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117352;
      fdb_set(local_788,(fdb_doc *)aaStack_648[(long)ppfVar32]);
      ppfVar14 = (fdb_file_handle **)((long)ppfVar32 + 2);
      lVar28 = lVar28 + 0x10;
      bVar33 = ppfVar32 < (fdb_file_handle **)0x62;
      ppfVar32 = ppfVar14;
    } while (bVar33);
    aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11736f;
    fdb_commit(local_780,'\0');
    aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117388;
    fdb_iterator_sequence_init(local_788,&local_778,0,0xdc,0);
    ppfVar17 = (fdb_kvs_handle **)0x64;
    unaff_R13.end_seqnum = 100;
    do {
      unaff_R12.end_seqnum = (long)local_760 + 0x18;
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1173a7;
      fVar4 = fdb_iterator_get(local_778,&local_790);
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0011754d:
        aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117552;
        sequence_iterator_duplicate_test();
LAB_00117552:
        aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11755f;
        sequence_iterator_duplicate_test();
LAB_0011755f:
        aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11756a;
        sequence_iterator_duplicate_test();
        goto LAB_0011756a;
      }
      ppfVar17 = (fdb_kvs_handle **)
                 ((long)ppfVar17 + (ulong)(ppfVar17 < (fdb_kvs_handle **)0x8c) + 1);
      if (ppfVar17 < (fdb_kvs_handle **)0xc9) {
        uVar23 = (int)ppfVar17 - 0x65;
        pcVar27 = "body%d(second)";
      }
      else {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (long)ppfVar17 - 0x65U >> 2;
        uVar23 = ((int)((long)ppfVar17 - 0x65U) +
                 (SUB164(auVar2 * ZEXT816(0x28f5c28f5c28f5c3),8) >> 2) * -100) * 2;
        pcVar27 = "body%d(third)";
      }
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117407;
      sprintf((char *)unaff_R12,pcVar27,(ulong)uVar23);
      pfVar20 = local_790;
      ppfVar14 = (fdb_file_handle **)local_790->key;
      unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)aaStack_648[(int)uVar23].end_seqnum;
      unaff_RBP = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R12.end_seqnum + 0x20);
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11742e;
      iVar5 = bcmp(ppfVar14,(void *)unaff_RBP,local_790->keylen);
      if (iVar5 != 0) {
        aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11754d;
        sequence_iterator_duplicate_test();
        goto LAB_0011754d;
      }
      ppfVar14 = (fdb_file_handle **)pfVar20->meta;
      unaff_RBP = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R12.end_seqnum + 0x38);
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11744e;
      iVar5 = bcmp(ppfVar14,(void *)unaff_RBP,(size_t)pfVar20->metalen);
      if (iVar5 != 0) goto LAB_0011755f;
      ppfVar14 = (fdb_file_handle **)pfVar20->body;
      unaff_R12.end_seqnum = (long)local_760 + 0x18;
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11746e;
      iVar5 = bcmp(ppfVar14,(void *)unaff_R12,(size_t)pfVar20->bodylen);
      if (iVar5 != 0) goto LAB_00117552;
      if ((fdb_kvs_handle **)pfVar20->seqnum != ppfVar17) {
        aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1174b4;
        sequence_iterator_duplicate_test();
      }
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117486;
      fdb_doc_free(local_790);
      local_790 = (fdb_doc *)0x0;
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117499;
      fVar4 = fdb_iterator_next(local_778);
      unaff_R13.end_seqnum._0_4_ = (int)unaff_R13.end_seqnum - 1;
      unaff_R13.end_seqnum._4_4_ = 0;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if (unaff_R13.end_seqnum._0_4_ == 0) {
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1174c9;
      fdb_iterator_close(local_778);
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1174d3;
      fdb_kvs_close(local_788);
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1174dd;
      fdb_close(local_780);
      lVar28 = 0;
      do {
        aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1174ec;
        fdb_doc_free((fdb_doc *)aaStack_648[lVar28]);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 100);
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1174fa;
      fdb_shutdown();
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1174ff;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (sequence_iterator_duplicate_test()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117530;
      fprintf(_stderr,pcVar27,"sequence iterator duplicate test");
      return;
    }
  }
  else {
LAB_0011756a:
    aStack_7a0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11756f;
    sequence_iterator_duplicate_test();
  }
  aStack_7a0.end_seqnum = (fdb_seqnum_t)sequence_iterator_range_test;
  sequence_iterator_duplicate_test();
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117597;
  ppfStack_7c8 = ppfVar17;
  aStack_7c0 = unaff_R12;
  aStack_7b8 = unaff_R13;
  pfStack_7b0 = pfVar20;
  ppfStack_7a8 = ppfVar14;
  aStack_7a0 = unaff_RBP;
  gettimeofday(&tStack_be8,(__timezone_ptr_t)0x0);
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11759c;
  memleak_start();
  aStack_c60.end_seqnum = 0;
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1175ad;
  system("rm -rf  iterator_test* > errorlog.txt");
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1175bd;
  fdb_get_default_config();
  paVar9 = aaStack_bd8;
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1175cd;
  fdb_get_default_kvs_config();
  fStack_8c0.buffercache_size = 0;
  fStack_8c0.seqtree_opt = '\x01';
  aVar29.end_seqnum = (fdb_seqnum_t)&pfStack_c48;
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1175ec;
  fdb_open((fdb_file_handle **)aVar29,"./iterator_test1",&fStack_8c0);
  ptr_handle._M_i = (__int_type)&aStack_c50;
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1175ff;
  fdb_kvs_open_default(pfStack_c48,(fdb_kvs_handle **)ptr_handle._M_i,(fdb_kvs_config *)paVar9);
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117615;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)aStack_c50,logCallbackFunc,"sequence_iterator_test");
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00117ac6;
  unaff_R12.end_seqnum = 0;
  uVar16 = 0;
  do {
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11763d;
    sprintf(acStack_9c0,"key%d",uVar16 & 0xffffffff);
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117655;
    sprintf((char *)&aaStack_ac0[0].end_seqnum,"meta%d",uVar16 & 0xffffffff);
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11766d;
    sprintf(acStack_bc0,"body%d",uVar16 & 0xffffffff);
    aVar29.end_seqnum = (long)aaStack_c40 + unaff_R12.end_seqnum;
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11767d;
    unaff_R13.end_seqnum = strlen(acStack_9c0);
    unaff_RBP.end_seqnum = (fdb_seqnum_t)aaStack_ac0;
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117690;
    paVar9 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)strlen((char *)unaff_RBP);
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1176a0;
    sVar6 = strlen(acStack_bc0);
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1176c5;
    fdb_doc_create((fdb_doc **)aVar29,acStack_9c0,unaff_R13.end_keylen,(void *)unaff_RBP,
                   (size_t)paVar9,acStack_bc0,sVar6);
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1176d4;
    fdb_set((fdb_kvs_handle *)aStack_c50,(fdb_doc *)aaStack_c40[uVar16]);
    uVar16 = uVar16 + 1;
    unaff_R12.end_seqnum = unaff_R12.end_seqnum + 8;
  } while (uVar16 != 10);
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1176f4;
  fdb_commit(pfStack_c48,'\x01');
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11770a;
  fVar4 = fdb_iterator_sequence_init
                    ((fdb_kvs_handle *)aStack_c50,(fdb_iterator **)&aStack_c58,0,0,0);
  ptr_handle._M_i = 10;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00117acb;
  ptr_handle._M_i = 1;
  paVar9 = &aStack_c60;
  aVar10.end_seqnum = unaff_R13.end_seqnum;
  do {
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117729;
    fVar4 = fdb_iterator_get((fdb_iterator *)aStack_c58,(fdb_doc **)paVar9);
    unaff_R13 = aStack_c60;
    if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00117a5f:
      aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117a64;
      sequence_iterator_range_test();
LAB_00117a64:
      aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117a6f;
      sequence_iterator_range_test();
      unaff_R13 = aVar10;
LAB_00117a6f:
      aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117a7a;
      sequence_iterator_range_test();
      goto LAB_00117a7a;
    }
    aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aStack_c60.end_seqnum + 0x20);
    unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                aaStack_c40[ptr_handle._M_i - 1].end_seqnum;
    unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                (((atomic<unsigned_long> *)(unaff_RBP.end_seqnum + 0x20))->
                super___atomic_base<unsigned_long>)._M_i;
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117752;
    iVar5 = bcmp((void *)aVar29,(void *)unaff_R12,*(size_t *)aStack_c60);
    aVar10 = unaff_R13;
    if (iVar5 != 0) {
      aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117a5f;
      sequence_iterator_range_test();
      goto LAB_00117a5f;
    }
    aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x38);
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x38);
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117771;
    iVar5 = bcmp((void *)aVar29,(void *)unaff_R12,
                 ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 8))->
                 end_seqnum);
    if (iVar5 != 0) goto LAB_00117a6f;
    aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x40);
    unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                (((atomic<unsigned_long> *)(unaff_RBP.end_seqnum + 0x40))->
                super___atomic_base<unsigned_long>)._M_i;
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117790;
    iVar5 = bcmp((void *)aVar29,(void *)unaff_R12,
                 ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x10))->
                 end_seqnum);
    if (iVar5 != 0) goto LAB_00117a64;
    if (ptr_handle._M_i !=
        ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x28))->end_seqnum)
    {
      aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1177d4;
      sequence_iterator_range_test();
    }
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1177a8;
    fdb_doc_free((fdb_doc *)aStack_c60);
    aStack_c60.end_seqnum = 0;
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1177bb;
    fVar4 = fdb_iterator_next((fdb_iterator *)aStack_c58);
    ptr_handle._M_i = ptr_handle._M_i + 1;
  } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
  if (ptr_handle._M_i != 0xb) goto LAB_00117ad0;
  ptr_handle._M_i = (__int_type)&aStack_c58;
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1177ed;
  fdb_iterator_close((fdb_iterator *)aStack_c58);
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117804;
  fVar4 = fdb_iterator_sequence_init
                    ((fdb_kvs_handle *)aStack_c50,(fdb_iterator **)ptr_handle._M_i,0,5,0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00117ad5;
  ptr_handle._M_i = 1;
  paVar9 = &aStack_c60;
  do {
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117823;
    fVar4 = fdb_iterator_get((fdb_iterator *)aStack_c58,(fdb_doc **)paVar9);
    unaff_R13 = aStack_c60;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00117a85;
    aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aStack_c60.end_seqnum + 0x20);
    unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                aaStack_c40[ptr_handle._M_i - 1].end_seqnum;
    unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                (((atomic<unsigned_long> *)(unaff_RBP.end_seqnum + 0x20))->
                super___atomic_base<unsigned_long>)._M_i;
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11784c;
    iVar5 = bcmp((void *)aVar29,(void *)unaff_R12,*(size_t *)aStack_c60);
    if (iVar5 != 0) goto LAB_00117a7a;
    aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x38);
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x38);
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11786b;
    iVar5 = bcmp((void *)aVar29,(void *)unaff_R12,
                 ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 8))->
                 end_seqnum);
    if (iVar5 != 0) goto LAB_00117a95;
    aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x40);
    unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                (((atomic<unsigned_long> *)(unaff_RBP.end_seqnum + 0x40))->
                super___atomic_base<unsigned_long>)._M_i;
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11788a;
    iVar5 = bcmp((void *)aVar29,(void *)unaff_R12,
                 ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x10))->
                 end_seqnum);
    if (iVar5 != 0) goto LAB_00117a8a;
    if (ptr_handle._M_i !=
        ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x28))->end_seqnum)
    {
      aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1178ce;
      sequence_iterator_range_test();
    }
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1178a2;
    fdb_doc_free((fdb_doc *)aStack_c60);
    aStack_c60.end_seqnum = 0;
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1178b5;
    fVar4 = fdb_iterator_next((fdb_iterator *)aStack_c58);
    ptr_handle._M_i = ptr_handle._M_i + 1;
    aVar10 = unaff_R13;
  } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
  if (ptr_handle._M_i != 6) goto LAB_00117ada;
  paVar9 = &aStack_c58;
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1178e7;
  fdb_iterator_close((fdb_iterator *)aStack_c58);
  ptr_handle._M_i = 6;
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117903;
  fVar4 = fdb_iterator_sequence_init((fdb_kvs_handle *)aStack_c50,(fdb_iterator **)paVar9,6,0,0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00117adf;
  paVar9 = &aStack_c60;
  do {
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11791d;
    fVar4 = fdb_iterator_get((fdb_iterator *)aStack_c58,(fdb_doc **)paVar9);
    unaff_R13 = aStack_c60;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00117aab;
    aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aStack_c60.end_seqnum + 0x20);
    unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                aaStack_c40[ptr_handle._M_i - 1].end_seqnum;
    unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                (((atomic<unsigned_long> *)(unaff_RBP.end_seqnum + 0x20))->
                super___atomic_base<unsigned_long>)._M_i;
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117946;
    iVar5 = bcmp((void *)aVar29,(void *)unaff_R12,*(size_t *)aStack_c60);
    if (iVar5 != 0) goto LAB_00117aa0;
    aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x38);
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x38);
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117965;
    iVar5 = bcmp((void *)aVar29,(void *)unaff_R12,
                 ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 8))->
                 end_seqnum);
    if (iVar5 != 0) goto LAB_00117abb;
    aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x40);
    unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                (((atomic<unsigned_long> *)(unaff_RBP.end_seqnum + 0x40))->
                super___atomic_base<unsigned_long>)._M_i;
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117984;
    iVar5 = bcmp((void *)aVar29,(void *)unaff_R12,
                 ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x10))->
                 end_seqnum);
    if (iVar5 != 0) goto LAB_00117ab0;
    if (ptr_handle._M_i !=
        ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x28))->end_seqnum)
    {
      aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1179c8;
      sequence_iterator_range_test();
    }
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11799c;
    fdb_doc_free((fdb_doc *)aStack_c60);
    aStack_c60.end_seqnum = 0;
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1179af;
    fVar4 = fdb_iterator_next((fdb_iterator *)aStack_c58);
    ptr_handle._M_i = ptr_handle._M_i + 1;
    aVar10 = unaff_R13;
  } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
  if (ptr_handle._M_i == 0xb) {
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1179de;
    fdb_iterator_close((fdb_iterator *)aStack_c58);
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1179e8;
    fdb_kvs_close((fdb_kvs_handle *)aStack_c50);
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1179f2;
    fdb_close(pfStack_c48);
    lVar28 = 0;
    do {
      aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1179fe;
      fdb_doc_free((fdb_doc *)aaStack_c40[lVar28]);
      lVar28 = lVar28 + 1;
    } while (lVar28 != 10);
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117a0c;
    fdb_shutdown();
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117a11;
    memleak_end();
    pcVar27 = "%s PASSED\n";
    if (sequence_iterator_range_test()::__test_pass != '\0') {
      pcVar27 = "%s FAILED\n";
    }
    aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117a42;
    fprintf(_stderr,pcVar27,"sequence iterator range test");
    return;
  }
  goto LAB_00117ae4;
LAB_00118165:
  aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118170;
  reverse_sequence_iterator_test();
  aVar18 = aVar29;
LAB_00118170:
  aVar29 = aVar18;
  aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118175;
  reverse_sequence_iterator_test();
LAB_00118175:
  aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118180;
  reverse_sequence_iterator_test();
LAB_00118180:
  aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11818b;
  reverse_sequence_iterator_test();
LAB_0011818b:
  aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118190;
  reverse_sequence_iterator_test();
LAB_00118190:
  aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11819b;
  reverse_sequence_iterator_test();
LAB_0011819b:
  aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1181a6;
  reverse_sequence_iterator_test();
LAB_001181a6:
  aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1181b1;
  reverse_sequence_iterator_test();
  aVar18 = doc;
  goto LAB_001181b1;
LAB_00118a3b:
  aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a40;
  reverse_sequence_iterator_kvs_test();
LAB_00118a40:
  aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a45;
  reverse_sequence_iterator_kvs_test();
LAB_00118a45:
  aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a4a;
  reverse_sequence_iterator_kvs_test();
LAB_00118a4a:
  aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a55;
  reverse_sequence_iterator_kvs_test();
  aVar18 = aVar29;
LAB_00118a55:
  aVar29 = aVar18;
  aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a5a;
  reverse_sequence_iterator_kvs_test();
LAB_00118a5a:
  aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a65;
  reverse_sequence_iterator_kvs_test();
LAB_00118a65:
  aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a70;
  reverse_sequence_iterator_kvs_test();
  goto LAB_00118a70;
LAB_00119243:
  pbStack_1b60 = (btree *)0x11924e;
  reverse_iterator_test();
  pfVar19 = doc_01;
LAB_0011924e:
  doc_01 = pfVar19;
  pbStack_1b60 = (btree *)0x119253;
  reverse_iterator_test();
LAB_00119253:
  pbStack_1b60 = (btree *)0x11925e;
  reverse_iterator_test();
LAB_0011925e:
  pbStack_1b60 = (btree *)0x119269;
  reverse_iterator_test();
LAB_00119269:
  pbStack_1b60 = (btree *)0x119274;
  reverse_iterator_test();
  pfVar19 = doc_01;
LAB_00119274:
  doc_01 = pfVar19;
  pbStack_1b60 = (btree *)0x119279;
  reverse_iterator_test();
LAB_00119279:
  pbStack_1b60 = (btree *)0x119284;
  reverse_iterator_test();
LAB_00119284:
  pbStack_1b60 = (btree *)0x11928f;
  reverse_iterator_test();
  pfVar20 = doc_01;
LAB_0011928f:
  doc_01 = pfVar20;
  pbStack_1b60 = (btree *)0x119294;
  reverse_iterator_test();
LAB_00119294:
  pbStack_1b60 = (btree *)0x11929f;
  reverse_iterator_test();
LAB_0011929f:
  pbStack_1b60 = (btree *)0x1192aa;
  reverse_iterator_test();
LAB_001192aa:
  pfVar20 = (fdb_doc *)auStack_1b48;
  pbStack_1b60 = (btree *)0x1192b5;
  reverse_iterator_test();
  goto LAB_001192b5;
LAB_0011a231:
  aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a23c;
  iterator_seek_wal_only_test();
  pfVar30 = pfVar12;
LAB_0011a23c:
  pfVar12 = pfVar30;
  aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a241;
  iterator_seek_wal_only_test();
  pfVar15 = pfVar21;
LAB_0011a241:
  aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a24c;
  iterator_seek_wal_only_test();
LAB_0011a24c:
  aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a257;
  iterator_seek_wal_only_test();
LAB_0011a257:
  aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a262;
  iterator_seek_wal_only_test();
  pfVar21 = pfVar12;
LAB_0011a262:
  pfVar12 = pfVar21;
  aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a267;
  iterator_seek_wal_only_test();
LAB_0011a267:
  aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a272;
  iterator_seek_wal_only_test();
LAB_0011a272:
  aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a27d;
  iterator_seek_wal_only_test();
  goto LAB_0011a27d;
LAB_0011a6be:
  pcStack_2868 = (code *)0x11a6c3;
  iterator_after_wal_threshold();
  goto LAB_0011a6c3;
LAB_0011ab69:
  pfStack_2a30 = (fdb_kvs_handle *)0x11ab6e;
  iterator_manual_wal_flush();
LAB_0011ab6e:
  ptr_iterator = &pfStack_2a18;
  pfStack_2a30 = (fdb_kvs_handle *)0x11ab73;
  iterator_manual_wal_flush();
  goto LAB_0011ab73;
LAB_0011b161:
  pfStack_2ef8 = (fdb_kvs_handle *)0x11b16c;
  sequence_iterator_seek_test();
  pfVar31 = pfVar22;
LAB_0011b16c:
  pfVar22 = pfVar31;
  pfStack_2ef8 = (fdb_kvs_handle *)0x11b171;
  sequence_iterator_seek_test();
LAB_0011b171:
  pfStack_2ef8 = (fdb_kvs_handle *)0x11b17c;
  sequence_iterator_seek_test();
LAB_0011b17c:
  pfStack_2ef8 = (fdb_kvs_handle *)0x11b187;
  sequence_iterator_seek_test();
LAB_0011b187:
  pfStack_2ef8 = (fdb_kvs_handle *)0x11b192;
  sequence_iterator_seek_test();
  pfVar31 = pfVar22;
  goto LAB_0011b192;
LAB_0011b4b1:
  ppfVar17 = &pfStack_3290;
  ppfStack_32a0 = (fdb_doc **)0x11b4b6;
  iterator_concurrent_compaction();
  goto LAB_0011b4b6;
LAB_0011b9d5:
  ppfStack_5578 = (fdb_doc **)0x11b9da;
  iterator_offset_access_test();
LAB_0011b9da:
  ppfStack_5578 = (fdb_doc **)0x11b9df;
  iterator_offset_access_test();
LAB_0011b9df:
  ppfStack_5578 = (fdb_doc **)0x11b9e4;
  iterator_offset_access_test();
LAB_0011b9e4:
  ppfStack_5578 = (fdb_doc **)0x11b9e9;
  iterator_offset_access_test();
LAB_0011b9e9:
  ppfStack_5578 = (fdb_doc **)0x11b9ee;
  iterator_offset_access_test();
LAB_0011b9ee:
  ppfStack_5578 = (fdb_doc **)0x11b9f3;
  iterator_offset_access_test();
LAB_0011b9f3:
  ppfStack_5578 = (fdb_doc **)0x11b9f8;
  iterator_offset_access_test();
  goto LAB_0011b9f8;
LAB_00117a7a:
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117a85;
  sequence_iterator_range_test();
  aVar10 = unaff_R13;
LAB_00117a85:
  unaff_R13 = aVar10;
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117a8a;
  sequence_iterator_range_test();
LAB_00117a8a:
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117a95;
  sequence_iterator_range_test();
LAB_00117a95:
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117aa0;
  sequence_iterator_range_test();
LAB_00117aa0:
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117aab;
  sequence_iterator_range_test();
  aVar10 = unaff_R13;
LAB_00117aab:
  unaff_R13 = aVar10;
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117ab0;
  sequence_iterator_range_test();
LAB_00117ab0:
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117abb;
  sequence_iterator_range_test();
LAB_00117abb:
  paVar9 = &aStack_c60;
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117ac6;
  sequence_iterator_range_test();
LAB_00117ac6:
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117acb;
  sequence_iterator_range_test();
LAB_00117acb:
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117ad0;
  sequence_iterator_range_test();
LAB_00117ad0:
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117ad5;
  sequence_iterator_range_test();
LAB_00117ad5:
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117ada;
  sequence_iterator_range_test();
LAB_00117ada:
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117adf;
  sequence_iterator_range_test();
LAB_00117adf:
  aStack_c78 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117ae4;
  sequence_iterator_range_test();
LAB_00117ae4:
  aStack_c78.end_seqnum = (fdb_seqnum_t)reverse_sequence_iterator_test;
  sequence_iterator_range_test();
  aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117b0c;
  paStack_ca0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)ptr_handle._M_i;
  aStack_c98 = unaff_R12;
  aStack_c90 = unaff_R13;
  paStack_c88 = paVar9;
  aStack_c80 = aVar29;
  aStack_c78 = unaff_RBP;
  gettimeofday(&tStack_10c0,(__timezone_ptr_t)0x0);
  aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117b11;
  memleak_start();
  aStack_1130.end_seqnum = 0;
  aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117b22;
  system("rm -rf  iterator_test* > errorlog.txt");
  aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117b32;
  fdb_get_default_config();
  aVar29.end_seqnum = (fdb_seqnum_t)auStack_10b0;
  aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117b42;
  fdb_get_default_kvs_config();
  fStack_d98.buffercache_size = 0;
  fStack_d98.seqtree_opt = '\x01';
  fStack_d98.wal_threshold = 0x400;
  fStack_d98.flags = 1;
  fStack_d98.compaction_threshold = '\0';
  aVar10.end_seqnum = (fdb_seqnum_t)&pfStack_1120;
  aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117b74;
  fdb_open((fdb_file_handle **)aVar10,"./iterator_test1",&fStack_d98);
  aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117b87;
  fdb_kvs_open_default(pfStack_1120,(fdb_kvs_handle **)&aStack_1128,(fdb_kvs_config *)aVar29);
  aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117b9d;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)aStack_1128,logCallbackFunc,"reverse_sequence_iterator_test")
  ;
  aVar18.end_seqnum = (fdb_seqnum_t)&aStack_1128;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    lVar28 = 0;
    uVar16 = 0;
    do {
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117bc5;
      sprintf(acStack_e98,"key%d",uVar16 & 0xffffffff);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117bdd;
      sprintf(acStack_f98,"meta%d",uVar16 & 0xffffffff);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117bf5;
      sprintf(auStack_10b0 + 0x18,"body%d",uVar16 & 0xffffffff);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117c05;
      sVar6 = strlen(acStack_e98);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117c18;
      sVar7 = strlen(acStack_f98);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117c28;
      sVar8 = strlen(auStack_10b0 + 0x18);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117c4d;
      fdb_doc_create((fdb_doc **)((long)aaStack_1118 + lVar28),acStack_e98,sVar6,acStack_f98,sVar7,
                     auStack_10b0 + 0x18,sVar8);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117c5c;
      fdb_set((fdb_kvs_handle *)aStack_1128,(fdb_doc *)aaStack_1118[uVar16]);
      lVar28 = lVar28 + 0x10;
      bVar33 = uVar16 < 8;
      uVar16 = uVar16 + 2;
    } while (bVar33);
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117c80;
    fdb_commit(pfStack_1120,'\x01');
    lVar28 = 8;
    uVar16 = 1;
    do {
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117ca8;
      sprintf(acStack_e98,"key%d",uVar16 & 0xffffffff);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117cc1;
      sprintf(acStack_f98,"meta%d",uVar16 & 0xffffffff);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117cda;
      sprintf(auStack_10b0 + 0x18,"body%d",uVar16 & 0xffffffff);
      unaff_R12.end_seqnum = (long)aaStack_1118 + lVar28;
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117cea;
      unaff_RBP.end_seqnum = strlen(acStack_e98);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117cfd;
      aVar10.end_seqnum = strlen(acStack_f98);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117d0d;
      sVar6 = strlen(auStack_10b0 + 0x18);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117d32;
      fdb_doc_create((fdb_doc **)unaff_R12,acStack_e98,unaff_RBP.end_keylen,acStack_f98,
                     aVar10.end_keylen,auStack_10b0 + 0x18,sVar6);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117d41;
      fdb_set((fdb_kvs_handle *)aStack_1128,(fdb_doc *)aaStack_1118[uVar16]);
      aVar29.end_seqnum = uVar16 + 2;
      lVar28 = lVar28 + 0x10;
      bVar33 = uVar16 < 8;
      uVar16 = (ulong)aVar29;
    } while (bVar33);
    doc.end_seqnum = 0;
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117d64;
    fdb_commit(pfStack_1120,'\0');
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117d7a;
    fdb_iterator_sequence_init((fdb_kvs_handle *)aStack_1128,&pfStack_1138,0,0,0);
    unaff_R13.end_seqnum = 0;
    do {
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117d8c;
      fVar4 = fdb_iterator_get(pfStack_1138,(fdb_doc **)&aStack_1130);
      aVar18 = aStack_1130;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011818b;
      aVar10.end_seqnum = *(aStack_1130.end_seqnum + 0x20);
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                  aaStack_1118[unaff_R13.end_seqnum].end_seqnum;
      unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                  (((atomic<unsigned_long> *)(unaff_RBP.end_seqnum + 0x20))->
                  super___atomic_base<unsigned_long>)._M_i;
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117db4;
      iVar5 = bcmp((void *)aVar10,(void *)unaff_R12,*(size_t *)aStack_1130);
      aVar29 = aVar18;
      if (iVar5 != 0) goto LAB_0011819b;
      aVar10.end_seqnum = *(aVar18.end_seqnum + 0x38);
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x38);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117dd3;
      iVar5 = bcmp((void *)aVar10,(void *)unaff_R12,*(size_t *)(aVar18.end_seqnum + 8));
      if (iVar5 != 0) goto LAB_00118190;
      aVar10.end_seqnum = *(aVar18.end_seqnum + 0x40);
      unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                  (((atomic<unsigned_long> *)(unaff_RBP.end_seqnum + 0x40))->
                  super___atomic_base<unsigned_long>)._M_i;
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117df2;
      iVar5 = bcmp((void *)aVar10,(void *)unaff_R12,*(size_t *)(aVar18.end_seqnum + 0x10));
      if (iVar5 != 0) goto LAB_001181a6;
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117e02;
      fdb_doc_free((fdb_doc *)aVar18);
      aStack_1130.end_seqnum = 0;
      if ((int)doc.end_seqnum == -4) {
        unaff_R13.end_seqnum = 8;
        unaff_RBP.end_seqnum = 4;
        aVar18.end_seqnum = 5;
        goto LAB_00117e41;
      }
      unaff_R13.end_seqnum = unaff_R13.end_seqnum + 2;
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117e1e;
      fVar4 = fdb_iterator_next(pfStack_1138);
      doc.end_seqnum._0_4_ = (int)doc.end_seqnum - 1;
      doc.end_seqnum._4_4_ = 0;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    unaff_RBP._0_4_ = ~doc.end_seqnum._0_4_;
    unaff_RBP.end_seqnum._4_4_ = 0;
    aVar18._0_4_ = -doc.end_seqnum._0_4_;
    aVar18.end_seqnum._4_4_ = 0;
LAB_00117e41:
    if ((int)aVar18.end_seqnum != 5) goto LAB_001181b6;
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117e54;
    fVar4 = fdb_iterator_prev(pfStack_1138);
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001181bb;
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117e6c;
    fVar4 = fdb_iterator_get(pfStack_1138,(fdb_doc **)&aStack_1130);
    doc = aStack_1130;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001181c0;
    aVar29.end_seqnum = *(aStack_1130.end_seqnum + 0x20);
    unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                (&aStack_1128)[(int)unaff_R13.end_seqnum].end_seqnum;
    aVar10 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R12.end_seqnum + 0x20);
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117e98;
    iVar5 = bcmp((void *)aVar29,(void *)aVar10,*(size_t *)aStack_1130);
    if (iVar5 != 0) goto LAB_001181c5;
    aVar29.end_seqnum = *(doc.end_seqnum + 0x38);
    aVar10 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R12.end_seqnum + 0x38);
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117eb8;
    iVar5 = bcmp((void *)aVar29,(void *)aVar10,*(size_t *)(doc.end_seqnum + 8));
    if (iVar5 != 0) goto LAB_001181d0;
    aVar29.end_seqnum = *(doc.end_seqnum + 0x40);
    aVar10 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R12.end_seqnum + 0x40);
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117ed8;
    iVar5 = bcmp((void *)aVar29,(void *)aVar10,*(size_t *)(doc.end_seqnum + 0x10));
    if (iVar5 != 0) goto LAB_001181db;
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117ee8;
    fdb_doc_free((fdb_doc *)doc);
    aStack_1130.end_seqnum = 0;
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117efb;
    fVar4 = fdb_iterator_next(pfStack_1138);
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) {
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117f0a;
      reverse_sequence_iterator_test();
    }
    unaff_RBP._0_4_ = (int)unaff_RBP.end_seqnum - 10;
    unaff_RBP.end_seqnum._4_4_ = 0;
    aVar18 = aVar29;
    do {
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117f1c;
      fVar4 = fdb_iterator_get(pfStack_1138,(fdb_doc **)&aStack_1130);
      aVar29 = aStack_1130;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0011814a:
        aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11814f;
        reverse_sequence_iterator_test();
        aVar29 = aVar18;
LAB_0011814f:
        aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11815a;
        reverse_sequence_iterator_test();
LAB_0011815a:
        aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118165;
        reverse_sequence_iterator_test();
        goto LAB_00118165;
      }
      aVar10.end_seqnum = *(aStack_1130.end_seqnum + 0x20);
      iVar25 = (int)unaff_R13.end_seqnum;
      doc = (anon_union_8_2_c155ca52_for__fdb_iterator_13)aaStack_1118[iVar25].end_seqnum;
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(doc.end_seqnum + 0x20);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117f47;
      iVar5 = bcmp((void *)aVar10,(void *)unaff_R12,*(size_t *)aStack_1130);
      aVar18 = aVar29;
      if (iVar5 != 0) {
        aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11814a;
        reverse_sequence_iterator_test();
        goto LAB_0011814a;
      }
      aVar10.end_seqnum = *(aVar29.end_seqnum + 0x38);
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(doc.end_seqnum + 0x38);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117f66;
      iVar5 = bcmp((void *)aVar10,(void *)unaff_R12,*(size_t *)(aVar29.end_seqnum + 8));
      if (iVar5 != 0) goto LAB_0011815a;
      aVar10.end_seqnum = *(aVar29.end_seqnum + 0x40);
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(doc.end_seqnum + 0x40);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117f85;
      iVar5 = bcmp((void *)aVar10,(void *)unaff_R12,*(size_t *)(aVar29.end_seqnum + 0x10));
      if (iVar5 != 0) goto LAB_0011814f;
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117f95;
      fdb_doc_free((fdb_doc *)aVar29);
      aStack_1130.end_seqnum = 0;
      uVar23 = iVar25 + 2;
      if (7 < iVar25) {
        uVar23 = 1;
      }
      doc.end_seqnum._4_4_ = 0;
      doc.end_seqnum._0_4_ = uVar23;
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117fb8;
      fVar4 = fdb_iterator_next(pfStack_1138);
      unaff_RBP._0_4_ = (int)unaff_RBP.end_seqnum + 1;
      unaff_RBP.end_seqnum._4_4_ = 0;
      unaff_R13.end_seqnum._4_4_ = 0;
      unaff_R13.end_seqnum._0_4_ = uVar23;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if (unaff_RBP._0_4_ != 0) goto LAB_001181e6;
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117fd8;
    fVar4 = fdb_iterator_prev(pfStack_1138);
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001181eb;
    doc.end_seqnum = 9;
    aVar29.end_seqnum = 10;
    do {
      unaff_RBP = aVar29;
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117ffe;
      fVar4 = fdb_iterator_get(pfStack_1138,(fdb_doc **)&aStack_1130);
      aVar29 = aStack_1130;
      aVar18 = unaff_RBP;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00118170;
      aVar10 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aStack_1130.end_seqnum + 0x20);
      iVar25 = (int)doc.end_seqnum;
      unaff_R13 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)aaStack_1118[iVar25].end_seqnum;
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x20);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118029;
      iVar5 = bcmp((void *)aVar10,(void *)unaff_R12,*(size_t *)aStack_1130);
      if (iVar5 != 0) goto LAB_00118165;
      aVar10 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar29.end_seqnum + 0x38);
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x38);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118048;
      iVar5 = bcmp((void *)aVar10,(void *)unaff_R12,
                   ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar29.end_seqnum + 8))->
                   end_seqnum);
      if (iVar5 != 0) goto LAB_00118180;
      aVar10 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar29.end_seqnum + 0x40);
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x40);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118067;
      iVar5 = bcmp((void *)aVar10,(void *)unaff_R12,
                   ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar29.end_seqnum + 0x10))->
                   end_seqnum);
      if (iVar5 != 0) goto LAB_00118175;
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118077;
      fdb_doc_free((fdb_doc *)aVar29);
      aStack_1130.end_seqnum = 0;
      uVar23 = iVar25 - 2;
      if (iVar25 < 2) {
        uVar23 = 8;
      }
      doc.end_seqnum._4_4_ = 0;
      doc.end_seqnum._0_4_ = uVar23;
      uVar24 = (uint)unaff_RBP.end_seqnum;
      uVar23 = uVar24 - 1;
      if (uVar24 == 0) {
        uVar23 = 0;
      }
      aVar29.end_seqnum._4_4_ = 0;
      aVar29.end_seqnum._0_4_ = uVar23;
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1180aa;
      fVar4 = fdb_iterator_prev(pfStack_1138);
      aVar10 = doc;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar24 < 2) {
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1180c9;
      fdb_iterator_close(pfStack_1138);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1180d3;
      fdb_kvs_close((fdb_kvs_handle *)aStack_1128);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1180dd;
      fdb_close(pfStack_1120);
      lVar28 = 0;
      do {
        aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1180e9;
        fdb_doc_free((fdb_doc *)aaStack_1118[lVar28]);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 10);
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1180f7;
      fdb_shutdown();
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1180fc;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (reverse_sequence_iterator_test()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11812d;
      fprintf(_stderr,pcVar27,"reverse sequence iterator test");
      return;
    }
  }
  else {
LAB_001181b1:
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1181b6;
    reverse_sequence_iterator_test();
LAB_001181b6:
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1181bb;
    reverse_sequence_iterator_test();
LAB_001181bb:
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1181c0;
    reverse_sequence_iterator_test();
LAB_001181c0:
    doc = aVar18;
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1181c5;
    reverse_sequence_iterator_test();
LAB_001181c5:
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1181d0;
    reverse_sequence_iterator_test();
LAB_001181d0:
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1181db;
    reverse_sequence_iterator_test();
LAB_001181db:
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1181e6;
    reverse_sequence_iterator_test();
LAB_001181e6:
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1181eb;
    reverse_sequence_iterator_test();
LAB_001181eb:
    aStack_1150 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1181f0;
    reverse_sequence_iterator_test();
  }
  aStack_1150.end_seqnum = (fdb_seqnum_t)reverse_sequence_iterator_kvs_test;
  reverse_sequence_iterator_test();
  aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118218;
  aStack_1178 = doc;
  aStack_1170 = unaff_R12;
  aStack_1168 = unaff_R13;
  aStack_1160 = aVar29;
  aStack_1158 = aVar10;
  aStack_1150 = unaff_RBP;
  gettimeofday((timeval *)afStack_15d0,(__timezone_ptr_t)0x0);
  aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11821d;
  memleak_start();
  aStack_1670.end_seqnum = 0;
  aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11822e;
  system("rm -rf  iterator_test* > errorlog.txt");
  aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11823e;
  fdb_get_default_config();
  aVar29.end_seqnum = (fdb_seqnum_t)&fStack_15e8;
  aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11824e;
  fdb_get_default_kvs_config();
  fStack_1270.buffercache_size = 0;
  fStack_1270.seqtree_opt = '\x01';
  fStack_1270.wal_threshold = 0x400;
  fStack_1270.flags = 1;
  fStack_1270.compaction_threshold = '\0';
  aVar10.end_seqnum = (fdb_seqnum_t)&pfStack_1650;
  aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118280;
  fdb_open((fdb_file_handle **)aVar10,"./iterator_test1",&fStack_1270);
  paVar9 = &aStack_1658;
  aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118293;
  fdb_kvs_open_default(pfStack_1650,(fdb_kvs_handle **)paVar9,(fdb_kvs_config *)aVar29);
  aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1182a9;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)aStack_1658,logCallbackFunc,
                     "reverse_sequence_iterator_kvs_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1182cf;
    fVar4 = fdb_kvs_open(pfStack_1650,&pfStack_1648,"kv2",&fStack_15e8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00118a7f;
    unaff_R12.end_seqnum = 0;
    paVar9 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x0;
    do {
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1182f7;
      sprintf(acStack_1370,"kEy%d",(ulong)paVar9 & 0xffffffff);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11830f;
      sprintf((char *)&aaStack_1470[0].end_seqnum,"mEta%d",(ulong)paVar9 & 0xffffffff);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118327;
      sprintf(auStack_1570,"bOdy%d",(ulong)paVar9 & 0xffffffff);
      aVar10.end_seqnum = (long)&afStack_15d0[0].custom_cmp_param + unaff_R12.end_seqnum;
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11833a;
      unaff_R13.end_seqnum = strlen(acStack_1370);
      unaff_RBP.end_seqnum = (fdb_seqnum_t)aaStack_1470;
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11834d;
      aVar29.end_seqnum = strlen((char *)unaff_RBP);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11835d;
      sVar6 = strlen(auStack_1570);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118382;
      fdb_doc_create((fdb_doc **)aVar10,acStack_1370,unaff_R13.end_keylen,(void *)unaff_RBP,
                     aVar29.end_keylen,auStack_1570,sVar6);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118394;
      fVar4 = fdb_set(pfStack_1648,(fdb_doc *)(&afStack_15d0[0].custom_cmp_param)[(long)paVar9]);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a3b;
        reverse_sequence_iterator_kvs_test();
        goto LAB_00118a3b;
      }
      paVar9 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)((long)paVar9 + 1);
      unaff_R12.end_seqnum = unaff_R12.end_seqnum + 8;
    } while (paVar9 != (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0xa);
    lVar28 = 0;
    uVar16 = 0;
    do {
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1183cd;
      sprintf(acStack_1370,"key%d",uVar16 & 0xffffffff);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1183e5;
      sprintf((char *)&aaStack_1470[0].end_seqnum,"meta%d",uVar16 & 0xffffffff);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1183fd;
      sprintf(auStack_1570,"body%d",uVar16 & 0xffffffff);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11840d;
      sVar6 = strlen(acStack_1370);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118420;
      sVar7 = strlen((char *)&aaStack_1470[0].end_seqnum);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118430;
      sVar8 = strlen(auStack_1570);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118455;
      fdb_doc_create((fdb_doc **)((long)aaStack_1640 + lVar28),acStack_1370,sVar6,aaStack_1470,sVar7
                     ,auStack_1570,sVar8);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118464;
      fdb_set((fdb_kvs_handle *)aStack_1658,(fdb_doc *)aaStack_1640[uVar16]);
      lVar28 = lVar28 + 0x10;
      bVar33 = uVar16 < 8;
      uVar16 = uVar16 + 2;
    } while (bVar33);
    aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118488;
    fdb_commit(pfStack_1650,'\x01');
    unaff_R13 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x8;
    uVar16 = 1;
    do {
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1184b0;
      sprintf(acStack_1370,"key%d",uVar16 & 0xffffffff);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1184c9;
      sprintf((char *)&aaStack_1470[0].end_seqnum,"meta%d",uVar16 & 0xffffffff);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1184e2;
      sprintf(auStack_1570,"body%d",uVar16 & 0xffffffff);
      unaff_R12.end_seqnum = (long)aaStack_1640 + unaff_R13.end_seqnum;
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1184f2;
      unaff_RBP.end_seqnum = strlen(acStack_1370);
      paVar9 = aaStack_1470;
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118505;
      sVar6 = strlen((char *)&paVar9->end_seqnum);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118515;
      sVar7 = strlen(auStack_1570);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11853a;
      fdb_doc_create((fdb_doc **)unaff_R12,acStack_1370,unaff_RBP.end_keylen,paVar9,sVar6,
                     auStack_1570,sVar7);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118549;
      fdb_set((fdb_kvs_handle *)aStack_1658,(fdb_doc *)aaStack_1640[uVar16]);
      aVar29.end_seqnum = uVar16 + 2;
      unaff_R13.end_seqnum = unaff_R13.end_seqnum + 0x10;
      bVar33 = uVar16 < 8;
      uVar16 = (ulong)aVar29;
    } while (bVar33);
    aVar10.end_seqnum = 0;
    aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11856d;
    fdb_commit(pfStack_1650,'\0');
    aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118583;
    fVar4 = fdb_iterator_sequence_init
                      ((fdb_kvs_handle *)aStack_1658,(fdb_iterator **)&aStack_1668,0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00118a84;
    paVar9 = aaStack_1640;
    aVar29.end_seqnum = (fdb_seqnum_t)&aStack_1670;
    do {
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1185a2;
      fdb_iterator_get((fdb_iterator *)aStack_1668,(fdb_doc **)aVar29);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1185ba;
      iVar5 = bcmp((void *)*(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)
                            (aStack_1670.end_seqnum + 0x20),
                   ((fdb_kvs_handle *)paVar9->end_seqnum)->op_stats,*(size_t *)aStack_1670);
      if (iVar5 != 0) {
        aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118638;
        reverse_sequence_iterator_kvs_test();
      }
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1185d7;
      iVar5 = bcmp((void *)*(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)
                            (aStack_1670.end_seqnum + 0x38),
                   ((fdb_kvs_handle *)paVar9->end_seqnum)->staletree,
                   ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aStack_1670.end_seqnum + 8))->
                   end_seqnum);
      if (iVar5 != 0) {
        aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118645;
        reverse_sequence_iterator_kvs_test();
      }
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1185f4;
      iVar5 = bcmp((void *)*(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)
                            (aStack_1670.end_seqnum + 0x40),
                   (((fdb_kvs_handle *)paVar9->end_seqnum)->field_6).seqtree,
                   ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aStack_1670.end_seqnum + 0x10))
                   ->end_seqnum);
      if (iVar5 != 0) {
        aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118652;
        reverse_sequence_iterator_kvs_test();
      }
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118602;
      fdb_doc_free((fdb_doc *)aStack_1670);
      aStack_1670.end_seqnum = 0;
      if ((int)aVar10.end_seqnum == 4) {
        aVar10.end_seqnum = 5;
        break;
      }
      aVar10._0_4_ = (int)aVar10.end_seqnum + 1;
      aVar10.end_seqnum._4_4_ = 0;
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11861e;
      fVar4 = fdb_iterator_next((fdb_iterator *)aStack_1668);
      paVar9 = paVar9 + 2;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)aVar10.end_seqnum != 5) goto LAB_00118a89;
    aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11867a;
    fVar4 = fdb_iterator_sequence_init(pfStack_1648,(fdb_iterator **)&aStack_1660,0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00118a8e;
    paVar9 = &aStack_1670;
    do {
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118694;
      fVar4 = fdb_iterator_get((fdb_iterator *)aStack_1660,(fdb_doc **)paVar9);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00118a3b;
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1186a6;
      fdb_doc_free((fdb_doc *)aStack_1670);
      aStack_1670.end_seqnum = 0;
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1186b9;
      fVar4 = fdb_iterator_next((fdb_iterator *)aStack_1660);
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1186cd;
    fdb_commit(pfStack_1650,'\x01');
    aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1186d7;
    fVar4 = fdb_iterator_prev((fdb_iterator *)aStack_1668);
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) {
LAB_00118a70:
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a75;
      reverse_sequence_iterator_kvs_test();
LAB_00118a75:
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a7a;
      reverse_sequence_iterator_kvs_test();
      goto LAB_00118a7a;
    }
    unaff_RBP.end_seqnum = 4;
    paVar9 = aaStack_1640 + 6;
    aVar29.end_seqnum = (fdb_seqnum_t)&aStack_1670;
    do {
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1186fc;
      fVar4 = fdb_iterator_get((fdb_iterator *)aStack_1668,(fdb_doc **)aVar29);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00118a40;
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11871c;
      iVar5 = bcmp((void *)*(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)
                            (aStack_1670.end_seqnum + 0x20),
                   ((fdb_kvs_handle *)paVar9->end_seqnum)->op_stats,*(size_t *)aStack_1670);
      if (iVar5 != 0) {
        aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118793;
        reverse_sequence_iterator_kvs_test();
      }
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118739;
      iVar5 = bcmp((void *)*(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)
                            (aStack_1670.end_seqnum + 0x38),
                   ((fdb_kvs_handle *)paVar9->end_seqnum)->staletree,
                   ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aStack_1670.end_seqnum + 8))->
                   end_seqnum);
      if (iVar5 != 0) {
        aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1187a0;
        reverse_sequence_iterator_kvs_test();
      }
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118756;
      iVar5 = bcmp((void *)*(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)
                            (aStack_1670.end_seqnum + 0x40),
                   (((fdb_kvs_handle *)paVar9->end_seqnum)->field_6).seqtree,
                   ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aStack_1670.end_seqnum + 0x10))
                   ->end_seqnum);
      if (iVar5 != 0) {
        aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1187ad;
        reverse_sequence_iterator_kvs_test();
      }
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118764;
      fdb_doc_free((fdb_doc *)aStack_1670);
      aStack_1670.end_seqnum = 0;
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118777;
      fVar4 = fdb_iterator_prev((fdb_iterator *)aStack_1668);
      paVar9 = paVar9 + -2;
      unaff_RBP._0_4_ = (int)unaff_RBP.end_seqnum - 1;
      unaff_RBP.end_seqnum._4_4_ = 0;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if (unaff_RBP._0_4_ != 0) goto LAB_00118a70;
    aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1187c1;
    fdb_iterator_close((fdb_iterator *)aStack_1668);
    aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1187cb;
    fVar4 = fdb_iterator_prev((fdb_iterator *)aStack_1660);
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00118a75;
    unaff_RBP.end_seqnum = 10;
    paVar9 = &aStack_1578;
    aVar29.end_seqnum = (fdb_seqnum_t)&aStack_1670;
    do {
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1187f3;
      fVar4 = fdb_iterator_get((fdb_iterator *)aStack_1660,(fdb_doc **)aVar29);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00118a45;
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118813;
      iVar5 = bcmp((void *)*(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)
                            (aStack_1670.end_seqnum + 0x20),
                   ((fdb_kvs_handle *)paVar9->end_seqnum)->op_stats,*(size_t *)aStack_1670);
      if (iVar5 != 0) {
        aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11888a;
        reverse_sequence_iterator_kvs_test();
      }
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118830;
      iVar5 = bcmp((void *)*(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)
                            (aStack_1670.end_seqnum + 0x38),
                   ((fdb_kvs_handle *)paVar9->end_seqnum)->staletree,
                   ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aStack_1670.end_seqnum + 8))->
                   end_seqnum);
      if (iVar5 != 0) {
        aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118897;
        reverse_sequence_iterator_kvs_test();
      }
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11884d;
      iVar5 = bcmp((void *)*(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)
                            (aStack_1670.end_seqnum + 0x40),
                   (((fdb_kvs_handle *)paVar9->end_seqnum)->field_6).seqtree,
                   ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aStack_1670.end_seqnum + 0x10))
                   ->end_seqnum);
      if (iVar5 != 0) {
        aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1188a4;
        reverse_sequence_iterator_kvs_test();
      }
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11885b;
      fdb_doc_free((fdb_doc *)aStack_1670);
      aStack_1670.end_seqnum = 0;
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11886e;
      fVar4 = fdb_iterator_prev((fdb_iterator *)aStack_1660);
      paVar9 = paVar9 + -1;
      unaff_RBP._0_4_ = (int)unaff_RBP.end_seqnum - 1;
      unaff_RBP.end_seqnum._4_4_ = 0;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if (unaff_RBP._0_4_ != 0) goto LAB_00118a75;
    aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1188b8;
    fdb_iterator_close((fdb_iterator *)aStack_1660);
    unaff_R13.end_seqnum = 0;
    aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1188d1;
    fVar4 = fdb_iterator_sequence_init
                      ((fdb_kvs_handle *)aStack_1658,(fdb_iterator **)&aStack_1668,0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00118a93;
    unaff_RBP.end_seqnum = 10;
    aVar18.end_seqnum = aVar29.end_seqnum;
    do {
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1188ed;
      fVar4 = fdb_iterator_get((fdb_iterator *)aStack_1668,(fdb_doc **)&aStack_1670);
      aVar29 = aStack_1670;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00118a55;
      aVar10 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aStack_1670.end_seqnum + 0x20);
      iVar25 = (int)unaff_R13.end_seqnum;
      paVar9 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)aaStack_1640[iVar25].end_seqnum;
      unaff_R12 = paVar9[4];
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118918;
      iVar5 = bcmp((void *)aVar10,(void *)unaff_R12,*(size_t *)aStack_1670);
      if (iVar5 != 0) goto LAB_00118a4a;
      aVar10 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar29.end_seqnum + 0x38);
      unaff_R12 = paVar9[7];
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118937;
      iVar5 = bcmp((void *)aVar10,(void *)unaff_R12,
                   ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar29.end_seqnum + 8))->
                   end_seqnum);
      if (iVar5 != 0) goto LAB_00118a65;
      aVar10 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar29.end_seqnum + 0x40);
      unaff_R12 = paVar9[8];
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118956;
      iVar5 = bcmp((void *)aVar10,(void *)unaff_R12,
                   ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar29.end_seqnum + 0x10))->
                   end_seqnum);
      if (iVar5 != 0) goto LAB_00118a5a;
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118966;
      fdb_doc_free((fdb_doc *)aVar29);
      aStack_1670.end_seqnum = 0;
      uVar23 = iVar25 + 2;
      if (iVar25 == 8) {
        uVar23 = 1;
      }
      paVar9 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(ulong)uVar23;
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118989;
      fVar4 = fdb_iterator_next((fdb_iterator *)aStack_1668);
      unaff_RBP._0_4_ = (int)unaff_RBP.end_seqnum - 1;
      unaff_RBP.end_seqnum._4_4_ = 0;
      unaff_R13.end_seqnum._4_4_ = 0;
      unaff_R13.end_seqnum._0_4_ = uVar23;
      aVar18 = aVar29;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if (unaff_RBP._0_4_ == 0) {
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1189a9;
      fdb_iterator_close((fdb_iterator *)aStack_1668);
      lVar28 = 0;
      do {
        aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1189b5;
        fdb_doc_free((fdb_doc *)aaStack_1640[lVar28]);
        aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1189c2;
        fdb_doc_free((fdb_doc *)(&afStack_15d0[0].custom_cmp_param)[lVar28]);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 10);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1189d5;
      fdb_kvs_close((fdb_kvs_handle *)aStack_1658);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1189df;
      fdb_kvs_close(pfStack_1648);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1189e9;
      fdb_close(pfStack_1650);
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1189ee;
      fdb_shutdown();
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1189f3;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (reverse_sequence_iterator_kvs_test()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a24;
      fprintf(_stderr,pcVar27,"reverse sequence iterator kvs test");
      return;
    }
  }
  else {
LAB_00118a7a:
    aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a7f;
    reverse_sequence_iterator_kvs_test();
LAB_00118a7f:
    aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a84;
    reverse_sequence_iterator_kvs_test();
LAB_00118a84:
    aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a89;
    reverse_sequence_iterator_kvs_test();
LAB_00118a89:
    aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a8e;
    reverse_sequence_iterator_kvs_test();
LAB_00118a8e:
    aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a93;
    reverse_sequence_iterator_kvs_test();
LAB_00118a93:
    aStack_1688 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a98;
    reverse_sequence_iterator_kvs_test();
  }
  aStack_1688.end_seqnum = (fdb_seqnum_t)reverse_iterator_test;
  reverse_sequence_iterator_kvs_test();
  pbStack_1b60 = (btree *)0x118ac0;
  paStack_16b0 = paVar9;
  aStack_16a8 = unaff_R12;
  aStack_16a0 = unaff_R13;
  aStack_1698 = aVar29;
  aStack_1690 = aVar10;
  aStack_1688 = unaff_RBP;
  gettimeofday(&tStack_1ad0,(__timezone_ptr_t)0x0);
  pbStack_1b60 = (btree *)0x118ac5;
  memleak_start();
  auStack_1b48._0_8_ = (fdb_doc *)0x0;
  pbStack_1b60 = (btree *)0x118ad6;
  system("rm -rf  iterator_test* > errorlog.txt");
  pbStack_1b60 = (btree *)0x118ae6;
  fdb_get_default_config();
  doc_01 = afStack_1ac0;
  pbStack_1b60 = (btree *)0x118af6;
  fdb_get_default_kvs_config();
  fStack_17a8.buffercache_size = 0;
  fStack_17a8.wal_threshold = 0x400;
  fStack_17a8.flags = 1;
  fStack_17a8.compaction_threshold = '\0';
  pbVar11 = (btree *)&pfStack_1b30;
  pbStack_1b60 = (btree *)0x118b24;
  fdb_open((fdb_file_handle **)pbVar11,"./iterator_test1",&fStack_17a8);
  pfVar20 = (fdb_doc *)(auStack_1b48 + 0x10);
  pbStack_1b60 = (btree *)0x118b37;
  fdb_kvs_open_default(pfStack_1b30,(fdb_kvs_handle **)pfVar20,(fdb_kvs_config *)doc_01);
  pbStack_1b60 = (btree *)0x118b4d;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1b48._16_8_,logCallbackFunc,"reverse_iterator_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    lVar28 = 0;
    uVar16 = 0;
    do {
      pbStack_1b60 = (btree *)0x118b75;
      sprintf(acStack_18a8,"key%d",uVar16 & 0xffffffff);
      pbStack_1b60 = (btree *)0x118b8d;
      sprintf(acStack_19a8,"meta%d",uVar16 & 0xffffffff);
      pbStack_1b60 = (btree *)0x118ba5;
      sprintf((char *)&afStack_1ac0[0].size_ondisk,"body%d",uVar16 & 0xffffffff);
      pbStack_1b60 = (btree *)0x118bb5;
      sVar6 = strlen(acStack_18a8);
      pbStack_1b60 = (btree *)0x118bc8;
      sVar7 = strlen(acStack_19a8);
      pbStack_1b60 = (btree *)0x118bd8;
      sVar8 = strlen((char *)&afStack_1ac0[0].size_ondisk);
      pbStack_1b60 = (btree *)0x118bfd;
      fdb_doc_create((fdb_doc **)((long)&pfStack_1b28 + lVar28),acStack_18a8,sVar6,acStack_19a8,
                     sVar7,&afStack_1ac0[0].size_ondisk,sVar8);
      pbStack_1b60 = (btree *)0x118c0c;
      fdb_set((fdb_kvs_handle *)auStack_1b48._16_8_,*(fdb_doc **)(aaStack_1b20 + (uVar16 - 1)));
      lVar28 = lVar28 + 0x10;
      bVar33 = uVar16 < 8;
      uVar16 = uVar16 + 2;
    } while (bVar33);
    pbStack_1b60 = (btree *)0x118c30;
    fdb_commit(pfStack_1b30,'\x01');
    lVar28 = 8;
    pfVar20 = (fdb_doc *)0x1;
    do {
      pbStack_1b60 = (btree *)0x118c58;
      sprintf(acStack_18a8,"key%d",(ulong)pfVar20 & 0xffffffff);
      pbStack_1b60 = (btree *)0x118c71;
      sprintf(acStack_19a8,"meta%d",(ulong)pfVar20 & 0xffffffff);
      pbStack_1b60 = (btree *)0x118c8a;
      sprintf((char *)&afStack_1ac0[0].size_ondisk,"body%d",(ulong)pfVar20 & 0xffffffff);
      unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)((long)&pfStack_1b28 + lVar28);
      pbStack_1b60 = (btree *)0x118c9a;
      unaff_RBP.end_seqnum = strlen(acStack_18a8);
      pbStack_1b60 = (btree *)0x118cad;
      pbVar11 = (btree *)strlen(acStack_19a8);
      pbStack_1b60 = (btree *)0x118cbd;
      sVar6 = strlen((char *)&afStack_1ac0[0].size_ondisk);
      pbStack_1b60 = (btree *)0x118ce2;
      fdb_doc_create((fdb_doc **)unaff_R12,acStack_18a8,unaff_RBP.end_keylen,acStack_19a8,
                     (size_t)pbVar11,&afStack_1ac0[0].size_ondisk,sVar6);
      pbStack_1b60 = (btree *)0x118cf1;
      fdb_set((fdb_kvs_handle *)auStack_1b48._16_8_,
              *(fdb_doc **)(aaStack_1b20 + (long)((long)&pfVar20[-1].flags + 3)));
      pbVar3 = (bool *)&pfVar20->keylen;
      lVar28 = lVar28 + 0x10;
      bVar33 = pfVar20 < (fdb_doc *)0x8;
      pfVar20 = (fdb_doc *)(pbVar3 + 2);
    } while (bVar33);
    pbStack_1b60 = (btree *)0x118d12;
    fdb_commit(pfStack_1b30,'\0');
    pbStack_1b60 = (btree *)0x118d32;
    fdb_iterator_init((fdb_kvs_handle *)auStack_1b48._16_8_,(fdb_iterator **)(auStack_1b48 + 8),
                      (void *)0x0,0,(void *)0x0,0,0);
    unaff_R13.end_seqnum = 0xffffffffffffffff;
    pfVar20 = (fdb_doc *)auStack_1b48;
    pfVar19 = (fdb_doc *)(pbVar3 + 2);
    do {
      pbStack_1b60 = (btree *)0x118d4b;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1b48._8_8_,(fdb_doc **)pfVar20);
      doc_01 = (fdb_doc *)auStack_1b48._0_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00119228:
        pbStack_1b60 = (btree *)0x11922d;
        reverse_iterator_test();
        doc_01 = pfVar19;
LAB_0011922d:
        pbStack_1b60 = (btree *)0x119238;
        reverse_iterator_test();
LAB_00119238:
        pbStack_1b60 = (btree *)0x119243;
        reverse_iterator_test();
        goto LAB_00119243;
      }
      pbVar11 = *(btree **)(auStack_1b48._0_8_ + 0x20);
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                  aaStack_1b20[(long)unaff_R13].end_seqnum;
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x20);
      pbStack_1b60 = (btree *)0x118d73;
      iVar5 = bcmp(pbVar11,(void *)unaff_R12,*(size_t *)auStack_1b48._0_8_);
      pfVar19 = doc_01;
      if (iVar5 != 0) {
        pbStack_1b60 = (btree *)0x119228;
        reverse_iterator_test();
        goto LAB_00119228;
      }
      pbVar11 = *(btree **)((long)doc_01 + 0x38);
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x38);
      pbStack_1b60 = (btree *)0x118d92;
      iVar5 = bcmp(pbVar11,(void *)unaff_R12,*(size_t *)((long)doc_01 + 8));
      if (iVar5 != 0) goto LAB_00119238;
      pbVar11 = *(btree **)((long)doc_01 + 0x40);
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x40);
      pbStack_1b60 = (btree *)0x118db1;
      iVar5 = bcmp(pbVar11,(void *)unaff_R12,*(size_t *)((long)doc_01 + 0x10));
      if (iVar5 != 0) goto LAB_0011922d;
      pbStack_1b60 = (btree *)0x118dc1;
      fdb_doc_free(doc_01);
      auStack_1b48._0_8_ = (fdb_doc *)0x0;
      pbStack_1b60 = (btree *)0x118dd4;
      fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1b48._8_8_);
      unaff_R13.end_seqnum = unaff_R13.end_seqnum + 1;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if ((uint8_t *)unaff_R13.end_seqnum != (uint8_t *)0x9) goto LAB_001192ba;
    pbStack_1b60 = (btree *)0x118df4;
    fVar4 = fdb_iterator_prev((fdb_iterator *)auStack_1b48._8_8_);
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) {
      pfVar20 = doc_01;
      do {
        pbStack_1b60 = (btree *)0x118e0f;
        fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1b48._8_8_,(fdb_doc **)auStack_1b48);
        doc_01 = (fdb_doc *)auStack_1b48._0_8_;
        if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011928f;
        pbVar11 = *(btree **)(auStack_1b48._0_8_ + 0x20);
        unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                    aaStack_1b20[(long)(unaff_R13.end_seqnum - 1)].end_seqnum;
        unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x20);
        pbStack_1b60 = (btree *)0x118e37;
        iVar5 = bcmp(pbVar11,(void *)unaff_R12,*(size_t *)auStack_1b48._0_8_);
        if (iVar5 != 0) goto LAB_0011929f;
        pbVar11 = *(btree **)((long)doc_01 + 0x38);
        unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x38);
        pbStack_1b60 = (btree *)0x118e56;
        iVar5 = bcmp(pbVar11,(void *)unaff_R12,*(size_t *)((long)doc_01 + 8));
        if (iVar5 != 0) goto LAB_00119294;
        pbVar11 = *(btree **)((long)doc_01 + 0x40);
        unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x40);
        pbStack_1b60 = (btree *)0x118e75;
        iVar5 = bcmp(pbVar11,(void *)unaff_R12,*(size_t *)((long)doc_01 + 0x10));
        if (iVar5 != 0) goto LAB_001192aa;
        pbStack_1b60 = (btree *)0x118e85;
        fdb_doc_free(doc_01);
        auStack_1b48._0_8_ = (fdb_doc *)0x0;
        if ((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)unaff_R13.end_seqnum ==
            (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x5) goto LAB_00118eb5;
        unaff_R13.end_seqnum = unaff_R13.end_seqnum - 1;
        pbStack_1b60 = (btree *)0x118ea1;
        fVar4 = fdb_iterator_prev((fdb_iterator *)auStack_1b48._8_8_);
        pfVar20 = doc_01;
      } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    }
    if ((int)unaff_R13.end_seqnum != 5) {
      pbStack_1b60 = (btree *)0x118eb5;
      reverse_iterator_test();
LAB_00118eb5:
      unaff_R13.end_seqnum = 5;
    }
    pfVar20 = (fdb_doc *)auStack_1b48;
    pbStack_1b60 = (btree *)0x118ec5;
    fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1b48._8_8_);
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001192bf;
    pbStack_1b60 = (btree *)0x118edd;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1b48._8_8_,(fdb_doc **)auStack_1b48);
    pfVar19 = (fdb_doc *)auStack_1b48._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001192c4;
    unaff_RBP._0_4_ = (int)unaff_R13.end_seqnum + 1;
    unaff_RBP.end_seqnum._4_4_ = 0;
    doc_01 = *(fdb_doc **)(auStack_1b48._0_8_ + 0x20);
    unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                aaStack_1b20[(long)(unaff_RBP.end_seqnum - 1)].end_seqnum;
    pbVar11 = *(btree **)(unaff_R12.end_seqnum + 0x20);
    pbStack_1b60 = (btree *)0x118f0c;
    iVar5 = bcmp(doc_01,pbVar11,*(size_t *)auStack_1b48._0_8_);
    unaff_R13 = unaff_RBP;
    if (iVar5 != 0) goto LAB_001192c9;
    doc_01 = *(fdb_doc **)((long)pfVar19 + 0x38);
    pbVar11 = *(btree **)(unaff_R12.end_seqnum + 0x38);
    pbStack_1b60 = (btree *)0x118f2c;
    iVar5 = bcmp(doc_01,pbVar11,*(size_t *)((long)pfVar19 + 8));
    if (iVar5 != 0) goto LAB_001192d4;
    doc_01 = *(fdb_doc **)((long)pfVar19 + 0x40);
    pbVar11 = ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(unaff_R12.end_seqnum + 0x40))->
              seqtree;
    pbStack_1b60 = (btree *)0x118f4c;
    iVar5 = bcmp(doc_01,pbVar11,*(size_t *)((long)pfVar19 + 0x10));
    if (iVar5 != 0) goto LAB_001192df;
    pbStack_1b60 = (btree *)0x118f5c;
    fdb_doc_free(pfVar19);
    auStack_1b48._0_8_ = (fdb_doc *)0x0;
    pbStack_1b60 = (btree *)0x118f6f;
    fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1b48._8_8_);
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001192ea;
    pbStack_1b60 = (btree *)0x118f87;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1b48._8_8_,(fdb_doc **)auStack_1b48);
    pfVar20 = (fdb_doc *)auStack_1b48._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001192ef;
    doc_01 = *(fdb_doc **)(auStack_1b48._0_8_ + 0x20);
    pbVar11 = *(btree **)(aStack_1af0.end_seqnum + 0x20);
    pbStack_1b60 = (btree *)0x118fb0;
    iVar5 = bcmp(doc_01,pbVar11,*(size_t *)auStack_1b48._0_8_);
    unaff_R12 = aStack_1af0;
    if (iVar5 != 0) goto LAB_001192f4;
    doc_01 = *(fdb_doc **)((long)pfVar20 + 0x38);
    pbVar11 = *(btree **)(aStack_1af0.end_seqnum + 0x38);
    pbStack_1b60 = (btree *)0x118fd0;
    iVar5 = bcmp(doc_01,pbVar11,*(size_t *)((long)pfVar20 + 8));
    if (iVar5 != 0) goto LAB_001192ff;
    doc_01 = *(fdb_doc **)((long)pfVar20 + 0x40);
    pbVar11 = ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aStack_1af0.end_seqnum + 0x40))->
              seqtree;
    pbStack_1b60 = (btree *)0x118ff0;
    iVar5 = bcmp(doc_01,pbVar11,*(size_t *)((long)pfVar20 + 0x10));
    if (iVar5 != 0) goto LAB_0011930a;
    pbStack_1b60 = (btree *)0x119000;
    fdb_doc_free(pfVar20);
    auStack_1b48._0_8_ = (fdb_doc *)0x0;
    pbStack_1b60 = (btree *)0x119013;
    fVar4 = fdb_iterator_prev((fdb_iterator *)auStack_1b48._8_8_);
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) {
      pfVar20 = (fdb_doc *)auStack_1b48;
      pfVar19 = doc_01;
      do {
        pbStack_1b60 = (btree *)0x11902e;
        fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1b48._8_8_,(fdb_doc **)pfVar20);
        doc_01 = (fdb_doc *)auStack_1b48._0_8_;
        if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00119274;
        pbVar11 = *(btree **)(auStack_1b48._0_8_ + 0x20);
        unaff_R13 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                    aaStack_1b20[(long)(unaff_RBP.end_seqnum - 1)].end_seqnum;
        unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x20);
        pbStack_1b60 = (btree *)0x119056;
        iVar5 = bcmp(pbVar11,(void *)unaff_R12,*(size_t *)auStack_1b48._0_8_);
        if (iVar5 != 0) goto LAB_00119269;
        pbVar11 = *(btree **)((long)doc_01 + 0x38);
        unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x38);
        pbStack_1b60 = (btree *)0x119075;
        iVar5 = bcmp(pbVar11,(void *)unaff_R12,*(size_t *)((long)doc_01 + 8));
        if (iVar5 != 0) goto LAB_00119284;
        pbVar11 = *(btree **)((long)doc_01 + 0x40);
        unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x40);
        pbStack_1b60 = (btree *)0x119094;
        iVar5 = bcmp(pbVar11,(void *)unaff_R12,*(size_t *)((long)doc_01 + 0x10));
        if (iVar5 != 0) goto LAB_00119279;
        pbStack_1b60 = (btree *)0x1190a4;
        fdb_doc_free(doc_01);
        auStack_1b48._0_8_ = (fdb_doc *)0x0;
        unaff_RBP.end_seqnum = unaff_RBP.end_seqnum - 1;
        pbStack_1b60 = (btree *)0x1190ba;
        fVar4 = fdb_iterator_prev((fdb_iterator *)auStack_1b48._8_8_);
        pfVar19 = doc_01;
      } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
      unaff_R13.end_seqnum = unaff_RBP.end_seqnum & 0xffffffff;
    }
    if ((int)unaff_R13.end_seqnum != -1) goto LAB_00119315;
    pbStack_1b60 = (btree *)0x1190da;
    fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1b48._8_8_);
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) {
      pbStack_1b60 = (btree *)0x1190e9;
      reverse_iterator_test();
    }
    unaff_R13.end_seqnum = 0;
    pfVar20 = (fdb_doc *)auStack_1b48;
    pfVar19 = doc_01;
    do {
      pbStack_1b60 = (btree *)0x1190fe;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1b48._8_8_,(fdb_doc **)pfVar20);
      doc_01 = (fdb_doc *)auStack_1b48._0_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011924e;
      pbVar11 = *(btree **)(auStack_1b48._0_8_ + 0x20);
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                  aaStack_1b20[(long)(unaff_R13.end_seqnum - 1)].end_seqnum;
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x20);
      pbStack_1b60 = (btree *)0x119126;
      iVar5 = bcmp(pbVar11,(void *)unaff_R12,*(size_t *)auStack_1b48._0_8_);
      if (iVar5 != 0) goto LAB_00119243;
      pbVar11 = *(btree **)((long)doc_01 + 0x38);
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x38);
      pbStack_1b60 = (btree *)0x119145;
      iVar5 = bcmp(pbVar11,(void *)unaff_R12,*(size_t *)((long)doc_01 + 8));
      if (iVar5 != 0) goto LAB_0011925e;
      pbVar11 = *(btree **)((long)doc_01 + 0x40);
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x40);
      pbStack_1b60 = (btree *)0x119164;
      iVar5 = bcmp(pbVar11,(void *)unaff_R12,*(size_t *)((long)doc_01 + 0x10));
      if (iVar5 != 0) goto LAB_00119253;
      pbStack_1b60 = (btree *)0x119174;
      fdb_doc_free(doc_01);
      auStack_1b48._0_8_ = (fdb_doc *)0x0;
      unaff_R13.end_seqnum = unaff_R13.end_seqnum + 1;
      pbStack_1b60 = (btree *)0x11918a;
      fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1b48._8_8_);
      pfVar19 = doc_01;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if ((uint8_t *)unaff_R13.end_seqnum == (uint8_t *)0xa) {
      pbStack_1b60 = (btree *)0x1191a7;
      fdb_iterator_close((fdb_iterator *)auStack_1b48._8_8_);
      pbStack_1b60 = (btree *)0x1191b1;
      fdb_kvs_close((fdb_kvs_handle *)auStack_1b48._16_8_);
      pbStack_1b60 = (btree *)0x1191bb;
      fdb_close(pfStack_1b30);
      lVar28 = 0;
      do {
        pbStack_1b60 = (btree *)0x1191c7;
        fdb_doc_free(*(fdb_doc **)(aaStack_1b20 + lVar28 + -1));
        lVar28 = lVar28 + 1;
      } while (lVar28 != 10);
      pbStack_1b60 = (btree *)0x1191d5;
      fdb_shutdown();
      pbStack_1b60 = (btree *)0x1191da;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (reverse_iterator_test()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      pbStack_1b60 = (btree *)0x11920b;
      fprintf(_stderr,pcVar27,"reverse iterator test");
      return;
    }
  }
  else {
LAB_001192b5:
    pbStack_1b60 = (btree *)0x1192ba;
    reverse_iterator_test();
LAB_001192ba:
    pbStack_1b60 = (btree *)0x1192bf;
    reverse_iterator_test();
LAB_001192bf:
    pbStack_1b60 = (btree *)0x1192c4;
    reverse_iterator_test();
LAB_001192c4:
    pfVar19 = pfVar20;
    pbStack_1b60 = (btree *)0x1192c9;
    reverse_iterator_test();
LAB_001192c9:
    pbStack_1b60 = (btree *)0x1192d4;
    reverse_iterator_test();
LAB_001192d4:
    pbStack_1b60 = (btree *)0x1192df;
    reverse_iterator_test();
LAB_001192df:
    pbStack_1b60 = (btree *)0x1192ea;
    reverse_iterator_test();
LAB_001192ea:
    pbStack_1b60 = (btree *)0x1192ef;
    reverse_iterator_test();
LAB_001192ef:
    pfVar20 = pfVar19;
    pbStack_1b60 = (btree *)0x1192f4;
    reverse_iterator_test();
LAB_001192f4:
    pbStack_1b60 = (btree *)0x1192ff;
    reverse_iterator_test();
LAB_001192ff:
    pbStack_1b60 = (btree *)0x11930a;
    reverse_iterator_test();
LAB_0011930a:
    pbStack_1b60 = (btree *)0x119315;
    reverse_iterator_test();
LAB_00119315:
    pbStack_1b60 = (btree *)0x11931a;
    reverse_iterator_test();
  }
  pbStack_1b60 = (btree *)reverse_seek_to_max_nokey;
  reverse_iterator_test();
  aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119339;
  pfStack_1b78 = pfVar20;
  aStack_1b70 = unaff_R12;
  pfStack_1b68 = doc_01;
  pbStack_1b60 = pbVar11;
  gettimeofday(&tStack_1fa0,(__timezone_ptr_t)0x0);
  aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11933e;
  memleak_start();
  aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11934a;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcVar27 = (char *)&fStack_1c70;
  aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11935a;
  fdb_get_default_config();
  aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119364;
  fdb_get_default_kvs_config();
  fStack_1c70.buffercache_size = 0;
  aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119380;
  fVar4 = fdb_open(&pfStack_1fd8,"./iterator_test1",(fdb_config *)pcVar27);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11939c;
    fVar4 = fdb_kvs_open_default
                      (pfStack_1fd8,(fdb_kvs_handle **)(auStack_1ff0 + 8),
                       (fdb_kvs_config *)(auStack_1fd0 + 0x18));
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00119611;
    pcVar27 = "doc-%03d";
    doc_01 = (fdb_doc *)auStack_1fd0;
    unaff_R12.end_seqnum = 0;
    uVar16 = 0;
    do {
      aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1193c6;
      sprintf((char *)doc_01,"doc-%03d",uVar16 & 0xffffffff);
      auStack_1fd0._7_2_ = 0;
      aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1193f2;
      fdb_doc_create((fdb_doc **)((long)apfStack_1f90 + unaff_R12.end_seqnum),doc_01,10,(void *)0x0,
                     0,doc_01,10);
      aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119401;
      fdb_set((fdb_kvs_handle *)auStack_1ff0._8_8_,apfStack_1f90[uVar16]);
      uVar16 = uVar16 + 1;
      unaff_R12.end_seqnum = unaff_R12.end_seqnum + 8;
    } while (uVar16 != 100);
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11941a;
    fdb_commit(pfStack_1fd8,'\0');
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119432;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_1ff0._8_8_,logCallbackFunc,
                       "reverse_seek_to_max_nokey");
    pbVar11 = (btree *)0x64;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00119616;
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11946e;
    fVar4 = fdb_iterator_init((fdb_kvs_handle *)auStack_1ff0._8_8_,(fdb_iterator **)auStack_1ff0,
                              *(void **)(lStack_1ed0 + 0x20),10,"doc-029b",10,2);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011961b;
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119480;
    fVar4 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_1ff0._0_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00119620;
    pcVar27 = auStack_1ff0 + 0x10;
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1194a9;
    fdb_doc_create((fdb_doc **)pcVar27,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1194b6;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1ff0._0_8_,(fdb_doc **)pcVar27);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00119625;
    if (**(long **)(auStack_1ff0._16_8_ + 0x20) != 0x3932302d636f64) goto LAB_0011962a;
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1194df;
    fdb_doc_free((fdb_doc *)auStack_1ff0._16_8_);
    pcVar27 = auStack_1ff0;
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1194ec;
    fdb_iterator_close((fdb_iterator *)auStack_1ff0._0_8_);
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11951e;
    fVar4 = fdb_iterator_init((fdb_kvs_handle *)auStack_1ff0._8_8_,(fdb_iterator **)pcVar27,
                              "doc-024b",10,*(void **)(lStack_1ea0 + 0x20),10,2);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00119632;
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119530;
    fVar4 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_1ff0._0_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00119637;
    pcVar27 = auStack_1ff0 + 0x10;
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119559;
    fdb_doc_create((fdb_doc **)pcVar27,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119566;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1ff0._0_8_,(fdb_doc **)pcVar27);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011963c;
    if (**(long **)(auStack_1ff0._16_8_ + 0x20) == 0x3532302d636f64) {
      aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11958f;
      fdb_doc_free((fdb_doc *)auStack_1ff0._16_8_);
      aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119599;
      fdb_iterator_close((fdb_iterator *)auStack_1ff0._0_8_);
      aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1195a3;
      fdb_kvs_close((fdb_kvs_handle *)auStack_1ff0._8_8_);
      aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1195ad;
      fdb_close(pfStack_1fd8);
      lVar28 = 0;
      do {
        aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1195b9;
        fdb_doc_free(apfStack_1f90[lVar28]);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 100);
      aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1195c7;
      fdb_shutdown();
      aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1195cc;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (reverse_seek_to_max_nokey()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1195fd;
      fprintf(_stderr,pcVar27,"reverse seek to max non-existent key test");
      return;
    }
  }
  else {
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119611;
    reverse_seek_to_max_nokey();
LAB_00119611:
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119616;
    reverse_seek_to_max_nokey();
LAB_00119616:
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11961b;
    reverse_seek_to_max_nokey();
LAB_0011961b:
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119620;
    reverse_seek_to_max_nokey();
LAB_00119620:
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119625;
    reverse_seek_to_max_nokey();
LAB_00119625:
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11962a;
    reverse_seek_to_max_nokey();
LAB_0011962a:
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119632;
    reverse_seek_to_max_nokey();
LAB_00119632:
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119637;
    reverse_seek_to_max_nokey();
LAB_00119637:
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11963c;
    reverse_seek_to_max_nokey();
LAB_0011963c:
    aStack_2008 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119641;
    reverse_seek_to_max_nokey();
  }
  aStack_2008.end_seqnum = (fdb_seqnum_t)iterator_seek_wal_only_test;
  reverse_seek_to_max_nokey();
  aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11966c;
  pfStack_2030 = (fdb_config *)pcVar27;
  aStack_2028 = unaff_R12;
  aStack_2020 = unaff_R13;
  pfStack_2018 = doc_01;
  pbStack_2010 = pbVar11;
  aStack_2008 = unaff_RBP;
  gettimeofday((timeval *)(auStack_2450 + 0x18),(__timezone_ptr_t)0x0);
  aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119671;
  memleak_start();
  auStack_24d0._0_8_ = (fdb_kvs_handle *)0x0;
  aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119682;
  system("rm -rf  iterator_test* > errorlog.txt");
  aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119692;
  fdb_get_default_config();
  pfVar12 = (fdb_kvs_handle *)auStack_2450;
  aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1196a2;
  fdb_get_default_kvs_config();
  fStack_2128.buffercache_size = 0;
  fStack_2128.wal_threshold = 0x400;
  fStack_2128.flags = 1;
  fStack_2128.compaction_threshold = '\0';
  pfVar26 = (fdb_kvs_handle *)&pfStack_24b8;
  aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1196d0;
  fdb_open((fdb_file_handle **)pfVar26,"./iterator_test1",&fStack_2128);
  pfVar15 = (fdb_kvs_handle *)&pfStack_24c0;
  aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1196e3;
  fdb_kvs_open_default(pfStack_24b8,(fdb_kvs_handle **)pfVar15,(fdb_kvs_config *)pfVar12);
  aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1196f9;
  fVar4 = fdb_set_log_callback(pfStack_24c0,logCallbackFunc,"iterator_seek_wal_only_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11971f;
    fVar4 = fdb_kvs_open(pfStack_24b8,&pfStack_24b0,"kv1",(fdb_kvs_config *)auStack_2450);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a282;
    unaff_R12.end_seqnum = 0;
    pfVar21 = (fdb_kvs_handle *)0x0;
    do {
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119747;
      sprintf((char *)&fStack_2428,"kEy%d",(ulong)pfVar21 & 0xffffffff);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11975f;
      sprintf((char *)&fStack_2428.bub_ctx.handle,"mEta%d",(ulong)pfVar21 & 0xffffffff);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119777;
      sprintf((char *)&fStack_2428.config.encryption_key,"bOdy%d",(ulong)pfVar21 & 0xffffffff);
      pfVar26 = (fdb_kvs_handle *)((long)aaStack_24a8 + unaff_R12.end_seqnum);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119787;
      unaff_R13.end_seqnum = strlen((char *)&fStack_2428);
      unaff_RBP.end_seqnum = (fdb_seqnum_t)&fStack_2428.bub_ctx.handle;
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11979a;
      pfVar12 = (fdb_kvs_handle *)strlen((char *)unaff_RBP);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1197aa;
      sVar6 = strlen((char *)&fStack_2428.config.encryption_key);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1197cf;
      fdb_doc_create((fdb_doc **)pfVar26,&fStack_2428,unaff_R13.end_keylen,(void *)unaff_RBP,
                     (size_t)pfVar12,&fStack_2428.config.encryption_key,sVar6);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1197de;
      fVar4 = fdb_set(pfStack_24b0,(fdb_doc *)aaStack_24a8[(long)pfVar21]);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a231;
        iterator_seek_wal_only_test();
        goto LAB_0011a231;
      }
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1197f0;
      fdb_doc_free((fdb_doc *)aaStack_24a8[(long)pfVar21]);
      pfVar21 = (fdb_kvs_handle *)&(pfVar21->kvs_config).field_0x1;
      unaff_R12.end_seqnum = unaff_R12.end_seqnum + 8;
    } while (pfVar21 != (fdb_kvs_handle *)0xa);
    unaff_R12.end_seqnum = 0;
    uVar16 = 0;
    do {
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119821;
      sprintf((char *)&fStack_2428,"key%d",uVar16 & 0xffffffff);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119839;
      sprintf((char *)&fStack_2428.bub_ctx.handle,"meta%d",uVar16 & 0xffffffff);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119851;
      sprintf((char *)&fStack_2428.config.encryption_key,"body%d",uVar16 & 0xffffffff);
      pfVar26 = (fdb_kvs_handle *)((long)aaStack_24a8 + unaff_R12.end_seqnum);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119861;
      unaff_R13.end_seqnum = strlen((char *)&fStack_2428);
      unaff_RBP.end_seqnum = (fdb_seqnum_t)&fStack_2428.bub_ctx.handle;
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119874;
      pfVar12 = (fdb_kvs_handle *)strlen((char *)unaff_RBP);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119884;
      sVar6 = strlen((char *)&fStack_2428.config.encryption_key);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1198a9;
      fdb_doc_create((fdb_doc **)pfVar26,&fStack_2428,unaff_R13.end_keylen,(void *)unaff_RBP,
                     (size_t)pfVar12,&fStack_2428.config.encryption_key,sVar6);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1198b8;
      fdb_set(pfStack_24c0,(fdb_doc *)aaStack_24a8[uVar16]);
      uVar16 = uVar16 + 1;
      unaff_R12.end_seqnum = unaff_R12.end_seqnum + 8;
    } while (uVar16 != 10);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1198d5;
    fdb_commit(pfStack_24b8,'\0');
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1198f8;
    fdb_iterator_init(pfStack_24c0,(fdb_iterator **)(auStack_24d0 + 8),(void *)0x0,0,(void *)0x0,0,0
                     );
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119905;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_24d0._8_8_,(fdb_doc **)auStack_24d0);
    aVar29 = aaStack_24a8[0];
    pfVar21 = (fdb_kvs_handle *)auStack_24d0._0_8_;
    pfVar15 = (fdb_kvs_handle *)(auStack_24d0 + 8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a287;
    pfVar12 = *(fdb_kvs_handle **)(auStack_24d0._0_8_ + 0x20);
    pfVar26 = *(fdb_kvs_handle **)(aaStack_24a8[0].end_seqnum + 0x20);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11992e;
    iVar5 = bcmp(pfVar12,pfVar26,*(size_t *)(fdb_kvs_config *)auStack_24d0._0_8_);
    if (iVar5 != 0) goto LAB_0011a28c;
    pfVar12 = *(fdb_kvs_handle **)((long)pfVar21 + 0x38);
    pfVar26 = *(fdb_kvs_handle **)(aVar29.end_seqnum + 0x38);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11994e;
    iVar5 = bcmp(pfVar12,pfVar26,(size_t)(pfVar21->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0011a297;
    pfVar12 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar21 + 0x40))->seqtree;
    pfVar26 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aVar29.end_seqnum + 0x40))->seqtree
    ;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11996e;
    iVar5 = bcmp(pfVar12,pfVar26,(size_t)(pfVar21->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0011a2a2;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11997e;
    fdb_doc_free((fdb_doc *)pfVar21);
    pfVar21 = (fdb_kvs_handle *)auStack_24d0._8_8_;
    auStack_24d0._0_8_ = (fdb_kvs_handle *)0x0;
    pfVar12 = *(fdb_kvs_handle **)(aaStack_24a8[2].end_seqnum + 0x20);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1199a2;
    sVar6 = strlen((char *)&fStack_2428);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1199b2;
    fVar4 = fdb_iterator_seek((fdb_iterator *)pfVar21,pfVar12,sVar6,'\0');
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a2ad;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1199ca;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_24d0._8_8_,(fdb_doc **)auStack_24d0);
    aVar10 = aaStack_24a8[2];
    pfVar15 = (fdb_kvs_handle *)auStack_24d0._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a2b2;
    pfVar12 = *(fdb_kvs_handle **)(auStack_24d0._0_8_ + 0x20);
    pfVar26 = *(fdb_kvs_handle **)(aaStack_24a8[2].end_seqnum + 0x20);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1199f3;
    iVar5 = bcmp(pfVar12,pfVar26,*(size_t *)(fdb_kvs_config *)auStack_24d0._0_8_);
    if (iVar5 != 0) goto LAB_0011a2b7;
    pfVar12 = *(fdb_kvs_handle **)((long)pfVar15 + 0x38);
    pfVar26 = *(fdb_kvs_handle **)(aVar10.end_seqnum + 0x38);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119a13;
    iVar5 = bcmp(pfVar12,pfVar26,(size_t)(pfVar15->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0011a2c2;
    pfVar12 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar15 + 0x40))->seqtree;
    pfVar26 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aVar10.end_seqnum + 0x40))->seqtree
    ;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119a33;
    iVar5 = bcmp(pfVar12,pfVar26,(size_t)(pfVar15->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0011a2cd;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119a43;
    fdb_doc_free((fdb_doc *)pfVar15);
    auStack_24d0._0_8_ = (fdb_kvs_handle *)0x0;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119a56;
    fVar4 = fdb_iterator_next((fdb_iterator *)auStack_24d0._8_8_);
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a2d8;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119a6e;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_24d0._8_8_,(fdb_doc **)auStack_24d0);
    aVar29 = aaStack_24a8[3];
    pfVar21 = (fdb_kvs_handle *)auStack_24d0._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a2dd;
    pfVar12 = *(fdb_kvs_handle **)(auStack_24d0._0_8_ + 0x20);
    pfVar26 = *(fdb_kvs_handle **)(aaStack_24a8[3].end_seqnum + 0x20);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119a97;
    iVar5 = bcmp(pfVar12,pfVar26,*(size_t *)(fdb_kvs_config *)auStack_24d0._0_8_);
    if (iVar5 != 0) goto LAB_0011a2e2;
    pfVar12 = *(fdb_kvs_handle **)((long)pfVar21 + 0x38);
    pfVar26 = *(fdb_kvs_handle **)(aVar29.end_seqnum + 0x38);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119ab7;
    iVar5 = bcmp(pfVar12,pfVar26,(size_t)(pfVar21->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0011a2ed;
    pfVar12 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar21 + 0x40))->seqtree;
    pfVar26 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aVar29.end_seqnum + 0x40))->seqtree
    ;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119ad7;
    iVar5 = bcmp(pfVar12,pfVar26,(size_t)(pfVar21->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0011a2f8;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119ae7;
    fdb_doc_free((fdb_doc *)pfVar21);
    pfVar21 = (fdb_kvs_handle *)auStack_24d0._8_8_;
    auStack_24d0._0_8_ = (fdb_kvs_handle *)0x0;
    pfVar12 = *(fdb_kvs_handle **)(aaStack_24a8[9].end_seqnum + 0x20);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119b0b;
    sVar6 = strlen((char *)&fStack_2428);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119b1b;
    fVar4 = fdb_iterator_seek((fdb_iterator *)pfVar21,pfVar12,sVar6,'\0');
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a303;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119b33;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_24d0._8_8_,(fdb_doc **)auStack_24d0);
    aVar10 = aaStack_24a8[9];
    pfVar15 = (fdb_kvs_handle *)auStack_24d0._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a308;
    pfVar12 = *(fdb_kvs_handle **)(auStack_24d0._0_8_ + 0x20);
    pfVar26 = *(fdb_kvs_handle **)(aaStack_24a8[9].end_seqnum + 0x20);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119b5c;
    iVar5 = bcmp(pfVar12,pfVar26,*(size_t *)(fdb_kvs_config *)auStack_24d0._0_8_);
    if (iVar5 != 0) goto LAB_0011a30d;
    pfVar12 = *(fdb_kvs_handle **)((long)pfVar15 + 0x38);
    pfVar26 = *(fdb_kvs_handle **)(aVar10.end_seqnum + 0x38);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119b7c;
    iVar5 = bcmp(pfVar12,pfVar26,(size_t)(pfVar15->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0011a318;
    pfVar12 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar15 + 0x40))->seqtree;
    pfVar26 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aVar10.end_seqnum + 0x40))->seqtree
    ;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119b9c;
    iVar5 = bcmp(pfVar12,pfVar26,(size_t)(pfVar15->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0011a323;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119bac;
    fdb_doc_free((fdb_doc *)pfVar15);
    pfVar15 = (fdb_kvs_handle *)auStack_24d0._8_8_;
    auStack_24d0._0_8_ = (fdb_kvs_handle *)0x0;
    pfVar12 = *(fdb_kvs_handle **)(aaStack_24a8[0].end_seqnum + 0x20);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119bd0;
    sVar6 = strlen((char *)&fStack_2428);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119be0;
    fVar4 = fdb_iterator_seek((fdb_iterator *)pfVar15,pfVar12,sVar6,'\0');
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a32e;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119bf8;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_24d0._8_8_,(fdb_doc **)auStack_24d0);
    unaff_R12 = aaStack_24a8[0];
    pfVar21 = (fdb_kvs_handle *)auStack_24d0._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a333;
    pfVar12 = *(fdb_kvs_handle **)(auStack_24d0._0_8_ + 0x20);
    pfVar26 = *(fdb_kvs_handle **)(aaStack_24a8[0].end_seqnum + 0x20);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119c21;
    iVar5 = bcmp(pfVar12,pfVar26,*(size_t *)(fdb_kvs_config *)auStack_24d0._0_8_);
    if (iVar5 != 0) goto LAB_0011a338;
    pfVar12 = *(fdb_kvs_handle **)((long)pfVar21 + 0x38);
    pfVar26 = *(fdb_kvs_handle **)(unaff_R12.end_seqnum + 0x38);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119c41;
    iVar5 = bcmp(pfVar12,pfVar26,(size_t)(pfVar21->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0011a343;
    pfVar12 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar21 + 0x40))->seqtree;
    pfVar26 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(unaff_R12.end_seqnum + 0x40))->
              seqtree;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119c61;
    iVar5 = bcmp(pfVar12,pfVar26,(size_t)(pfVar21->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0011a34e;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119c71;
    fdb_doc_free((fdb_doc *)pfVar21);
    pfVar21 = (fdb_kvs_handle *)auStack_24d0._8_8_;
    auStack_24d0._0_8_ = (fdb_kvs_handle *)0x0;
    pfVar12 = *(fdb_kvs_handle **)(aaStack_24a8[2].end_seqnum + 0x20);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119c95;
    sVar6 = strlen((char *)&fStack_2428);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119ca5;
    fVar4 = fdb_iterator_seek((fdb_iterator *)pfVar21,pfVar12,sVar6,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a359;
    unaff_R13.end_seqnum = 2;
    pfVar21 = (fdb_kvs_handle *)auStack_24d0;
    pfVar30 = pfVar12;
    do {
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119cc5;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_24d0._8_8_,(fdb_doc **)pfVar21);
      pfVar12 = (fdb_kvs_handle *)auStack_24d0._0_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a23c;
      pfVar26 = *(fdb_kvs_handle **)(auStack_24d0._0_8_ + 0x20);
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                  aaStack_24a8[unaff_R13.end_seqnum].end_seqnum;
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x20);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119ced;
      iVar5 = bcmp(pfVar26,(void *)unaff_R12,*(size_t *)(fdb_kvs_config *)auStack_24d0._0_8_);
      if (iVar5 != 0) goto LAB_0011a231;
      pfVar26 = *(fdb_kvs_handle **)((long)pfVar12 + 0x38);
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x38);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119d0c;
      iVar5 = bcmp(pfVar26,(void *)unaff_R12,(size_t)(pfVar12->kvs_config).custom_cmp);
      pfVar15 = pfVar21;
      if (iVar5 != 0) goto LAB_0011a24c;
      pfVar26 = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar12 + 0x40))->seqtree;
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x40);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119d2b;
      iVar5 = bcmp(pfVar26,(void *)unaff_R12,(size_t)(pfVar12->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_0011a241;
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119d3b;
      fdb_doc_free((fdb_doc *)pfVar12);
      auStack_24d0._0_8_ = (fdb_kvs_handle *)0x0;
      unaff_R13.end_seqnum = unaff_R13.end_seqnum + 1;
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119d51;
      fVar4 = fdb_iterator_next((fdb_iterator *)auStack_24d0._8_8_);
      pfVar15 = (fdb_kvs_handle *)auStack_24d0._8_8_;
      pfVar30 = pfVar12;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if ((uint8_t *)unaff_R13.end_seqnum != (uint8_t *)0xa) goto LAB_0011a35e;
    pfVar12 = *(fdb_kvs_handle **)(aaStack_24a8[3].end_seqnum + 0x20);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119d7f;
    sVar6 = strlen((char *)&fStack_2428);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119d8f;
    fVar4 = fdb_iterator_seek((fdb_iterator *)pfVar15,pfVar12,sVar6,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a363;
    unaff_R13.end_seqnum = 3;
    pfVar15 = (fdb_kvs_handle *)auStack_24d0;
    pfVar21 = pfVar12;
    do {
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119daf;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_24d0._8_8_,(fdb_doc **)pfVar15);
      pfVar12 = (fdb_kvs_handle *)auStack_24d0._0_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a262;
      pfVar26 = *(fdb_kvs_handle **)(auStack_24d0._0_8_ + 0x20);
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                  aaStack_24a8[unaff_R13.end_seqnum].end_seqnum;
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x20);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119dd7;
      iVar5 = bcmp(pfVar26,(void *)unaff_R12,*(size_t *)(fdb_kvs_config *)auStack_24d0._0_8_);
      if (iVar5 != 0) goto LAB_0011a257;
      pfVar26 = *(fdb_kvs_handle **)((long)pfVar12 + 0x38);
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x38);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119df6;
      iVar5 = bcmp(pfVar26,(void *)unaff_R12,(size_t)(pfVar12->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_0011a272;
      pfVar26 = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar12 + 0x40))->seqtree;
      unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x40);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119e15;
      iVar5 = bcmp(pfVar26,(void *)unaff_R12,(size_t)(pfVar12->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_0011a267;
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119e25;
      fdb_doc_free((fdb_doc *)pfVar12);
      auStack_24d0._0_8_ = (fdb_kvs_handle *)0x0;
      unaff_R13.end_seqnum = unaff_R13.end_seqnum + 1;
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119e3b;
      fVar4 = fdb_iterator_next((fdb_iterator *)auStack_24d0._8_8_);
      pfVar21 = pfVar12;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if ((uint8_t *)unaff_R13.end_seqnum != (uint8_t *)0xa) goto LAB_0011a368;
    pfVar15 = (fdb_kvs_handle *)(auStack_24d0 + 8);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119e5b;
    fdb_iterator_close((fdb_iterator *)auStack_24d0._8_8_);
    pfVar12 = &fStack_2428;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119e7c;
    sprintf((char *)pfVar12,"key%d",4);
    unaff_R12.end_seqnum = (fdb_seqnum_t)&fStack_2428.bub_ctx.handle;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119e96;
    sprintf((char *)unaff_R12,"key%d",8);
    pfVar26 = pfStack_24c0;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119ea3;
    unaff_R13.end_seqnum = strlen((char *)pfVar12);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119eae;
    sVar6 = strlen((char *)unaff_R12);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119ecc;
    fVar4 = fdb_iterator_init(pfVar26,(fdb_iterator **)pfVar15,pfVar12,unaff_R13.end_keylen,
                              (void *)unaff_R12,sVar6,2);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a36d;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119ede;
    fVar4 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_24d0._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a372;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119ef5;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_24d0._8_8_,(fdb_doc **)auStack_24d0);
    pfVar21 = (fdb_kvs_handle *)auStack_24d0._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a377;
    pfVar12 = *(fdb_kvs_handle **)(auStack_24d0._0_8_ + 0x20);
    pfVar26 = *(fdb_kvs_handle **)(aaStack_24a8[8].end_seqnum + 0x20);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119f1e;
    iVar5 = bcmp(pfVar12,pfVar26,*(size_t *)(fdb_kvs_config *)auStack_24d0._0_8_);
    unaff_R12 = aaStack_24a8[8];
    if (iVar5 != 0) goto LAB_0011a37c;
    pfVar12 = *(fdb_kvs_handle **)((long)pfVar21 + 0x38);
    pfVar26 = *(fdb_kvs_handle **)(aaStack_24a8[8].end_seqnum + 0x38);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119f3e;
    iVar5 = bcmp(pfVar12,pfVar26,(size_t)(pfVar21->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0011a387;
    pfVar12 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar21 + 0x40))->seqtree;
    pfVar26 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aaStack_24a8[8].end_seqnum + 0x40))
              ->seqtree;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119f5e;
    iVar5 = bcmp(pfVar12,pfVar26,(size_t)(pfVar21->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0011a392;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119f6e;
    fdb_doc_free((fdb_doc *)pfVar21);
    auStack_24d0._0_8_ = (fdb_kvs_handle *)0x0;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119f81;
    fVar4 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_24d0._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a39d;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119f98;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_24d0._8_8_,(fdb_doc **)auStack_24d0);
    pfVar15 = (fdb_kvs_handle *)auStack_24d0._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a3a2;
    pfVar12 = *(fdb_kvs_handle **)(auStack_24d0._0_8_ + 0x20);
    pfVar26 = *(fdb_kvs_handle **)(aaStack_24a8[4].end_seqnum + 0x20);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119fc1;
    iVar5 = bcmp(pfVar12,pfVar26,*(size_t *)(fdb_kvs_config *)auStack_24d0._0_8_);
    unaff_R12 = aaStack_24a8[4];
    if (iVar5 != 0) goto LAB_0011a3a7;
    pfVar12 = *(fdb_kvs_handle **)((long)pfVar15 + 0x38);
    pfVar26 = *(fdb_kvs_handle **)(aaStack_24a8[4].end_seqnum + 0x38);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119fe1;
    iVar5 = bcmp(pfVar12,pfVar26,(size_t)(pfVar15->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0011a3b2;
    pfVar12 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar15 + 0x40))->seqtree;
    pfVar26 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aaStack_24a8[4].end_seqnum + 0x40))
              ->seqtree;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a001;
    iVar5 = bcmp(pfVar12,pfVar26,(size_t)(pfVar15->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0011a3bd;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a011;
    fdb_doc_free((fdb_doc *)pfVar15);
    auStack_24d0._0_8_ = (fdb_kvs_handle *)0x0;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a024;
    fVar4 = fdb_iterator_close((fdb_iterator *)auStack_24d0._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a3c8;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a04c;
    fVar4 = fdb_iterator_init(pfStack_24c0,(fdb_iterator **)(auStack_24d0 + 8),(void *)0x0,0,
                              (void *)0x0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a3cd;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a05e;
    fVar4 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_24d0._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a3d2;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a075;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_24d0._8_8_,(fdb_doc **)auStack_24d0);
    pfVar21 = (fdb_kvs_handle *)auStack_24d0._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a3d7;
    pfVar12 = *(fdb_kvs_handle **)(auStack_24d0._0_8_ + 0x20);
    pfVar26 = *(fdb_kvs_handle **)(aaStack_24a8[9].end_seqnum + 0x20);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a09e;
    iVar5 = bcmp(pfVar12,pfVar26,*(size_t *)(fdb_kvs_config *)auStack_24d0._0_8_);
    unaff_R12 = aaStack_24a8[9];
    if (iVar5 != 0) goto LAB_0011a3dc;
    pfVar12 = *(fdb_kvs_handle **)((long)pfVar21 + 0x38);
    pfVar26 = *(fdb_kvs_handle **)(aaStack_24a8[9].end_seqnum + 0x38);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a0be;
    iVar5 = bcmp(pfVar12,pfVar26,(size_t)(pfVar21->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0011a3e7;
    pfVar12 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar21 + 0x40))->seqtree;
    pfVar26 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aaStack_24a8[9].end_seqnum + 0x40))
              ->seqtree;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a0de;
    iVar5 = bcmp(pfVar12,pfVar26,(size_t)(pfVar21->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0011a3f2;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a0ee;
    fdb_doc_free((fdb_doc *)pfVar21);
    auStack_24d0._0_8_ = (fdb_kvs_handle *)0x0;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a101;
    fVar4 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_24d0._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a3fd;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a118;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_24d0._8_8_,(fdb_doc **)auStack_24d0);
    pfVar15 = (fdb_kvs_handle *)auStack_24d0._0_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a402;
    pfVar12 = *(fdb_kvs_handle **)(auStack_24d0._0_8_ + 0x20);
    pfVar26 = *(fdb_kvs_handle **)(aaStack_24a8[0].end_seqnum + 0x20);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a141;
    iVar5 = bcmp(pfVar12,pfVar26,*(size_t *)(fdb_kvs_config *)auStack_24d0._0_8_);
    unaff_R12 = aaStack_24a8[0];
    if (iVar5 != 0) goto LAB_0011a407;
    pfVar12 = *(fdb_kvs_handle **)((long)pfVar15 + 0x38);
    pfVar26 = *(fdb_kvs_handle **)(aaStack_24a8[0].end_seqnum + 0x38);
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a161;
    iVar5 = bcmp(pfVar12,pfVar26,(size_t)(pfVar15->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0011a412;
    pfVar12 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar15 + 0x40))->seqtree;
    pfVar26 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aaStack_24a8[0].end_seqnum + 0x40))
              ->seqtree;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a181;
    iVar5 = bcmp(pfVar12,pfVar26,(size_t)(pfVar15->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0011a41d;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a191;
    fdb_doc_free((fdb_doc *)pfVar15);
    auStack_24d0._0_8_ = (fdb_kvs_handle *)0x0;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a1a4;
    fVar4 = fdb_iterator_close((fdb_iterator *)auStack_24d0._8_8_);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a1b6;
      fdb_kvs_close(pfStack_24b0);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a1c0;
      fdb_kvs_close(pfStack_24c0);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a1ca;
      fdb_close(pfStack_24b8);
      lVar28 = 0;
      do {
        aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a1d6;
        fdb_doc_free((fdb_doc *)aaStack_24a8[lVar28]);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 10);
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a1e4;
      fdb_shutdown();
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a1e9;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (iterator_seek_wal_only_test()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a21a;
      fprintf(_stderr,pcVar27,"iterator seek wal only test");
      return;
    }
  }
  else {
LAB_0011a27d:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a282;
    iterator_seek_wal_only_test();
LAB_0011a282:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a287;
    iterator_seek_wal_only_test();
LAB_0011a287:
    aVar29 = unaff_R12;
    pfVar21 = pfVar15;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a28c;
    iterator_seek_wal_only_test();
LAB_0011a28c:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a297;
    iterator_seek_wal_only_test();
LAB_0011a297:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a2a2;
    iterator_seek_wal_only_test();
LAB_0011a2a2:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a2ad;
    iterator_seek_wal_only_test();
LAB_0011a2ad:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a2b2;
    iterator_seek_wal_only_test();
LAB_0011a2b2:
    aVar10 = aVar29;
    pfVar15 = pfVar21;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a2b7;
    iterator_seek_wal_only_test();
LAB_0011a2b7:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a2c2;
    iterator_seek_wal_only_test();
LAB_0011a2c2:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a2cd;
    iterator_seek_wal_only_test();
LAB_0011a2cd:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a2d8;
    iterator_seek_wal_only_test();
LAB_0011a2d8:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a2dd;
    iterator_seek_wal_only_test();
LAB_0011a2dd:
    aVar29 = aVar10;
    pfVar21 = pfVar15;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a2e2;
    iterator_seek_wal_only_test();
LAB_0011a2e2:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a2ed;
    iterator_seek_wal_only_test();
LAB_0011a2ed:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a2f8;
    iterator_seek_wal_only_test();
LAB_0011a2f8:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a303;
    iterator_seek_wal_only_test();
LAB_0011a303:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a308;
    iterator_seek_wal_only_test();
LAB_0011a308:
    aVar10 = aVar29;
    pfVar15 = pfVar21;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a30d;
    iterator_seek_wal_only_test();
LAB_0011a30d:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a318;
    iterator_seek_wal_only_test();
LAB_0011a318:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a323;
    iterator_seek_wal_only_test();
LAB_0011a323:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a32e;
    iterator_seek_wal_only_test();
LAB_0011a32e:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a333;
    iterator_seek_wal_only_test();
LAB_0011a333:
    unaff_R12 = aVar10;
    pfVar21 = pfVar15;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a338;
    iterator_seek_wal_only_test();
LAB_0011a338:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a343;
    iterator_seek_wal_only_test();
LAB_0011a343:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a34e;
    iterator_seek_wal_only_test();
LAB_0011a34e:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a359;
    iterator_seek_wal_only_test();
LAB_0011a359:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a35e;
    iterator_seek_wal_only_test();
LAB_0011a35e:
    pfVar15 = pfVar21;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a363;
    iterator_seek_wal_only_test();
LAB_0011a363:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a368;
    iterator_seek_wal_only_test();
LAB_0011a368:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a36d;
    iterator_seek_wal_only_test();
LAB_0011a36d:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a372;
    iterator_seek_wal_only_test();
LAB_0011a372:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a377;
    iterator_seek_wal_only_test();
LAB_0011a377:
    pfVar21 = pfVar15;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a37c;
    iterator_seek_wal_only_test();
LAB_0011a37c:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a387;
    iterator_seek_wal_only_test();
LAB_0011a387:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a392;
    iterator_seek_wal_only_test();
LAB_0011a392:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a39d;
    iterator_seek_wal_only_test();
LAB_0011a39d:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3a2;
    iterator_seek_wal_only_test();
LAB_0011a3a2:
    pfVar15 = pfVar21;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3a7;
    iterator_seek_wal_only_test();
LAB_0011a3a7:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3b2;
    iterator_seek_wal_only_test();
LAB_0011a3b2:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3bd;
    iterator_seek_wal_only_test();
LAB_0011a3bd:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3c8;
    iterator_seek_wal_only_test();
LAB_0011a3c8:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3cd;
    iterator_seek_wal_only_test();
LAB_0011a3cd:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3d2;
    iterator_seek_wal_only_test();
LAB_0011a3d2:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3d7;
    iterator_seek_wal_only_test();
LAB_0011a3d7:
    pfVar21 = pfVar15;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3dc;
    iterator_seek_wal_only_test();
LAB_0011a3dc:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3e7;
    iterator_seek_wal_only_test();
LAB_0011a3e7:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3f2;
    iterator_seek_wal_only_test();
LAB_0011a3f2:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3fd;
    iterator_seek_wal_only_test();
LAB_0011a3fd:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a402;
    iterator_seek_wal_only_test();
LAB_0011a402:
    pfVar15 = pfVar21;
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a407;
    iterator_seek_wal_only_test();
LAB_0011a407:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a412;
    iterator_seek_wal_only_test();
LAB_0011a412:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a41d;
    iterator_seek_wal_only_test();
LAB_0011a41d:
    aStack_24e0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a428;
    iterator_seek_wal_only_test();
  }
  aStack_24e0.end_seqnum = (fdb_seqnum_t)iterator_after_wal_threshold;
  iterator_seek_wal_only_test();
  pcStack_2868 = (code *)0x11a44a;
  pfStack_2508 = pfVar15;
  aStack_2500 = unaff_R12;
  aStack_24f8 = unaff_R13;
  pfStack_24f0 = pfVar12;
  pfStack_24e8 = pfVar26;
  aStack_24e0 = unaff_RBP;
  gettimeofday(&tStack_2830,(__timezone_ptr_t)0x0);
  pcStack_2868 = (code *)0x11a44f;
  memleak_start();
  pfStack_2858 = (fdb_iterator *)0x0;
  pcStack_2868 = (code *)0x11a465;
  fdb_get_default_config();
  pcStack_2868 = (code *)0x11a472;
  fdb_get_default_kvs_config();
  fStack_2808.wal_threshold = 10;
  fStack_2808.flags = 1;
  fStack_2808.seqtree_opt = '\x01';
  pcStack_2868 = (code *)0x11a493;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcStack_2868 = (code *)0x11a4aa;
  fdb_open(&pfStack_2838,"./iterator_test1",&fStack_2808);
  pcStack_2868 = (code *)0x11a4c1;
  fdb_kvs_open(pfStack_2838,&pfStack_2848,"db1",&fStack_2820);
  pcStack_2868 = (code *)0x11a4d8;
  fdb_kvs_open(pfStack_2838,&pfStack_2840,"db2",&fStack_2820);
  uVar16 = 0;
  do {
    pcStack_2868 = (code *)0x11a504;
    sprintf(acStack_2610,"key%d",uVar16);
    pcStack_2868 = (code *)0x11a513;
    sprintf(acStack_2710,"body%d",uVar16);
    pfVar26 = pfStack_2848;
    pcStack_2868 = (code *)0x11a520;
    ppfVar13 = (fdb_iterator **)strlen(acStack_2610);
    pcStack_2868 = (code *)0x11a52b;
    sVar6 = strlen(acStack_2710);
    pcStack_2868 = (code *)0x11a53f;
    fdb_set_kv(pfVar26,acStack_2610,(size_t)ppfVar13,acStack_2710,sVar6);
    uVar23 = (int)uVar16 + 1;
    uVar16 = (ulong)uVar23;
  } while (uVar23 != 6);
  pcStack_2868 = (code *)0x11a55c;
  fVar4 = fdb_iterator_sequence_init(pfStack_2848,&pfStack_2850,0,0,0);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    do {
      pcStack_2868 = (code *)0x11a576;
      fVar4 = fdb_iterator_get(pfStack_2850,(fdb_doc **)&pfStack_2858);
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0011a6b9:
        pcStack_2868 = (code *)0x11a6be;
        iterator_after_wal_threshold();
        goto LAB_0011a6be;
      }
      pcStack_2868 = (code *)0x11a599;
      fVar4 = fdb_set_kv(pfStack_2840,(void *)pfStack_2858->_seqnum,(size_t)pfStack_2858->handle,
                         (void *)0x0,0);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pcStack_2868 = (code *)0x11a6b9;
        iterator_after_wal_threshold();
        goto LAB_0011a6b9;
      }
      pcStack_2868 = (code *)0x11a5ab;
      fdb_doc_free((fdb_doc *)pfStack_2858);
      pfStack_2858 = (fdb_iterator *)0x0;
      pcStack_2868 = (code *)0x11a5be;
      fVar4 = fdb_iterator_next(pfStack_2850);
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    ppfVar13 = &pfStack_2850;
    pcStack_2868 = (code *)0x11a5d0;
    fdb_iterator_close(pfStack_2850);
    pcStack_2868 = (code *)0x11a5e4;
    fVar4 = fdb_iterator_sequence_init(pfStack_2848,ppfVar13,0,0,0);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      while( true ) {
        pcStack_2868 = (code *)0x11a5fe;
        fVar4 = fdb_iterator_get(pfStack_2850,(fdb_doc **)&pfStack_2858);
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        pcStack_2868 = (code *)0x11a615;
        fVar4 = fdb_get(pfStack_2848,(fdb_doc *)pfStack_2858);
        if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011a6be;
        pcStack_2868 = (code *)0x11a627;
        fdb_doc_free((fdb_doc *)pfStack_2858);
        pfStack_2858 = (fdb_iterator *)0x0;
        pcStack_2868 = (code *)0x11a63a;
        fVar4 = fdb_iterator_next(pfStack_2850);
        if (fVar4 == FDB_RESULT_ITERATOR_FAIL) {
          pcStack_2868 = (code *)0x11a649;
          fdb_iterator_close(pfStack_2850);
          pcStack_2868 = (code *)0x11a653;
          fdb_kvs_close(pfStack_2848);
          pcStack_2868 = (code *)0x11a65d;
          fdb_kvs_close(pfStack_2840);
          pcStack_2868 = (code *)0x11a667;
          fdb_close(pfStack_2838);
          pcStack_2868 = (code *)0x11a66c;
          fdb_shutdown();
          pcStack_2868 = (code *)0x11a671;
          memleak_end();
          pcVar27 = "%s PASSED\n";
          if (iterator_after_wal_threshold()::__test_pass != '\0') {
            pcVar27 = "%s FAILED\n";
          }
          pcStack_2868 = (code *)0x11a6a2;
          fprintf(_stderr,pcVar27,"iterator after wal threshold");
          return;
        }
      }
LAB_0011a6c3:
      ppfVar13 = &pfStack_2858;
      pcStack_2868 = (code *)0x11a6c8;
      iterator_after_wal_threshold();
      goto LAB_0011a6c8;
    }
  }
  else {
LAB_0011a6c8:
    pcStack_2868 = (code *)0x11a6cd;
    iterator_after_wal_threshold();
  }
  pcStack_2868 = iterator_manual_wal_flush;
  iterator_after_wal_threshold();
  pcStack_2870 = "body%d";
  pfStack_2880 = pfVar26;
  pfStack_2a30 = (fdb_kvs_handle *)0x11a6ef;
  ppfStack_2890 = ppfVar13;
  pcStack_2888 = acStack_2710;
  pcStack_2878 = acStack_2610;
  pcStack_2868 = (code *)uVar16;
  gettimeofday(&tStack_29b0,(__timezone_ptr_t)0x0);
  pfStack_2a30 = (fdb_kvs_handle *)0x11a6f4;
  memleak_start();
  uStack_29d0 = 0x3106002d;
  uStack_29d8 = 0x3032343e3e0508;
  uStack_29d1 = 0x31;
  uStack_29c8._0_2_ = 0x508;
  uStack_29c8._2_6_ = 0x313032343e3e;
  pvStack_29c0 = (void *)0x323106002d31;
  uStack_29b8 = 0;
  ptr_iterator = (fdb_kvs_handle **)auStack_29e8;
  auStack_29e8._0_7_ = 0x3931343e3e0508;
  auStack_29e8._7_4_ = 0x2d3939;
  uStack_2a08 = 0x3433343e3e0508;
  uStack_2a01 = 0x140a35;
  pfStack_2a18 = (fdb_kvs_handle *)0x0;
  pfStack_2a30 = (fdb_kvs_handle *)0x11a772;
  fdb_get_default_config();
  pfVar26 = (fdb_kvs_handle *)auStack_29a0;
  pfStack_2a30 = (fdb_kvs_handle *)0x11a782;
  fdb_get_default_kvs_config();
  pfStack_2978 = (fdb_file_handle *)0x400;
  uStack_2964 = 1;
  pfStack_2a30 = (fdb_kvs_handle *)0x11a79e;
  system("rm -rf  iterator_test* > errorlog.txt");
  pbVar11 = (btree *)&pfStack_29f0;
  pfStack_2a30 = (fdb_kvs_handle *)0x11a7b5;
  fdb_open((fdb_file_handle **)pbVar11,"./iterator_test1",(fdb_config *)(auStack_29a0 + 0x18));
  ppfVar17 = &pfStack_29f8;
  pfStack_2a30 = (fdb_kvs_handle *)0x11a7d0;
  fdb_kvs_open(pfStack_29f0,ppfVar17,"db1",(fdb_kvs_config *)pfVar26);
  pfStack_2a30 = (fdb_kvs_handle *)0x11a7e8;
  fdb_kvs_open(pfStack_29f0,&pfStack_2a10,"db2",(fdb_kvs_config *)pfVar26);
  pfStack_2a30 = (fdb_kvs_handle *)0x11a7fe;
  fdb_set_kv(pfStack_29f8,&uStack_29d8,0xf,(void *)0x0,0);
  pfStack_2a30 = (fdb_kvs_handle *)0x11a814;
  fdb_set_kv(pfStack_29f8,&uStack_29c8,0x11,(void *)0x0,0);
  pfStack_2a30 = (fdb_kvs_handle *)0x11a81f;
  fdb_commit(pfStack_29f0,'\0');
  pfStack_2a30 = (fdb_kvs_handle *)0x11a842;
  pfVar15 = pfStack_29f8;
  fVar4 = fdb_iterator_init(pfStack_29f8,(fdb_iterator **)&pfStack_2a20,ptr_iterator,0xb,(void *)0x0
                            ,0,0);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    do {
      pfStack_2a30 = (fdb_kvs_handle *)0x11a85c;
      pfVar15 = pfStack_2a20;
      fVar4 = fdb_iterator_get((fdb_iterator *)pfStack_2a20,(fdb_doc **)&pfStack_2a18);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_2a30 = (fdb_kvs_handle *)0x11ab69;
        iterator_manual_wal_flush();
        goto LAB_0011ab69;
      }
      pfStack_2a30 = (fdb_kvs_handle *)0x11a86e;
      fdb_doc_free((fdb_doc *)pfStack_2a18);
      pfStack_2a18 = (fdb_kvs_handle *)0x0;
      pfStack_2a30 = (fdb_kvs_handle *)0x11a881;
      fVar4 = fdb_iterator_next((fdb_iterator *)pfStack_2a20);
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator = &pfStack_2a20;
    pfStack_2a30 = (fdb_kvs_handle *)0x11a893;
    fdb_iterator_close((fdb_iterator *)pfStack_2a20);
    pfStack_2a30 = (fdb_kvs_handle *)0x11a8b7;
    pfVar15 = pfStack_29f8;
    fVar4 = fdb_iterator_init(pfStack_29f8,(fdb_iterator **)ptr_iterator,&uStack_2a08,0xb,
                              (void *)0x0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ab78;
    pfStack_2a30 = (fdb_kvs_handle *)0x11a8ce;
    pfVar15 = pfStack_2a20;
    fVar4 = fdb_iterator_get((fdb_iterator *)pfStack_2a20,(fdb_doc **)&pfStack_2a18);
    if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_0011ab7d;
    ptr_iterator = &pfStack_2a20;
    pfStack_2a30 = (fdb_kvs_handle *)0x11a8e3;
    fdb_iterator_close((fdb_iterator *)pfStack_2a20);
    pfStack_2a30 = (fdb_kvs_handle *)0x11a8fc;
    fdb_set_kv(pfStack_2a10,&uStack_29d8,0xf,(void *)0x0,0);
    pfStack_2a30 = (fdb_kvs_handle *)0x11a915;
    fdb_set_kv(pfStack_2a10,&uStack_29c8,0x11,(void *)0x0,0);
    pfStack_2a30 = (fdb_kvs_handle *)0x11a924;
    fdb_commit(pfStack_29f0,'\x01');
    pfStack_2a30 = (fdb_kvs_handle *)0x11a948;
    pfVar15 = pfStack_2a10;
    fVar4 = fdb_iterator_init(pfStack_2a10,(fdb_iterator **)ptr_iterator,auStack_29e8,0xb,
                              (void *)0x0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ab82;
    do {
      pfStack_2a30 = (fdb_kvs_handle *)0x11a962;
      pfVar15 = pfStack_2a20;
      fVar4 = fdb_iterator_get((fdb_iterator *)pfStack_2a20,(fdb_doc **)&pfStack_2a18);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ab69;
      pfStack_2a30 = (fdb_kvs_handle *)0x11a974;
      fdb_doc_free((fdb_doc *)pfStack_2a18);
      pfStack_2a18 = (fdb_kvs_handle *)0x0;
      pfStack_2a30 = (fdb_kvs_handle *)0x11a987;
      fVar4 = fdb_iterator_next((fdb_iterator *)pfStack_2a20);
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator = &pfStack_2a20;
    pfStack_2a30 = (fdb_kvs_handle *)0x11a999;
    fdb_iterator_close((fdb_iterator *)pfStack_2a20);
    pfStack_2a30 = (fdb_kvs_handle *)0x11a9bd;
    pfVar15 = pfStack_29f8;
    fVar4 = fdb_iterator_init(pfStack_29f8,(fdb_iterator **)ptr_iterator,&uStack_2a08,0xb,
                              (void *)0x0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ab87;
    pfStack_2a30 = (fdb_kvs_handle *)0x11a9d4;
    pfVar15 = pfStack_2a20;
    fVar4 = fdb_iterator_get((fdb_iterator *)pfStack_2a20,(fdb_doc **)&pfStack_2a18);
    if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_0011ab8c;
    ptr_iterator = &pfStack_2a20;
    pfStack_2a30 = (fdb_kvs_handle *)0x11a9e9;
    fdb_iterator_close((fdb_iterator *)pfStack_2a20);
    pfStack_2a30 = (fdb_kvs_handle *)0x11aa0c;
    fVar4 = fdb_iterator_init(pfStack_2a10,(fdb_iterator **)ptr_iterator,(void *)0x0,0,auStack_29e8,
                              0xb,0);
    pfVar15 = pfStack_2a10;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ab91;
    pfStack_2a30 = (fdb_kvs_handle *)0x11aa2d;
    pfVar15 = pfStack_2a20;
    fVar4 = fdb_iterator_seek((fdb_iterator *)pfStack_2a20,auStack_29e8,0xb,'\x01');
    if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_0011ab96;
    ptr_iterator = &pfStack_2a20;
    pfStack_2a30 = (fdb_kvs_handle *)0x11aa42;
    fdb_iterator_close((fdb_iterator *)pfStack_2a20);
    pfStack_2a30 = (fdb_kvs_handle *)0x11aa65;
    fVar4 = fdb_iterator_init(pfStack_29f8,(fdb_iterator **)ptr_iterator,(void *)0x0,0,&uStack_2a08,
                              0xb,0);
    pfVar15 = pfStack_29f8;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ab9b;
    pfStack_2a30 = (fdb_kvs_handle *)0x11aa86;
    pfVar15 = pfStack_2a20;
    fVar4 = fdb_iterator_seek((fdb_iterator *)pfStack_2a20,&uStack_2a08,0xb,'\x01');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011aba0;
    pfStack_2a30 = (fdb_kvs_handle *)0x11aa9d;
    pfVar15 = pfStack_2a20;
    fVar4 = fdb_iterator_get((fdb_iterator *)pfStack_2a20,(fdb_doc **)&pfStack_2a18);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_2a30 = (fdb_kvs_handle *)0x11aaaf;
      fdb_doc_free((fdb_doc *)pfStack_2a18);
      pfStack_2a18 = (fdb_kvs_handle *)0x0;
      pfStack_2a30 = (fdb_kvs_handle *)0x11aac2;
      fVar4 = fdb_iterator_prev((fdb_iterator *)pfStack_2a20);
      if (fVar4 != FDB_RESULT_ITERATOR_FAIL) {
        do {
          pfStack_2a30 = (fdb_kvs_handle *)0x11aad9;
          pfVar15 = pfStack_2a20;
          fVar4 = fdb_iterator_get((fdb_iterator *)pfStack_2a20,(fdb_doc **)&pfStack_2a18);
          if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ab6e;
          pfStack_2a30 = (fdb_kvs_handle *)0x11aaeb;
          fdb_doc_free((fdb_doc *)pfStack_2a18);
          pfStack_2a18 = (fdb_kvs_handle *)0x0;
          pfStack_2a30 = (fdb_kvs_handle *)0x11aafe;
          fVar4 = fdb_iterator_prev((fdb_iterator *)pfStack_2a20);
        } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
      }
      pfStack_2a30 = (fdb_kvs_handle *)0x11ab0d;
      fdb_iterator_close((fdb_iterator *)pfStack_2a20);
      pfStack_2a30 = (fdb_kvs_handle *)0x11ab17;
      fdb_close(pfStack_29f0);
      pfStack_2a30 = (fdb_kvs_handle *)0x11ab1c;
      fdb_shutdown();
      pfStack_2a30 = (fdb_kvs_handle *)0x11ab21;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (iterator_manual_wal_flush()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      pfStack_2a30 = (fdb_kvs_handle *)0x11ab52;
      fprintf(_stderr,pcVar27,"iterator manual wal flush");
      return;
    }
  }
  else {
LAB_0011ab73:
    pfStack_2a30 = (fdb_kvs_handle *)0x11ab78;
    iterator_manual_wal_flush();
LAB_0011ab78:
    pfStack_2a30 = (fdb_kvs_handle *)0x11ab7d;
    iterator_manual_wal_flush();
LAB_0011ab7d:
    pfStack_2a30 = (fdb_kvs_handle *)0x11ab82;
    iterator_manual_wal_flush();
LAB_0011ab82:
    pfStack_2a30 = (fdb_kvs_handle *)0x11ab87;
    iterator_manual_wal_flush();
LAB_0011ab87:
    pfStack_2a30 = (fdb_kvs_handle *)0x11ab8c;
    iterator_manual_wal_flush();
LAB_0011ab8c:
    pfStack_2a30 = (fdb_kvs_handle *)0x11ab91;
    iterator_manual_wal_flush();
LAB_0011ab91:
    pfStack_2a30 = (fdb_kvs_handle *)0x11ab96;
    iterator_manual_wal_flush();
LAB_0011ab96:
    pfStack_2a30 = (fdb_kvs_handle *)0x11ab9b;
    iterator_manual_wal_flush();
LAB_0011ab9b:
    pfStack_2a30 = (fdb_kvs_handle *)0x11aba0;
    iterator_manual_wal_flush();
LAB_0011aba0:
    pfStack_2a30 = (fdb_kvs_handle *)0x11aba5;
    iterator_manual_wal_flush();
  }
  pfStack_2a30 = (fdb_kvs_handle *)sequence_iterator_seek_test;
  iterator_manual_wal_flush();
  ptr_iterator_00 = (fdb_config **)((ulong)pfVar15 & 0xffffffff);
  pfStack_2ef8 = (fdb_kvs_handle *)0x11abcf;
  ppfStack_2a58 = ptr_iterator;
  pbStack_2a50 = pbVar11;
  ppfStack_2a48 = ppfVar17;
  puStack_2a40 = &uStack_29c8;
  puStack_2a38 = &uStack_29d8;
  pfStack_2a30 = pfVar26;
  gettimeofday(&tStack_2e60,(__timezone_ptr_t)0x0);
  pfStack_2ef8 = (fdb_kvs_handle *)0x11abd4;
  memleak_start();
  pfStack_2ee0 = (fdb_config *)0x0;
  pfStack_2ef8 = (fdb_kvs_handle *)0x11abe5;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar22 = &fStack_2b50;
  pfStack_2ef8 = (fdb_kvs_handle *)0x11abf5;
  fdb_get_default_config();
  pfStack_2ef8 = (fdb_kvs_handle *)0x11abff;
  fdb_get_default_kvs_config();
  fStack_2b50.buffercache_size = 0;
  fStack_2b50.wal_threshold = 0x400;
  fStack_2b50.seqtree_opt = '\x01';
  fStack_2b50.flags = 1;
  fStack_2b50.multi_kv_instances = SUB81(ptr_iterator_00,0);
  fStack_2b50.compaction_threshold = '\0';
  ppfVar14 = &pfStack_2ed0;
  pfStack_2ef8 = (fdb_kvs_handle *)0x11ac38;
  fdb_open(ppfVar14,"./iterator_test7",pfVar22);
  if ((int)pfVar15 == 0) {
    pfStack_2ef8 = (fdb_kvs_handle *)0x11ac66;
    fdb_kvs_open_default(pfStack_2ed0,&pfStack_2ed8,&fStack_2ec8);
  }
  else {
    pfStack_2ef8 = (fdb_kvs_handle *)0x11ac55;
    fdb_kvs_open(pfStack_2ed0,&pfStack_2ed8,"kv1",&fStack_2ec8);
  }
  pfStack_2ef8 = (fdb_kvs_handle *)0x11ac7e;
  fVar4 = fdb_set_log_callback(pfStack_2ed8,logCallbackFunc,"sequence_iterator_seek_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    lVar28 = 0;
    uVar16 = 0;
    do {
      pfVar1 = &fStack_2e50.config.encryption_key;
      pfStack_2ef8 = (fdb_kvs_handle *)0x11aca6;
      sprintf((char *)pfVar1,"key%d",uVar16 & 0xffffffff);
      pfStack_2ef8 = (fdb_kvs_handle *)0x11acbe;
      sprintf((char *)&fStack_2e50.bub_ctx.handle,"meta%d",uVar16 & 0xffffffff);
      pfStack_2ef8 = (fdb_kvs_handle *)0x11acd6;
      sprintf((char *)&fStack_2e50,"body%d",uVar16 & 0xffffffff);
      pfStack_2ef8 = (fdb_kvs_handle *)0x11ace6;
      sVar6 = strlen((char *)pfVar1);
      ppfVar17 = &fStack_2e50.bub_ctx.handle;
      pfStack_2ef8 = (fdb_kvs_handle *)0x11acf9;
      sVar7 = strlen((char *)ppfVar17);
      pfStack_2ef8 = (fdb_kvs_handle *)0x11ad09;
      sVar8 = strlen((char *)&fStack_2e50);
      pfStack_2ef8 = (fdb_kvs_handle *)0x11ad2e;
      fdb_doc_create((fdb_doc **)((long)apfStack_2eb0 + lVar28),&fStack_2e50.config.encryption_key,
                     sVar6,ppfVar17,sVar7,&fStack_2e50,sVar8);
      pfStack_2ef8 = (fdb_kvs_handle *)0x11ad3d;
      fdb_set(pfStack_2ed8,apfStack_2eb0[uVar16]);
      uVar16 = uVar16 + 1;
      lVar28 = lVar28 + 8;
    } while (uVar16 != 5);
    pfStack_2ef8 = (fdb_kvs_handle *)0x11ad5d;
    fdb_commit(pfStack_2ed0,'\x01');
    uVar16 = 5;
    pfVar22 = (fdb_config *)apfStack_2e88;
    do {
      pfVar1 = &fStack_2e50.config.encryption_key;
      pfStack_2ef8 = (fdb_kvs_handle *)0x11ad82;
      sprintf((char *)pfVar1,"key%d",uVar16 & 0xffffffff);
      ppfVar17 = &fStack_2e50.bub_ctx.handle;
      pfStack_2ef8 = (fdb_kvs_handle *)0x11ad9d;
      sprintf((char *)ppfVar17,"meta%d",uVar16 & 0xffffffff);
      pfVar26 = &fStack_2e50;
      pfStack_2ef8 = (fdb_kvs_handle *)0x11adb8;
      sprintf((char *)pfVar26,"body%d",uVar16 & 0xffffffff);
      pfStack_2ef8 = (fdb_kvs_handle *)0x11adc0;
      ppfVar14 = (fdb_file_handle **)strlen((char *)pfVar1);
      pfStack_2ef8 = (fdb_kvs_handle *)0x11adcb;
      pbVar11 = (btree *)strlen((char *)ppfVar17);
      pfStack_2ef8 = (fdb_kvs_handle *)0x11add6;
      sVar6 = strlen((char *)pfVar26);
      pfStack_2ef8 = (fdb_kvs_handle *)0x11adf6;
      fdb_doc_create((fdb_doc **)pfVar22,&fStack_2e50.config.encryption_key,(size_t)ppfVar14,
                     ppfVar17,(size_t)pbVar11,pfVar26,sVar6);
      pfStack_2ef8 = (fdb_kvs_handle *)0x11ae03;
      fdb_set(pfStack_2ed8,(fdb_doc *)*(fdb_kvs_handle **)pfVar22);
      uVar16 = uVar16 + 1;
      pfVar22 = (fdb_config *)((long)pfVar22 + 8);
    } while (uVar16 != 10);
    pfStack_2ef8 = (fdb_kvs_handle *)0x11ae20;
    fdb_commit(pfStack_2ed0,'\0');
    ptr_iterator_00 = &pfStack_2ee8;
    pfStack_2ef8 = (fdb_kvs_handle *)0x11ae39;
    fdb_iterator_sequence_init(pfStack_2ed8,(fdb_iterator **)ptr_iterator_00,0,0,0);
    pfStack_2ef8 = (fdb_kvs_handle *)0x11ae41;
    fVar4 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_2ee8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b1b2;
    ppfVar17 = apfStack_2e88 + 4;
    pfVar31 = pfVar22;
    do {
      pfStack_2ef8 = (fdb_kvs_handle *)0x11ae63;
      fVar4 = fdb_iterator_get((fdb_iterator *)pfStack_2ee8,(fdb_doc **)&pfStack_2ee0);
      pfVar22 = pfStack_2ee0;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0011b146:
        pfStack_2ef8 = (fdb_kvs_handle *)0x11b14b;
        sequence_iterator_seek_test();
        pfVar22 = pfVar31;
LAB_0011b14b:
        pfStack_2ef8 = (fdb_kvs_handle *)0x11b156;
        sequence_iterator_seek_test();
LAB_0011b156:
        pfStack_2ef8 = (fdb_kvs_handle *)0x11b161;
        sequence_iterator_seek_test();
        goto LAB_0011b161;
      }
      sVar6._0_2_ = pfStack_2ee0->chunksize;
      sVar6._2_2_ = *(undefined2 *)&pfStack_2ee0->field_0x2;
      sVar6._4_4_ = pfStack_2ee0->blocksize;
      ppfVar14 = *(fdb_file_handle ***)&pfStack_2ee0->seqtree_opt;
      pfVar26 = *ppfVar17;
      pbVar11 = (btree *)pfVar26->op_stats;
      pfStack_2ef8 = (fdb_kvs_handle *)0x11ae8a;
      iVar5 = bcmp(ppfVar14,pbVar11,sVar6);
      pfVar31 = pfVar22;
      if (iVar5 != 0) {
        pfStack_2ef8 = (fdb_kvs_handle *)0x11b146;
        sequence_iterator_seek_test();
        goto LAB_0011b146;
      }
      ppfVar14 = (fdb_file_handle **)pfVar22->compactor_sleep_duration;
      pbVar11 = pfVar26->staletree;
      pfStack_2ef8 = (fdb_kvs_handle *)0x11aea9;
      iVar5 = bcmp(ppfVar14,pbVar11,pfVar22->buffercache_size);
      if (iVar5 != 0) goto LAB_0011b156;
      ppfVar14 = *(fdb_file_handle ***)&pfVar22->multi_kv_instances;
      pbVar11 = (pfVar26->field_6).seqtree;
      pfStack_2ef8 = (fdb_kvs_handle *)0x11aec8;
      iVar5 = bcmp(ppfVar14,pbVar11,pfVar22->wal_threshold);
      if (iVar5 != 0) goto LAB_0011b14b;
      pfStack_2ef8 = (fdb_kvs_handle *)0x11aed8;
      fdb_doc_free((fdb_doc *)pfVar22);
      pfStack_2ee0 = (fdb_config *)0x0;
      pfStack_2ef8 = (fdb_kvs_handle *)0x11aeeb;
      fVar4 = fdb_iterator_prev((fdb_iterator *)pfStack_2ee8);
      ppfVar17 = ppfVar17 + -1;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator_00 = &pfStack_2ee8;
    pfStack_2ef8 = (fdb_kvs_handle *)0x11af05;
    fdb_iterator_close((fdb_iterator *)pfStack_2ee8);
    pfStack_2ef8 = (fdb_kvs_handle *)0x11af1c;
    fdb_iterator_sequence_init(pfStack_2ed8,(fdb_iterator **)ptr_iterator_00,0,7,0);
    pfStack_2ef8 = (fdb_kvs_handle *)0x11af24;
    fVar4 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_2ee8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b1b7;
    ppfVar17 = apfStack_2e88 + 1;
    do {
      pfStack_2ef8 = (fdb_kvs_handle *)0x11af43;
      fVar4 = fdb_iterator_get((fdb_iterator *)pfStack_2ee8,(fdb_doc **)&pfStack_2ee0);
      pfVar22 = pfStack_2ee0;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b16c;
      sVar7._0_2_ = pfStack_2ee0->chunksize;
      sVar7._2_2_ = *(undefined2 *)&pfStack_2ee0->field_0x2;
      sVar7._4_4_ = pfStack_2ee0->blocksize;
      ppfVar14 = *(fdb_file_handle ***)&pfStack_2ee0->seqtree_opt;
      pfVar26 = *ppfVar17;
      pbVar11 = (btree *)pfVar26->op_stats;
      pfStack_2ef8 = (fdb_kvs_handle *)0x11af6a;
      iVar5 = bcmp(ppfVar14,pbVar11,sVar7);
      if (iVar5 != 0) goto LAB_0011b161;
      ppfVar14 = (fdb_file_handle **)pfVar22->compactor_sleep_duration;
      pbVar11 = pfVar26->staletree;
      pfStack_2ef8 = (fdb_kvs_handle *)0x11af89;
      iVar5 = bcmp(ppfVar14,pbVar11,pfVar22->buffercache_size);
      if (iVar5 != 0) goto LAB_0011b17c;
      ppfVar14 = *(fdb_file_handle ***)&pfVar22->multi_kv_instances;
      pbVar11 = (pfVar26->field_6).seqtree;
      pfStack_2ef8 = (fdb_kvs_handle *)0x11afa8;
      iVar5 = bcmp(ppfVar14,pbVar11,pfVar22->wal_threshold);
      if (iVar5 != 0) goto LAB_0011b171;
      pfStack_2ef8 = (fdb_kvs_handle *)0x11afb8;
      fdb_doc_free((fdb_doc *)pfVar22);
      pfStack_2ee0 = (fdb_config *)0x0;
      pfStack_2ef8 = (fdb_kvs_handle *)0x11afcb;
      fVar4 = fdb_iterator_prev((fdb_iterator *)pfStack_2ee8);
      ppfVar17 = ppfVar17 + -1;
      pfVar31 = pfVar22;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator_00 = &pfStack_2ee8;
    pfStack_2ef8 = (fdb_kvs_handle *)0x11afe5;
    fdb_iterator_close((fdb_iterator *)pfStack_2ee8);
    pfStack_2ef8 = (fdb_kvs_handle *)0x11afff;
    fdb_iterator_sequence_init(pfStack_2ed8,(fdb_iterator **)ptr_iterator_00,0,7,8);
    pfStack_2ef8 = (fdb_kvs_handle *)0x11b007;
    fVar4 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_2ee8);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      ppfVar17 = apfStack_2e88;
      while( true ) {
        pfStack_2ef8 = (fdb_kvs_handle *)0x11b026;
        fVar4 = fdb_iterator_get((fdb_iterator *)pfStack_2ee8,(fdb_doc **)&pfStack_2ee0);
        pfVar22 = pfStack_2ee0;
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        sVar8._0_2_ = pfStack_2ee0->chunksize;
        sVar8._2_2_ = *(undefined2 *)&pfStack_2ee0->field_0x2;
        sVar8._4_4_ = pfStack_2ee0->blocksize;
        ppfVar14 = *(fdb_file_handle ***)&pfStack_2ee0->seqtree_opt;
        pfVar26 = *ppfVar17;
        pbVar11 = (btree *)pfVar26->op_stats;
        pfStack_2ef8 = (fdb_kvs_handle *)0x11b04d;
        iVar5 = bcmp(ppfVar14,pbVar11,sVar8);
        if (iVar5 != 0) goto LAB_0011b187;
        ppfVar14 = (fdb_file_handle **)pfVar22->compactor_sleep_duration;
        pbVar11 = pfVar26->staletree;
        pfStack_2ef8 = (fdb_kvs_handle *)0x11b06c;
        iVar5 = bcmp(ppfVar14,pbVar11,pfVar22->buffercache_size);
        if (iVar5 != 0) goto LAB_0011b1a2;
        ppfVar14 = *(fdb_file_handle ***)&pfVar22->multi_kv_instances;
        pbVar11 = (pfVar26->field_6).seqtree;
        pfStack_2ef8 = (fdb_kvs_handle *)0x11b08b;
        iVar5 = bcmp(ppfVar14,pbVar11,pfVar22->wal_threshold);
        if (iVar5 != 0) goto LAB_0011b197;
        pfStack_2ef8 = (fdb_kvs_handle *)0x11b09b;
        fdb_doc_free((fdb_doc *)pfVar22);
        pfStack_2ee0 = (fdb_config *)0x0;
        pfStack_2ef8 = (fdb_kvs_handle *)0x11b0ae;
        fVar4 = fdb_iterator_prev((fdb_iterator *)pfStack_2ee8);
        ppfVar17 = ppfVar17 + -1;
        pfVar31 = pfVar22;
        if (fVar4 == FDB_RESULT_ITERATOR_FAIL) {
          pfStack_2ef8 = (fdb_kvs_handle *)0x11b0c5;
          fdb_iterator_close((fdb_iterator *)pfStack_2ee8);
          pfStack_2ef8 = (fdb_kvs_handle *)0x11b0cf;
          fdb_kvs_close(pfStack_2ed8);
          pfStack_2ef8 = (fdb_kvs_handle *)0x11b0d9;
          fdb_close(pfStack_2ed0);
          lVar28 = 0;
          do {
            pfStack_2ef8 = (fdb_kvs_handle *)0x11b0e5;
            fdb_doc_free(apfStack_2eb0[lVar28]);
            lVar28 = lVar28 + 1;
          } while (lVar28 != 10);
          pfStack_2ef8 = (fdb_kvs_handle *)0x11b0f3;
          fdb_shutdown();
          pfStack_2ef8 = (fdb_kvs_handle *)0x11b0f8;
          memleak_end();
          pcVar27 = "%s PASSED\n";
          if (sequence_iterator_seek_test(bool)::__test_pass != '\0') {
            pcVar27 = "%s FAILED\n";
          }
          pfStack_2ef8 = (fdb_kvs_handle *)0x11b129;
          fprintf(_stderr,pcVar27,"sequence iterator seek test");
          return;
        }
      }
LAB_0011b192:
      pfVar22 = pfVar31;
      pfStack_2ef8 = (fdb_kvs_handle *)0x11b197;
      sequence_iterator_seek_test();
LAB_0011b197:
      pfStack_2ef8 = (fdb_kvs_handle *)0x11b1a2;
      sequence_iterator_seek_test();
LAB_0011b1a2:
      ptr_iterator_00 = &pfStack_2ee0;
      pfStack_2ef8 = (fdb_kvs_handle *)0x11b1ad;
      sequence_iterator_seek_test();
      goto LAB_0011b1ad;
    }
  }
  else {
LAB_0011b1ad:
    pfStack_2ef8 = (fdb_kvs_handle *)0x11b1b2;
    sequence_iterator_seek_test();
LAB_0011b1b2:
    pfStack_2ef8 = (fdb_kvs_handle *)0x11b1b7;
    sequence_iterator_seek_test();
LAB_0011b1b7:
    pfStack_2ef8 = (fdb_kvs_handle *)0x11b1bc;
    sequence_iterator_seek_test();
  }
  pfStack_2ef8 = (fdb_kvs_handle *)iterator_concurrent_compaction;
  sequence_iterator_seek_test();
  ppfStack_32a0 = (fdb_doc **)0x11b1de;
  ppfStack_2f20 = ptr_iterator_00;
  pbStack_2f18 = pbVar11;
  ppfStack_2f10 = ppfVar17;
  pfStack_2f08 = pfVar22;
  ppfStack_2f00 = ppfVar14;
  pfStack_2ef8 = pfVar26;
  gettimeofday((timeval *)(auStack_3258 + 0x28),(__timezone_ptr_t)0x0);
  ppfStack_32a0 = (fdb_doc **)0x11b1e3;
  memleak_start();
  pfStack_3290 = (fdb_kvs_handle *)0x0;
  ppfStack_32a0 = (fdb_doc **)0x11b1f9;
  fdb_get_default_config();
  ppfStack_32a0 = (fdb_doc **)0x11b206;
  fdb_get_default_kvs_config();
  fStack_3220.wal_threshold = 0x400;
  fStack_3220.seqtree_opt = '\x01';
  fStack_3220.flags = 1;
  ppfStack_32a0 = (fdb_doc **)0x11b225;
  system("rm -rf  iterator_test* > errorlog.txt");
  ppfStack_32a0 = (fdb_doc **)0x11b23c;
  fdb_open(&pfStack_3270,"./iterator_test1",&fStack_3220);
  ppfStack_32a0 = (fdb_doc **)0x11b253;
  fdb_kvs_open(pfStack_3270,&pfStack_3278,"db",(fdb_kvs_config *)(auStack_3258 + 0x10));
  pcVar27 = "body%d";
  pfVar26 = (fdb_kvs_handle *)(apfStack_3128 + 0x20);
  doc_00 = (fdb_doc **)0x0;
  do {
    ppfStack_32a0 = (fdb_doc **)0x11b27f;
    sprintf((char *)apfStack_3128,"key%d",doc_00);
    ppfStack_32a0 = (fdb_doc **)0x11b28e;
    sprintf((char *)pfVar26,"body%d",doc_00);
    pfVar15 = pfStack_3278;
    ppfStack_32a0 = (fdb_doc **)0x11b29b;
    sVar6 = strlen((char *)apfStack_3128);
    ppfStack_32a0 = (fdb_doc **)0x11b2a6;
    sVar7 = strlen((char *)pfVar26);
    ppfStack_32a0 = (fdb_doc **)0x11b2ba;
    fdb_set_kv(pfVar15,apfStack_3128,sVar6,pfVar26,sVar7);
    uVar23 = (int)doc_00 + 1;
    doc_00 = (fdb_doc **)(ulong)uVar23;
  } while (uVar23 != 10);
  ppfStack_32a0 = (fdb_doc **)0x11b2cd;
  fdb_commit(pfStack_3270,'\0');
  ppfStack_32a0 = (fdb_doc **)0x11b2e6;
  fdb_open(&pfStack_3260,"./iterator_test1",&fStack_3220);
  ppfVar17 = (fdb_kvs_handle **)(auStack_3258 + 8);
  ppfStack_32a0 = (fdb_doc **)0x11b302;
  fdb_kvs_open(pfStack_3260,ppfVar17,"db",(fdb_kvs_config *)(auStack_3258 + 0x10));
  ppfStack_32a0 = (fdb_doc **)0x11b313;
  fdb_compact(pfStack_3270,"./iterator_test2");
  ppfStack_32a0 = (fdb_doc **)0x11b331;
  fVar4 = fdb_iterator_init((fdb_kvs_handle *)auStack_3258._8_8_,&pfStack_3280,(void *)0x0,0,
                            (void *)0x0,0,0);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    ppfStack_32a0 = (fdb_doc **)0x11b34f;
    fVar4 = fdb_iterator_sequence_init(pfStack_3278,&pfStack_3288,0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b4bb;
    pcVar27 = (char *)&pfStack_3268;
    pfVar26 = (fdb_kvs_handle *)auStack_3258;
    doc_00 = (fdb_doc **)0x0;
    do {
      ppfStack_32a0 = (fdb_doc **)0x11b381;
      sprintf((char *)apfStack_3128,"key%d",doc_00);
      pfVar15 = pfStack_3278;
      ppfStack_32a0 = (fdb_doc **)0x11b38e;
      sVar6 = strlen((char *)apfStack_3128);
      ppfStack_32a0 = (fdb_doc **)0x11b3a2;
      fdb_get_kv(pfVar15,apfStack_3128,sVar6,(void **)pcVar27,(size_t *)pfVar26);
      ppfStack_32a0 = (fdb_doc **)0x11b3ac;
      fdb_free_block(pfStack_3268);
      uVar23 = (int)doc_00 + 1;
      doc_00 = (fdb_doc **)(ulong)uVar23;
    } while (uVar23 != 10);
    ppfVar17 = &pfStack_3290;
    do {
      pfStack_3290 = (fdb_kvs_handle *)0x0;
      ppfStack_32a0 = (fdb_doc **)0x11b3ce;
      fVar4 = fdb_iterator_get(pfStack_3280,(fdb_doc **)ppfVar17);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        ppfStack_32a0 = (fdb_doc **)0x11b4b1;
        iterator_concurrent_compaction();
        goto LAB_0011b4b1;
      }
      ppfStack_32a0 = (fdb_doc **)0x11b3e0;
      fdb_doc_free((fdb_doc *)pfStack_3290);
      ppfStack_32a0 = (fdb_doc **)0x11b3ea;
      fVar4 = fdb_iterator_next(pfStack_3280);
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    ppfStack_32a0 = (fdb_doc **)0x11b3f9;
    fVar4 = fdb_iterator_close(pfStack_3280);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b4c0;
    ppfVar17 = &pfStack_3290;
    do {
      pfStack_3290 = (fdb_kvs_handle *)0x0;
      ppfStack_32a0 = (fdb_doc **)0x11b41c;
      fVar4 = fdb_iterator_get(pfStack_3288,(fdb_doc **)ppfVar17);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b4b1;
      ppfStack_32a0 = (fdb_doc **)0x11b42e;
      fdb_doc_free((fdb_doc *)pfStack_3290);
      ppfStack_32a0 = (fdb_doc **)0x11b438;
      fVar4 = fdb_iterator_next(pfStack_3288);
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    ppfStack_32a0 = (fdb_doc **)0x11b447;
    fVar4 = fdb_iterator_close(pfStack_3288);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      ppfStack_32a0 = (fdb_doc **)0x11b455;
      fdb_close(pfStack_3270);
      ppfStack_32a0 = (fdb_doc **)0x11b45f;
      fdb_close(pfStack_3260);
      ppfStack_32a0 = (fdb_doc **)0x11b464;
      fdb_shutdown();
      ppfStack_32a0 = (fdb_doc **)0x11b469;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (iterator_concurrent_compaction()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      ppfStack_32a0 = (fdb_doc **)0x11b49a;
      fprintf(_stderr,pcVar27,"iterator with concurrent compaction test");
      return;
    }
  }
  else {
LAB_0011b4b6:
    ppfStack_32a0 = (fdb_doc **)0x11b4bb;
    iterator_concurrent_compaction();
LAB_0011b4bb:
    ppfStack_32a0 = (fdb_doc **)0x11b4c0;
    iterator_concurrent_compaction();
LAB_0011b4c0:
    ppfStack_32a0 = (fdb_doc **)0x11b4c5;
    iterator_concurrent_compaction();
  }
  doc_02 = (char *)apfStack_3128;
  ppfStack_32a0 = (fdb_doc **)iterator_offset_access_test;
  iterator_concurrent_compaction();
  ppfStack_5578 = (fdb_doc **)0x11b4e7;
  ppfStack_32c8 = ppfVar17;
  pfStack_32c0 = pfVar26;
  ppfStack_32b0 = (fdb_doc **)doc_02;
  ppfStack_32a8 = (fdb_doc **)pcVar27;
  ppfStack_32a0 = doc_00;
  gettimeofday(&tStack_5520,(__timezone_ptr_t)0x0);
  ppfStack_5578 = (fdb_doc **)0x11b4ec;
  memleak_start();
  pfStack_5548 = (fdb_doc *)0x0;
  ppfStack_5578 = (fdb_doc **)0x11b501;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar15 = (fdb_kvs_handle *)(auStack_5410 + 0x108);
  ppfStack_5578 = (fdb_doc **)0x11b511;
  fdb_get_default_config();
  ppfStack_5578 = (fdb_doc **)0x11b51b;
  fdb_get_default_kvs_config();
  auStack_5300[8] = '\0';
  auStack_5300[9] = '\x02';
  auStack_5300[10] = '\0';
  auStack_5300[0xb] = '\0';
  auStack_5300[0xc] = '\0';
  auStack_5300[0xd] = '\0';
  auStack_5300[0xe] = '\0';
  auStack_5300[0xf] = '\0';
  auStack_5300[0] = '\0';
  auStack_5300[1] = '\x10';
  auStack_5300[2] = '\0';
  auStack_5300[3] = '\0';
  auStack_5300[4] = '\0';
  auStack_5300[5] = '\0';
  auStack_5300[6] = '\0';
  auStack_5300[7] = '\0';
  uStack_52e4 = 1;
  uStack_52da = 0;
  uStack_52ec = 1;
  ppfStack_5578 = (fdb_doc **)0x11b54e;
  fVar4 = fdb_open(&pfStack_5558,"./iterator_test1",(fdb_config *)pfVar15);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    ppfStack_5578 = (fdb_doc **)0x11b571;
    fVar4 = fdb_kvs_open(pfStack_5558,&pfStack_5560,"DB",&fStack_5538);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ba02;
    ppfStack_5578 = (fdb_doc **)0x11b594;
    fVar4 = fdb_kvs_open(pfStack_5558,&pfStack_5540,"ODB",&fStack_5538);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ba07;
    doc_02 = (char *)apfStack_5510;
    pfVar26 = (fdb_kvs_handle *)auStack_5410;
    pcVar27 = (char *)0x0;
    uVar16 = 0;
    do {
      ppfStack_5578 = (fdb_doc **)0x11b5c3;
      sprintf(doc_02,"key%d",uVar16 & 0xffffffff);
      ppfStack_5578 = (fdb_doc **)0x11b5d7;
      sprintf((char *)pfVar26,"body%d",uVar16 & 0xffffffff);
      doc_00 = (fdb_doc **)((long)apfStack_5210 + (long)pcVar27);
      ppfStack_5578 = (fdb_doc **)0x11b5ea;
      pfVar15 = (fdb_kvs_handle *)strlen(doc_02);
      ppfStack_5578 = (fdb_doc **)0x11b5f5;
      sVar6 = strlen((char *)pfVar26);
      ppfStack_5578 = (fdb_doc **)0x11b60f;
      fdb_doc_create(doc_00,doc_02,(size_t)pfVar15,(void *)0x0,0,pfVar26,sVar6);
      ppfStack_5578 = (fdb_doc **)0x11b621;
      fVar4 = fdb_set(pfStack_5560,apfStack_5210[uVar16]);
      pfVar12 = pfStack_5540;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0011b9d0:
        ppfStack_5578 = (fdb_doc **)0x11b9d5;
        iterator_offset_access_test();
        goto LAB_0011b9d5;
      }
      ppfStack_5578 = (fdb_doc **)0x11b636;
      sVar6 = strlen(doc_02);
      ppfStack_5578 = (fdb_doc **)0x11b656;
      fVar4 = fdb_set_kv(pfVar12,doc_02,sVar6,&apfStack_5210[uVar16]->offset,8);
      pfVar15 = pfVar12;
      if (fVar4 != FDB_RESULT_SUCCESS) {
        ppfStack_5578 = (fdb_doc **)0x11b9d0;
        iterator_offset_access_test();
        goto LAB_0011b9d0;
      }
      uVar16 = uVar16 + 1;
      pcVar27 = (char *)((long)pcVar27 + 8);
    } while (uVar16 != 1000);
    ppfStack_5578 = (fdb_doc **)0x11b681;
    fVar4 = fdb_commit(pfStack_5558,'\x01');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ba0c;
    pfVar15 = (fdb_kvs_handle *)0xfa;
    doc_02 = "key%d";
    pcVar27 = (char *)apfStack_5510;
    do {
      ppfStack_5578 = (fdb_doc **)0x11b6a9;
      sprintf(pcVar27,"key%d",pfVar15);
      pfVar26 = pfStack_5560;
      ppfStack_5578 = (fdb_doc **)0x11b6b6;
      sVar6 = strlen(pcVar27);
      ppfStack_5578 = (fdb_doc **)0x11b6c4;
      fVar4 = fdb_del_kv(pfVar26,pcVar27,sVar6);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b9d5;
      uVar23 = (int)pfVar15 + 1;
      pfVar15 = (fdb_kvs_handle *)(ulong)uVar23;
    } while (uVar23 != 500);
    doc_02 = (char *)apfStack_5510;
    pfVar26 = (fdb_kvs_handle *)auStack_5410;
    pcVar27 = (char *)0x0;
    uVar16 = 0;
    do {
      ppfStack_5578 = (fdb_doc **)0x11b6fd;
      sprintf(doc_02,"k0y%d",uVar16 & 0xffffffff);
      ppfStack_5578 = (fdb_doc **)0x11b711;
      sprintf((char *)pfVar26,"b0dy%d",uVar16 & 0xffffffff);
      doc_00 = (fdb_doc **)((long)apfStack_5210 + (long)pcVar27);
      ppfStack_5578 = (fdb_doc **)0x11b729;
      fdb_doc_free(apfStack_5210[uVar16]);
      ppfStack_5578 = (fdb_doc **)0x11b731;
      pfVar15 = (fdb_kvs_handle *)strlen(doc_02);
      ppfStack_5578 = (fdb_doc **)0x11b73c;
      sVar6 = strlen((char *)pfVar26);
      ppfStack_5578 = (fdb_doc **)0x11b756;
      fdb_doc_create(doc_00,doc_02,(size_t)pfVar15,(void *)0x0,0,pfVar26,sVar6);
      ppfStack_5578 = (fdb_doc **)0x11b768;
      fVar4 = fdb_set(pfStack_5560,apfStack_5210[uVar16]);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b9da;
      uVar16 = uVar16 + 1;
      pcVar27 = (char *)((long)pcVar27 + 8);
    } while (uVar16 != 0xfa);
    ppfStack_5578 = (fdb_doc **)0x11b790;
    fVar4 = fdb_commit(pfStack_5558,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011ba11;
    ppfStack_5578 = (fdb_doc **)0x11b7b8;
    fdb_iterator_init(pfStack_5540,&pfStack_5550,(void *)0x0,0,(void *)0x0,0,2);
    pcVar27 = (char *)0x1ea;
    pfVar15 = afStack_4270;
    doc_02 = (char *)&pfStack_5548;
    do {
      ppfStack_5578 = (fdb_doc **)0x11b7d8;
      fVar4 = fdb_get_byoffset(pfStack_5560,*(fdb_doc **)&pfVar15->kvs_config);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b9e4;
      ppfStack_5578 = (fdb_doc **)0x11b7f6;
      fVar4 = fdb_iterator_seek(pfStack_5550,(void *)(*(size_t **)&pfVar15->kvs_config)[4],
                                **(size_t **)&pfVar15->kvs_config,'\0');
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b9df;
      ppfStack_5578 = (fdb_doc **)0x11b80b;
      fVar4 = fdb_iterator_get(pfStack_5550,(fdb_doc **)doc_02);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b9ee;
      if (*pfStack_5548->body != *(long *)(*(long *)&pfVar15->kvs_config + 0x30)) {
        ppfStack_5578 = (fdb_doc **)0x11b86c;
        iterator_offset_access_test();
      }
      ppfStack_5578 = (fdb_doc **)0x11b835;
      fVar4 = fdb_del(pfStack_5560,*(fdb_doc **)&pfVar15->kvs_config);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b9e9;
      ppfStack_5578 = (fdb_doc **)0x11b84a;
      fdb_get_metaonly(pfStack_5560,*(fdb_doc **)&pfVar15->kvs_config);
      pcVar27 = (char *)((long)pcVar27 + 10);
      pfVar15 = (fdb_kvs_handle *)&pfVar15->dhandle;
    } while (pcVar27 < (fdb_doc **)0x3de);
    ppfStack_5578 = (fdb_doc **)0x11b878;
    fdb_iterator_close(pfStack_5550);
    ppfStack_5578 = (fdb_doc **)0x11b887;
    fVar4 = fdb_commit(pfStack_5558,'\x01');
    if (fVar4 == FDB_RESULT_SUCCESS) {
      doc_02 = (char *)apfStack_5510;
      pcVar27 = "b1dy%d";
      pfVar26 = (fdb_kvs_handle *)auStack_5410;
      doc_00 = (fdb_doc **)0x0;
      do {
        ppfStack_5578 = (fdb_doc **)0x11b8b8;
        sprintf(doc_02,"k1y%d",doc_00);
        ppfStack_5578 = (fdb_doc **)0x11b8c7;
        sprintf((char *)pfVar26,"b1dy%d",doc_00);
        pfVar12 = pfStack_5560;
        ppfStack_5578 = (fdb_doc **)0x11b8d4;
        pfVar15 = (fdb_kvs_handle *)strlen(doc_02);
        ppfStack_5578 = (fdb_doc **)0x11b8df;
        sVar6 = strlen((char *)pfVar26);
        ppfStack_5578 = (fdb_doc **)0x11b8f3;
        fVar4 = fdb_set_kv(pfVar12,doc_02,(size_t)pfVar15,pfVar26,sVar6);
        if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011b9f3;
        uVar23 = (int)doc_00 + 1;
        doc_00 = (fdb_doc **)(ulong)uVar23;
      } while (uVar23 != 0xfa);
      doc_02 = (char *)0x1ea;
      pfVar15 = afStack_4270;
      while( true ) {
        ppfStack_5578 = (fdb_doc **)0x11b920;
        fVar4 = fdb_get_byoffset(pfStack_5560,*(fdb_doc **)&pfVar15->kvs_config);
        if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) break;
        if (*(char *)(*(long *)&pfVar15->kvs_config + 0x48) == '\0') {
          ppfStack_5578 = (fdb_doc **)0x11b94d;
          iterator_offset_access_test();
        }
        doc_02 = (char *)((long)doc_02 + 10);
        pfVar15 = (fdb_kvs_handle *)&pfVar15->dhandle;
        if ((fdb_doc **)0x3dd < doc_02) {
          lVar28 = 0;
          do {
            ppfStack_5578 = (fdb_doc **)0x11b95e;
            fdb_doc_free(apfStack_5210[lVar28]);
            lVar28 = lVar28 + 1;
          } while (lVar28 != 1000);
          ppfStack_5578 = (fdb_doc **)0x11b974;
          fdb_doc_free(pfStack_5548);
          ppfStack_5578 = (fdb_doc **)0x11b97e;
          fdb_close(pfStack_5558);
          ppfStack_5578 = (fdb_doc **)0x11b983;
          fdb_shutdown();
          ppfStack_5578 = (fdb_doc **)0x11b988;
          memleak_end();
          pcVar27 = "%s PASSED\n";
          if (iterator_offset_access_test()::__test_pass != '\0') {
            pcVar27 = "%s FAILED\n";
          }
          ppfStack_5578 = (fdb_doc **)0x11b9b9;
          fprintf(_stderr,pcVar27,"iterator offset access test");
          return;
        }
      }
LAB_0011b9f8:
      ppfStack_5578 = (fdb_doc **)0x11b9fd;
      iterator_offset_access_test();
      goto LAB_0011b9fd;
    }
  }
  else {
LAB_0011b9fd:
    ppfStack_5578 = (fdb_doc **)0x11ba02;
    iterator_offset_access_test();
LAB_0011ba02:
    ppfStack_5578 = (fdb_doc **)0x11ba07;
    iterator_offset_access_test();
LAB_0011ba07:
    ppfStack_5578 = (fdb_doc **)0x11ba0c;
    iterator_offset_access_test();
LAB_0011ba0c:
    ppfStack_5578 = (fdb_doc **)0x11ba11;
    iterator_offset_access_test();
LAB_0011ba11:
    ppfStack_5578 = (fdb_doc **)0x11ba16;
    iterator_offset_access_test();
  }
  ppfStack_5578 = (fdb_doc **)iterator_deleted_doc_right_before_the_end_test;
  iterator_offset_access_test();
  ppfStack_5a00 = (fdb_iterator **)0x11ba36;
  pfStack_5598 = pfVar15;
  pfStack_5590 = pfVar26;
  ppfStack_5588 = (fdb_doc **)doc_02;
  ppfStack_5580 = (fdb_doc **)pcVar27;
  ppfStack_5578 = doc_00;
  gettimeofday(&tStack_59c8,(__timezone_ptr_t)0x0);
  ppfStack_5a00 = (fdb_iterator **)0x11ba3b;
  memleak_start();
  ppfStack_5a00 = (fdb_iterator **)0x11ba4b;
  fdb_get_default_config();
  fStack_5790.buffercache_size = 0;
  ppfStack_5a00 = (fdb_iterator **)0x11ba63;
  fdb_get_default_kvs_config();
  ppfStack_5a00 = (fdb_iterator **)0x11ba86;
  sprintf(acStack_5898,"rm -rf  %s*","./dummy");
  ppfStack_5a00 = (fdb_iterator **)0x11ba8e;
  system(acStack_5898);
  ppfStack_5a00 = (fdb_iterator **)0x11baa1;
  fdb_open(&pfStack_59d0,"./dummy",&fStack_5790);
  ppfStack_5a00 = (fdb_iterator **)0x11bab4;
  fdb_kvs_open(pfStack_59d0,&pfStack_59d8,(char *)0x0,&fStack_58b0);
  uVar16 = 0;
  do {
    ppfStack_5a00 = (fdb_iterator **)0x11bae0;
    sprintf((char *)apfStack_59b8,"k%06d\n",uVar16);
    ppfStack_5a00 = (fdb_iterator **)0x11baef;
    sprintf(acStack_5698,"v%06d\n",uVar16);
    ppfStack_5a00 = (fdb_iterator **)0x11bb0a;
    fdb_set_kv(pfStack_59d8,apfStack_59b8,8,acStack_5698,8);
    uVar23 = (int)uVar16 + 1;
    uVar16 = (ulong)uVar23;
  } while (uVar23 != 3);
  ppfStack_5a00 = (fdb_iterator **)0x11bb2c;
  sprintf((char *)apfStack_59b8,"k%06d\n",1);
  ppfStack_5a00 = (fdb_iterator **)0x11bb3e;
  fdb_del_kv(pfStack_59d8,apfStack_59b8,8);
  ppfStack_5a00 = (fdb_iterator **)0x11bb4a;
  fdb_commit(pfStack_59d0,'\0');
  apfStack_59b8[0]._0_2_ = 0x61;
  acStack_5898[0] = 'z';
  acStack_5898[1] = '\0';
  ppfStack_5a00 = (fdb_iterator **)0x11bb81;
  fVar4 = fdb_iterator_init(pfStack_59d8,&pfStack_59e8,apfStack_59b8,1,acStack_5898,1,2);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    ppfStack_5a00 = (fdb_iterator **)0x11bb93;
    fVar4 = fdb_iterator_seek_to_max(pfStack_59e8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011bdbc;
    pfStack_59e0 = (fdb_doc *)0x0;
    ppfStack_5a00 = (fdb_iterator **)0x11bbb1;
    fVar4 = fdb_iterator_get(pfStack_59e8,&pfStack_59e0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011bdc1;
    ppfStack_5a00 = (fdb_iterator **)0x11bbd4;
    sprintf((char *)apfStack_59b8,"k%06d\n",2);
    if (*pfStack_59e0->key != CONCAT62(apfStack_59b8[0]._2_6_,apfStack_59b8[0]._0_2_))
    goto LAB_0011bdc6;
    ppfStack_5a00 = (fdb_iterator **)0x11bbee;
    fdb_doc_free(pfStack_59e0);
    ppfStack_5a00 = (fdb_iterator **)0x11bbf8;
    fVar4 = fdb_iterator_prev(pfStack_59e8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011bdd0;
    pfStack_59e0 = (fdb_doc *)0x0;
    ppfStack_5a00 = (fdb_iterator **)0x11bc16;
    fVar4 = fdb_iterator_get(pfStack_59e8,&pfStack_59e0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011bdd5;
    ppfStack_5a00 = (fdb_iterator **)0x11bc36;
    sprintf((char *)apfStack_59b8,"k%06d\n",0);
    if (*pfStack_59e0->key != CONCAT62(apfStack_59b8[0]._2_6_,apfStack_59b8[0]._0_2_))
    goto LAB_0011bdda;
    ppfStack_5a00 = (fdb_iterator **)0x11bc50;
    fdb_doc_free(pfStack_59e0);
    ppfVar13 = &pfStack_59e8;
    ppfStack_5a00 = (fdb_iterator **)0x11bc5d;
    fdb_iterator_close(pfStack_59e8);
    ppfStack_5a00 = (fdb_iterator **)0x11bc89;
    fVar4 = fdb_iterator_init(pfStack_59d8,ppfVar13,apfStack_59b8,1,acStack_5898,1,2);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011bde4;
    ppfStack_5a00 = (fdb_iterator **)0x11bc9b;
    fVar4 = fdb_iterator_seek_to_min(pfStack_59e8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011bde9;
    pfStack_59e0 = (fdb_doc *)0x0;
    ppfStack_5a00 = (fdb_iterator **)0x11bcb9;
    fVar4 = fdb_iterator_get(pfStack_59e8,&pfStack_59e0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011bdee;
    ppfVar13 = apfStack_59b8;
    ppfStack_5a00 = (fdb_iterator **)0x11bcd9;
    sprintf((char *)ppfVar13,"k%06d\n",0);
    if (*pfStack_59e0->key != CONCAT62(apfStack_59b8[0]._2_6_,apfStack_59b8[0]._0_2_))
    goto LAB_0011bdf3;
    ppfStack_5a00 = (fdb_iterator **)0x11bcf3;
    fdb_doc_free(pfStack_59e0);
    ppfStack_5a00 = (fdb_iterator **)0x11bcfd;
    fVar4 = fdb_iterator_next(pfStack_59e8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011bdfd;
    pfStack_59e0 = (fdb_doc *)0x0;
    ppfStack_5a00 = (fdb_iterator **)0x11bd1b;
    fVar4 = fdb_iterator_get(pfStack_59e8,&pfStack_59e0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011be02;
    ppfVar13 = apfStack_59b8;
    ppfStack_5a00 = (fdb_iterator **)0x11bd3e;
    sprintf((char *)ppfVar13,"k%06d\n",2);
    if (*pfStack_59e0->key == CONCAT62(apfStack_59b8[0]._2_6_,apfStack_59b8[0]._0_2_)) {
      ppfStack_5a00 = (fdb_iterator **)0x11bd58;
      fdb_doc_free(pfStack_59e0);
      ppfStack_5a00 = (fdb_iterator **)0x11bd62;
      fdb_iterator_close(pfStack_59e8);
      ppfStack_5a00 = (fdb_iterator **)0x11bd6c;
      fdb_close(pfStack_59d0);
      ppfStack_5a00 = (fdb_iterator **)0x11bd71;
      fdb_shutdown();
      ppfStack_5a00 = (fdb_iterator **)0x11bd76;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (iterator_deleted_doc_right_before_the_end_test()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      ppfStack_5a00 = (fdb_iterator **)0x11bda7;
      fprintf(_stderr,pcVar27,"iterator deleted doc right before the end of iteration test");
      return;
    }
  }
  else {
    ppfStack_5a00 = (fdb_iterator **)0x11bdbc;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdbc:
    ppfStack_5a00 = (fdb_iterator **)0x11bdc1;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdc1:
    ppfStack_5a00 = (fdb_iterator **)0x11bdc6;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdc6:
    ppfStack_5a00 = (fdb_iterator **)0x11bdd0;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdd0:
    ppfStack_5a00 = (fdb_iterator **)0x11bdd5;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdd5:
    ppfStack_5a00 = (fdb_iterator **)0x11bdda;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdda:
    ppfVar13 = apfStack_59b8;
    ppfStack_5a00 = (fdb_iterator **)0x11bde4;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bde4:
    ppfStack_5a00 = (fdb_iterator **)0x11bde9;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bde9:
    ppfStack_5a00 = (fdb_iterator **)0x11bdee;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdee:
    ppfStack_5a00 = (fdb_iterator **)0x11bdf3;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdf3:
    ppfStack_5a00 = (fdb_iterator **)0x11bdfd;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bdfd:
    ppfStack_5a00 = (fdb_iterator **)0x11be02;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011be02:
    ppfStack_5a00 = (fdb_iterator **)0x11be07;
    iterator_deleted_doc_right_before_the_end_test();
  }
  ppfStack_5a00 = (fdb_iterator **)iterator_uncommited_seeks;
  iterator_deleted_doc_right_before_the_end_test();
  pcStack_5b58 = (code *)0x11be25;
  ppfStack_5a00 = ppfVar13;
  gettimeofday(&tStack_5b08,(__timezone_ptr_t)0x0);
  pfStack_5b40 = (fdb_doc *)0x0;
  pcStack_5b58 = (code *)0x11be33;
  memleak_start();
  pfVar22 = &fStack_5af8;
  pcStack_5b58 = (code *)0x11be40;
  fdb_get_default_config();
  pcStack_5b58 = (code *)0x11be4a;
  fdb_get_default_kvs_config();
  pcStack_5b58 = (code *)0x11be56;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcStack_5b58 = (code *)0x11be6a;
  fVar4 = fdb_open(&pfStack_5b28,"./iterator_test1",pfVar22);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pcStack_5b58 = (code *)0x11be86;
    fVar4 = fdb_kvs_open_default(pfStack_5b28,&pfStack_5b30,&fStack_5b20);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c091;
    pcStack_5b58 = (code *)0x11bea9;
    fdb_set_kv(pfStack_5b30,"a",1,(void *)0x0,0);
    pfVar22 = (fdb_config *)0x155b95;
    pcStack_5b58 = (code *)0x11bec7;
    fdb_set_kv(pfStack_5b30,"b",1,(void *)0x0,0);
    pcStack_5b58 = (code *)0x11bee2;
    fdb_set_kv(pfStack_5b30,"c",1,(void *)0x0,0);
    pcStack_5b58 = (code *)0x11bf06;
    fVar4 = fdb_iterator_init(pfStack_5b30,&pfStack_5b38,"b",1,(void *)0x0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c098;
    pcStack_5b58 = (code *)0x11bf18;
    fVar4 = fdb_iterator_seek_to_min(pfStack_5b38);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c09d;
    pcStack_5b58 = (code *)0x11bf2f;
    fVar4 = fdb_iterator_get(pfStack_5b38,&pfStack_5b40);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c0a4;
    if (*pfStack_5b40->key != 'b') goto LAB_0011c0ab;
    pcStack_5b58 = (code *)0x11bf4e;
    fdb_doc_free(pfStack_5b40);
    pfStack_5b40 = (fdb_doc *)0x0;
    pcStack_5b58 = (code *)0x11bf61;
    fVar4 = fdb_iterator_seek_to_max(pfStack_5b38);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c0b3;
    pcStack_5b58 = (code *)0x11bf78;
    fVar4 = fdb_iterator_get(pfStack_5b38,&pfStack_5b40);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c0ba;
    if (*pfStack_5b40->key != 'c') goto LAB_0011c0c1;
    pcStack_5b58 = (code *)0x11bf97;
    fdb_doc_free(pfStack_5b40);
    pfStack_5b40 = (fdb_doc *)0x0;
    pcStack_5b58 = (code *)0x11bfaa;
    fVar4 = fdb_iterator_prev(pfStack_5b38);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c0c9;
    pcStack_5b58 = (code *)0x11bfc1;
    fVar4 = fdb_iterator_get(pfStack_5b38,&pfStack_5b40);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c0d0;
    if (*pfStack_5b40->key != 'b') goto LAB_0011c0d7;
    pcStack_5b58 = (code *)0x11bfe0;
    fdb_doc_free(pfStack_5b40);
    pfStack_5b40 = (fdb_doc *)0x0;
    pcStack_5b58 = (code *)0x11bff3;
    fVar4 = fdb_iterator_next(pfStack_5b38);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c0df;
    pcStack_5b58 = (code *)0x11c00a;
    fVar4 = fdb_iterator_get(pfStack_5b38,&pfStack_5b40);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c0e6;
    if (*pfStack_5b40->key == 'c') {
      pcStack_5b58 = (code *)0x11c029;
      fdb_doc_free(pfStack_5b40);
      pfStack_5b40 = (fdb_doc *)0x0;
      pcStack_5b58 = (code *)0x11c03c;
      fdb_iterator_close(pfStack_5b38);
      pcStack_5b58 = (code *)0x11c046;
      fdb_close(pfStack_5b28);
      pcStack_5b58 = (code *)0x11c04b;
      fdb_shutdown();
      pcStack_5b58 = (code *)0x11c050;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (iterator_uncommited_seeks()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      pcStack_5b58 = (code *)0x11c081;
      fprintf(_stderr,pcVar27,"iterator single doc range");
      return;
    }
  }
  else {
    pcStack_5b58 = (code *)0x11c091;
    iterator_uncommited_seeks();
LAB_0011c091:
    pcStack_5b58 = (code *)0x11c098;
    iterator_uncommited_seeks();
LAB_0011c098:
    pcStack_5b58 = (code *)0x11c09d;
    iterator_uncommited_seeks();
LAB_0011c09d:
    pcStack_5b58 = (code *)0x11c0a4;
    iterator_uncommited_seeks();
LAB_0011c0a4:
    pcStack_5b58 = (code *)0x11c0ab;
    iterator_uncommited_seeks();
LAB_0011c0ab:
    pcStack_5b58 = (code *)0x11c0b3;
    iterator_uncommited_seeks();
LAB_0011c0b3:
    pcStack_5b58 = (code *)0x11c0ba;
    iterator_uncommited_seeks();
LAB_0011c0ba:
    pcStack_5b58 = (code *)0x11c0c1;
    iterator_uncommited_seeks();
LAB_0011c0c1:
    pcStack_5b58 = (code *)0x11c0c9;
    iterator_uncommited_seeks();
LAB_0011c0c9:
    pcStack_5b58 = (code *)0x11c0d0;
    iterator_uncommited_seeks();
LAB_0011c0d0:
    pcStack_5b58 = (code *)0x11c0d7;
    iterator_uncommited_seeks();
LAB_0011c0d7:
    pcStack_5b58 = (code *)0x11c0df;
    iterator_uncommited_seeks();
LAB_0011c0df:
    pcStack_5b58 = (code *)0x11c0e6;
    iterator_uncommited_seeks();
LAB_0011c0e6:
    pcStack_5b58 = (code *)0x11c0ed;
    iterator_uncommited_seeks();
  }
  pcStack_5b58 = iterator_init_using_substring_test;
  iterator_uncommited_seeks();
  pfStack_5f00 = (fdb_config *)0x11c10f;
  pfStack_5b68 = pfVar22;
  pcStack_5b60 = (char *)apfStack_59b8;
  pcStack_5b58 = (code *)uVar16;
  gettimeofday(&tStack_5e78,(__timezone_ptr_t)0x0);
  pfStack_5f00 = (fdb_config *)0x11c114;
  memleak_start();
  pfVar22 = &fStack_5d60;
  pfStack_5f00 = (fdb_config *)0x11c124;
  fdb_get_default_config();
  fStack_5d60.buffercache_size = 0;
  pfStack_5f00 = (fdb_config *)0x11c136;
  fdb_get_default_kvs_config();
  pfStack_5f00 = (fdb_config *)0x11c156;
  sprintf(acStack_5c68,"rm -rf  %s*","./iterator_test");
  pfStack_5f00 = (fdb_config *)0x11c15e;
  system(acStack_5c68);
  pfStack_5f00 = (fdb_config *)0x11c172;
  fVar4 = fdb_open(&pfStack_5ed8,"./iterator_test1",pfVar22);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_5f00 = (fdb_config *)0x11c190;
    fVar4 = fdb_kvs_open(pfStack_5ed8,&pfStack_5ee0,(char *)0x0,&fStack_5e90);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c32a;
    uStack_5ea0 = 0x34323634353773;
    uStack_5e99 = 0xff;
    uStack_5eb8 = 0x34323634353773;
    uStack_5eb1 = 0x10000ff;
    uStack_5ea8._0_4_ = 0x34353773;
    uStack_5ea8._4_1_ = true;
    uStack_5ea8._5_1_ = true;
    uStack_5ea8._6_1_ = '4';
    uStack_5ea8._7_1_ = 0xff;
    uStack_5ec8 = 0xff34323634353773;
    uStack_5ec0 = 0xff;
    uStack_5e68 = 0x3179656b;
    uStack_5e64 = 0;
    pfStack_5f00 = (fdb_config *)0x11c1f4;
    fVar4 = fdb_set_kv(pfStack_5ee0,&uStack_5ea0,0xb,&uStack_5e68,4);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c32f;
    uStack_5e64 = 0;
    uStack_5e68 = 0x3279656b;
    pfStack_5f00 = (fdb_config *)0x11c228;
    fVar4 = fdb_set_kv(pfStack_5ee0,&uStack_5eb8,0xb,&uStack_5e68,4);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c334;
    pfStack_5f00 = (fdb_config *)0x11c23f;
    fVar4 = fdb_commit(pfStack_5ed8,'\x01');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c339;
    pfStack_5f00 = (fdb_config *)0x11c272;
    fVar4 = fdb_iterator_init(pfStack_5ee0,&pfStack_5ee8,&uStack_5ea8,8,&uStack_5ec8,9,10);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c33e;
    iVar5 = 0;
    pfVar22 = (fdb_config *)&pfStack_5ed0;
    do {
      pfStack_5ed0 = (fdb_doc *)0x0;
      pfStack_5f00 = (fdb_config *)0x11c297;
      fVar4 = fdb_iterator_get(pfStack_5ee8,(fdb_doc **)pfVar22);
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      iVar5 = iVar5 + 1;
      pfStack_5f00 = (fdb_config *)0x11c2a7;
      fdb_doc_free(pfStack_5ed0);
      pfStack_5f00 = (fdb_config *)0x11c2b1;
      fVar4 = fdb_iterator_next(pfStack_5ee8);
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if (iVar5 != 2) goto LAB_0011c343;
    pfStack_5f00 = (fdb_config *)0x11c2c8;
    fVar4 = fdb_iterator_close(pfStack_5ee8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c348;
    pfStack_5f00 = (fdb_config *)0x11c2d6;
    fVar4 = fdb_close(pfStack_5ed8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c34d;
    pfStack_5f00 = (fdb_config *)0x11c2df;
    fVar4 = fdb_shutdown();
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_5f00 = (fdb_config *)0x11c2e8;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (iterator_init_using_substring_test()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      pfStack_5f00 = (fdb_config *)0x11c319;
      fprintf(_stderr,pcVar27,"iterator init using substring test");
      return;
    }
  }
  else {
    pfStack_5f00 = (fdb_config *)0x11c32a;
    iterator_init_using_substring_test();
LAB_0011c32a:
    pfStack_5f00 = (fdb_config *)0x11c32f;
    iterator_init_using_substring_test();
LAB_0011c32f:
    pfStack_5f00 = (fdb_config *)0x11c334;
    iterator_init_using_substring_test();
LAB_0011c334:
    pfStack_5f00 = (fdb_config *)0x11c339;
    iterator_init_using_substring_test();
LAB_0011c339:
    pfStack_5f00 = (fdb_config *)0x11c33e;
    iterator_init_using_substring_test();
LAB_0011c33e:
    pfStack_5f00 = (fdb_config *)0x11c343;
    iterator_init_using_substring_test();
LAB_0011c343:
    pfStack_5f00 = (fdb_config *)0x11c348;
    iterator_init_using_substring_test();
LAB_0011c348:
    pfStack_5f00 = (fdb_config *)0x11c34d;
    iterator_init_using_substring_test();
LAB_0011c34d:
    pfStack_5f00 = (fdb_config *)0x11c352;
    iterator_init_using_substring_test();
  }
  pfStack_5f00 = (fdb_config *)iterator_seek_to_max_key_with_deletes_test;
  iterator_init_using_substring_test();
  pfStack_6058 = (fdb_config *)0x11c36d;
  pfStack_5f00 = pfVar22;
  gettimeofday(&tStack_6008,(__timezone_ptr_t)0x0);
  pfStack_6058 = (fdb_config *)0x11c372;
  memleak_start();
  pfStack_6040 = (fdb_iterator *)0x0;
  pfStack_6030 = (fdb_doc *)0x0;
  pfVar22 = &fStack_5ff8;
  pfStack_6058 = (fdb_config *)0x11c389;
  fdb_get_default_config();
  pfStack_6058 = (fdb_config *)0x11c393;
  fdb_get_default_kvs_config();
  pfStack_6058 = (fdb_config *)0x11c39f;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfStack_6058 = (fdb_config *)0x11c3b3;
  fVar4 = fdb_open(&pfStack_6028,"./iterator_test1",pfVar22);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_6058 = (fdb_config *)0x11c3cf;
    fVar4 = fdb_kvs_open_default(pfStack_6028,&pfStack_6038,&fStack_6020);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c58c;
    pfStack_6058 = (fdb_config *)0x11c3f2;
    fdb_set_kv(pfStack_6038,"A",1,(void *)0x0,0);
    pfVar22 = (fdb_config *)0x155dcc;
    pfStack_6058 = (fdb_config *)0x11c410;
    fdb_set_kv(pfStack_6038,"B",1,(void *)0x0,0);
    pfStack_6058 = (fdb_config *)0x11c43b;
    fVar4 = fdb_iterator_init(pfStack_6038,&pfStack_6040,"B",1,"Bzz",3,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c593;
    pfStack_6058 = (fdb_config *)0x11c44d;
    fVar4 = fdb_iterator_seek_to_max(pfStack_6040);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c598;
    pfStack_6058 = (fdb_config *)0x11c464;
    fVar4 = fdb_iterator_get(pfStack_6040,&pfStack_6030);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c59f;
    if (*pfStack_6030->key != 'B') goto LAB_0011c5a6;
    pfStack_6058 = (fdb_config *)0x11c483;
    fdb_doc_free(pfStack_6030);
    pfStack_6030 = (fdb_doc *)0x0;
    pfStack_6058 = (fdb_config *)0x11c496;
    fVar4 = fdb_iterator_close(pfStack_6040);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c5ae;
    pfStack_6040 = (fdb_iterator *)0x0;
    pfStack_6058 = (fdb_config *)0x11c4bd;
    fVar4 = fdb_del_kv(pfStack_6038,"B",1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c5b5;
    pfStack_6058 = (fdb_config *)0x11c4f4;
    fVar4 = fdb_iterator_init(pfStack_6038,&pfStack_6040,"B",1,"Bzz",3,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c5bc;
    pfStack_6058 = (fdb_config *)0x11c50b;
    fVar4 = fdb_iterator_get(pfStack_6040,&pfStack_6030);
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c5c1;
    pfStack_6058 = (fdb_config *)0x11c51e;
    fVar4 = fdb_iterator_seek_to_max(pfStack_6040);
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c5c6;
    pfStack_6058 = (fdb_config *)0x11c531;
    fVar4 = fdb_close(pfStack_6028);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c5cb;
    pfStack_6058 = (fdb_config *)0x11c53e;
    fVar4 = fdb_shutdown();
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_6058 = (fdb_config *)0x11c54b;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (iterator_seek_to_max_key_with_deletes_test()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      pfStack_6058 = (fdb_config *)0x11c57c;
      fprintf(_stderr,pcVar27,"iterator seek to max test");
      return;
    }
  }
  else {
    pfStack_6058 = (fdb_config *)0x11c58c;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c58c:
    pfStack_6058 = (fdb_config *)0x11c593;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c593:
    pfStack_6058 = (fdb_config *)0x11c598;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c598:
    pfStack_6058 = (fdb_config *)0x11c59f;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c59f:
    pfStack_6058 = (fdb_config *)0x11c5a6;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5a6:
    pfStack_6058 = (fdb_config *)0x11c5ae;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5ae:
    pfStack_6058 = (fdb_config *)0x11c5b5;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5b5:
    pfStack_6058 = (fdb_config *)0x11c5bc;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5bc:
    pfStack_6058 = (fdb_config *)0x11c5c1;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5c1:
    pfStack_6058 = (fdb_config *)0x11c5c6;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5c6:
    pfStack_6058 = (fdb_config *)0x11c5cb;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5cb:
    pfStack_6058 = (fdb_config *)0x11c5d2;
    iterator_seek_to_max_key_with_deletes_test();
  }
  pfStack_6058 = (fdb_config *)iterator_seek_to_min_key_with_deletes_test;
  iterator_seek_to_max_key_with_deletes_test();
  pfStack_6058 = pfVar22;
  gettimeofday(&tStack_6160,(__timezone_ptr_t)0x0);
  memleak_start();
  pfStack_6198 = (fdb_iterator *)0x0;
  pfStack_6180 = (fdb_doc *)0x0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fVar4 = fdb_open(&pfStack_6188,"./iterator_test1",&fStack_6150);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    fVar4 = fdb_kvs_open_default(pfStack_6188,&pfStack_6190,&fStack_6178);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c779;
    fdb_set_kv(pfStack_6190,"B",1,(void *)0x0,0);
    fdb_set_kv(pfStack_6190,"C",1,(void *)0x0,0);
    fVar4 = fdb_del_kv(pfStack_6190,"B",1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c780;
    fVar4 = fdb_iterator_init(pfStack_6190,&pfStack_6198,"A",1,"B",1,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c787;
    fVar4 = fdb_iterator_get(pfStack_6198,&pfStack_6180);
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c78c;
    fVar4 = fdb_iterator_seek_to_min(pfStack_6198);
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c791;
    fVar4 = fdb_iterator_close(pfStack_6198);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011c796;
    fVar4 = fdb_close(pfStack_6188);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      fVar4 = fdb_shutdown();
      if (fVar4 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar27 = "%s PASSED\n";
        if (iterator_seek_to_min_key_with_deletes_test()::__test_pass != '\0') {
          pcVar27 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar27,"iterator seek to min test");
        return;
      }
      goto LAB_0011c7a4;
    }
  }
  else {
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c779:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c780:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c787:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c78c:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c791:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c796:
    iterator_seek_to_min_key_with_deletes_test();
  }
  iterator_seek_to_min_key_with_deletes_test();
LAB_0011c7a4:
  iterator_seek_to_min_key_with_deletes_test();
  iterator_test();
  iterator_with_concurrent_updates_test();
  iterator_compact_uncommitted_db();
  iterator_seek_test();
  iVar5 = 0;
  do {
    iVar25 = 0;
    do {
      iterator_complete_test(iVar5,iVar25);
      iVar25 = iVar25 + 1;
    } while (iVar25 == 1);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 7);
  iterator_extreme_key_test();
  iterator_inmem_snapshot_seek_test(false);
  iterator_inmem_snapshot_seek_test(true);
  iterator_no_deletes_test();
  iterator_set_del_docs_test();
  iterator_del_next_test();
  sequence_iterator_test();
  sequence_iterator_duplicate_test();
  sequence_iterator_range_test();
  reverse_seek_to_max_nokey();
  reverse_sequence_iterator_test();
  reverse_sequence_iterator_kvs_test();
  reverse_iterator_test();
  iterator_seek_wal_only_test();
  iterator_after_wal_threshold();
  iterator_manual_wal_flush();
  sequence_iterator_seek_test(true);
  sequence_iterator_seek_test(false);
  iterator_concurrent_compaction();
  iterator_offset_access_test();
  iterator_deleted_doc_right_before_the_end_test();
  iterator_uncommited_seeks();
  iterator_init_using_substring_test();
  iterator_seek_to_max_key_with_deletes_test();
  iterator_seek_to_min_key_with_deletes_test();
  return;
}

Assistant:

void sequence_iterator_duplicate_test()
{
    // Unit test for MB-12225
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 100;
    int count;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;
    fdb_seqnum_t seqnum;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.wal_threshold = 1024;
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 1; // retain deletes until compaction

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "sequence_iterator_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents first time
    for (i=0;i<n;i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d(first)", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents second time
    for (i=0;i<n;i++){
        sprintf(bodybuf, "body%d(second)", i);
        fdb_doc_update(&doc[i], NULL, 0, bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents third time (only even number documents)
    for (i=0;i<n;i+=2){
        sprintf(bodybuf, "body%d(third)", i);
        fdb_doc_update(&doc[i], NULL, 0, bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // commit without WAL flushing
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // create an iterator over sequence number
    fdb_iterator_sequence_init(db, &iterator, 0, 220, FDB_ITR_NONE);

    // repeat until fail
    count = 0;
    seqnum = 100;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (seqnum < 140) { // point where WAL range & trie range overlap ends!
            seqnum += 2; // WAL overlap with trie, get unique trie keys only
        } else { // beyond this even keys in trie are also in WAL but outside..
            seqnum ++; // the iteration range, so they can be sequentially got
        }

        if (seqnum <= 200) { // uptil WAL, unique trie items are returned...
            i = seqnum - 101;
            sprintf(bodybuf, "body%d(second)", i);
        } else { // once seqnum enters WAL range only WAL elements are returned..
            i = ((seqnum - 101) % n) * 2;
            sprintf(bodybuf, "body%d(third)", i);
        }
        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        TEST_CHK(rdoc->seqnum == seqnum);

        count++;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count==n); // since 220 > n all keys should be iterated
    fdb_iterator_close(iterator);

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);
    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }
    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("sequence iterator duplicate test");
}